

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [24];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  uint uVar8;
  Primitive PVar9;
  uint uVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined8 uVar99;
  undefined8 uVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [28];
  undefined1 auVar106 [28];
  undefined1 auVar107 [28];
  byte bVar108;
  undefined1 auVar109 [28];
  undefined1 auVar110 [24];
  undefined1 auVar111 [28];
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  bool bVar118;
  uint uVar119;
  int iVar120;
  ulong uVar121;
  uint uVar122;
  ulong uVar123;
  long lVar124;
  ulong uVar125;
  ulong uVar126;
  float fVar127;
  float fVar145;
  float fVar147;
  vint4 bi_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar135 [32];
  float fVar149;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar146;
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar156;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  float fVar157;
  float fVar171;
  float fVar172;
  vint4 bi_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar178;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  vint4 ai;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar193;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar194;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar195;
  float fVar208;
  float fVar209;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar210;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar211;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  float fVar215;
  float fVar225;
  float fVar226;
  vint4 bi;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  float fVar227;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar228;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar229;
  float fVar240;
  float fVar242;
  vint4 ai_2;
  undefined1 auVar231 [16];
  float fVar244;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar230;
  float fVar241;
  float fVar243;
  float fVar245;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  float fVar246;
  float fVar247;
  float fVar255;
  float fVar257;
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar261;
  undefined1 auVar253 [32];
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar254 [64];
  float fVar262;
  float fVar268;
  float fVar269;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar274;
  float fVar279;
  float fVar280;
  vint4 ai_1;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar277 [32];
  float fVar286;
  undefined1 auVar278 [32];
  float fVar287;
  float fVar299;
  float fVar302;
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  float fVar288;
  float fVar300;
  float fVar303;
  float fVar305;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar289;
  float fVar301;
  float fVar304;
  float fVar306;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar307;
  float fVar308;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar314 [64];
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  float fVar333;
  float fVar338;
  float fVar339;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar340;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar341;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  uint local_920;
  undefined4 uStack_91c;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint uStack_7c4;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  ulong local_740;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 *local_6e8;
  undefined1 (*local_6e0) [16];
  undefined1 (*local_6d8) [32];
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_650 [8];
  undefined8 uStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  LinearSpace3fa *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  uint local_380;
  uint local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 local_320 [32];
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  RTCHitN local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar298 [64];
  
  PVar9 = prim[1];
  uVar123 = (ulong)(byte)PVar9;
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar229 = *(float *)(prim + uVar123 * 0x19 + 0x12);
  auVar17 = vsubps_avx(auVar17,*(undefined1 (*) [16])(prim + uVar123 * 0x19 + 6));
  auVar179._0_4_ = fVar229 * auVar17._0_4_;
  auVar179._4_4_ = fVar229 * auVar17._4_4_;
  auVar179._8_4_ = fVar229 * auVar17._8_4_;
  auVar179._12_4_ = fVar229 * auVar17._12_4_;
  auVar263._0_4_ = fVar229 * auVar18._0_4_;
  auVar263._4_4_ = fVar229 * auVar18._4_4_;
  auVar263._8_4_ = fVar229 * auVar18._8_4_;
  auVar263._12_4_ = fVar229 * auVar18._12_4_;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 4 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 5 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 6 + 6)));
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0xb + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar199 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar123 + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  uVar126 = (ulong)(uint)((int)(uVar123 * 9) * 2);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + uVar123 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  uVar126 = (ulong)(uint)((int)(uVar123 * 5) << 2);
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + 6)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar314 = ZEXT1664(auVar159);
  auVar128 = vshufps_avx(auVar263,auVar263,0);
  auVar158 = vshufps_avx(auVar263,auVar263,0x55);
  auVar180 = vshufps_avx(auVar263,auVar263,0xaa);
  fVar229 = auVar180._0_4_;
  fVar195 = auVar180._4_4_;
  fVar240 = auVar180._8_4_;
  fVar208 = auVar180._12_4_;
  fVar246 = auVar158._0_4_;
  fVar255 = auVar158._4_4_;
  fVar257 = auVar158._8_4_;
  fVar259 = auVar158._12_4_;
  fVar242 = auVar128._0_4_;
  fVar209 = auVar128._4_4_;
  fVar244 = auVar128._8_4_;
  fVar210 = auVar128._12_4_;
  auVar327._0_4_ = fVar242 * auVar17._0_4_ + fVar246 * auVar18._0_4_ + fVar229 * auVar185._0_4_;
  auVar327._4_4_ = fVar209 * auVar17._4_4_ + fVar255 * auVar18._4_4_ + fVar195 * auVar185._4_4_;
  auVar327._8_4_ = fVar244 * auVar17._8_4_ + fVar257 * auVar18._8_4_ + fVar240 * auVar185._8_4_;
  auVar327._12_4_ = fVar210 * auVar17._12_4_ + fVar259 * auVar18._12_4_ + fVar208 * auVar185._12_4_;
  auVar334._0_4_ = fVar242 * auVar198._0_4_ + fVar246 * auVar199._0_4_ + auVar200._0_4_ * fVar229;
  auVar334._4_4_ = fVar209 * auVar198._4_4_ + fVar255 * auVar199._4_4_ + auVar200._4_4_ * fVar195;
  auVar334._8_4_ = fVar244 * auVar198._8_4_ + fVar257 * auVar199._8_4_ + auVar200._8_4_ * fVar240;
  auVar334._12_4_ =
       fVar210 * auVar198._12_4_ + fVar259 * auVar199._12_4_ + auVar200._12_4_ * fVar208;
  auVar264._0_4_ = fVar242 * auVar129._0_4_ + fVar246 * auVar130._0_4_ + auVar159._0_4_ * fVar229;
  auVar264._4_4_ = fVar209 * auVar129._4_4_ + fVar255 * auVar130._4_4_ + auVar159._4_4_ * fVar195;
  auVar264._8_4_ = fVar244 * auVar129._8_4_ + fVar257 * auVar130._8_4_ + auVar159._8_4_ * fVar240;
  auVar264._12_4_ =
       fVar210 * auVar129._12_4_ + fVar259 * auVar130._12_4_ + auVar159._12_4_ * fVar208;
  auVar128 = vshufps_avx(auVar179,auVar179,0);
  auVar158 = vshufps_avx(auVar179,auVar179,0x55);
  auVar180 = vshufps_avx(auVar179,auVar179,0xaa);
  fVar229 = auVar180._0_4_;
  fVar195 = auVar180._4_4_;
  fVar240 = auVar180._8_4_;
  fVar208 = auVar180._12_4_;
  fVar246 = auVar158._0_4_;
  fVar255 = auVar158._4_4_;
  fVar257 = auVar158._8_4_;
  fVar259 = auVar158._12_4_;
  fVar242 = auVar128._0_4_;
  fVar209 = auVar128._4_4_;
  fVar244 = auVar128._8_4_;
  fVar210 = auVar128._12_4_;
  auVar216._0_4_ = fVar242 * auVar17._0_4_ + fVar246 * auVar18._0_4_ + fVar229 * auVar185._0_4_;
  auVar216._4_4_ = fVar209 * auVar17._4_4_ + fVar255 * auVar18._4_4_ + fVar195 * auVar185._4_4_;
  auVar216._8_4_ = fVar244 * auVar17._8_4_ + fVar257 * auVar18._8_4_ + fVar240 * auVar185._8_4_;
  auVar216._12_4_ = fVar210 * auVar17._12_4_ + fVar259 * auVar18._12_4_ + fVar208 * auVar185._12_4_;
  auVar158._0_4_ = fVar242 * auVar198._0_4_ + auVar200._0_4_ * fVar229 + fVar246 * auVar199._0_4_;
  auVar158._4_4_ = fVar209 * auVar198._4_4_ + auVar200._4_4_ * fVar195 + fVar255 * auVar199._4_4_;
  auVar158._8_4_ = fVar244 * auVar198._8_4_ + auVar200._8_4_ * fVar240 + fVar257 * auVar199._8_4_;
  auVar158._12_4_ =
       fVar210 * auVar198._12_4_ + auVar200._12_4_ * fVar208 + fVar259 * auVar199._12_4_;
  auVar128._0_4_ = fVar242 * auVar129._0_4_ + fVar246 * auVar130._0_4_ + auVar159._0_4_ * fVar229;
  auVar128._4_4_ = fVar209 * auVar129._4_4_ + fVar255 * auVar130._4_4_ + auVar159._4_4_ * fVar195;
  auVar128._8_4_ = fVar244 * auVar129._8_4_ + fVar257 * auVar130._8_4_ + auVar159._8_4_ * fVar240;
  auVar128._12_4_ =
       fVar210 * auVar129._12_4_ + fVar259 * auVar130._12_4_ + auVar159._12_4_ * fVar208;
  auVar248._8_4_ = 0x7fffffff;
  auVar248._0_8_ = 0x7fffffff7fffffff;
  auVar248._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx(auVar327,auVar248);
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  auVar17 = vcmpps_avx(auVar17,auVar196,1);
  auVar18 = vblendvps_avx(auVar327,auVar196,auVar17);
  auVar17 = vandps_avx(auVar334,auVar248);
  auVar17 = vcmpps_avx(auVar17,auVar196,1);
  auVar185 = vblendvps_avx(auVar334,auVar196,auVar17);
  auVar17 = vandps_avx(auVar264,auVar248);
  auVar17 = vcmpps_avx(auVar17,auVar196,1);
  auVar17 = vblendvps_avx(auVar264,auVar196,auVar17);
  auVar198 = vrcpps_avx(auVar18);
  fVar246 = auVar198._0_4_;
  auVar180._0_4_ = fVar246 * auVar18._0_4_;
  fVar255 = auVar198._4_4_;
  auVar180._4_4_ = fVar255 * auVar18._4_4_;
  fVar257 = auVar198._8_4_;
  auVar180._8_4_ = fVar257 * auVar18._8_4_;
  fVar259 = auVar198._12_4_;
  auVar180._12_4_ = fVar259 * auVar18._12_4_;
  auVar265._8_4_ = 0x3f800000;
  auVar265._0_8_ = 0x3f8000003f800000;
  auVar265._12_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar265,auVar180);
  fVar246 = fVar246 + fVar246 * auVar18._0_4_;
  fVar255 = fVar255 + fVar255 * auVar18._4_4_;
  fVar257 = fVar257 + fVar257 * auVar18._8_4_;
  fVar259 = fVar259 + fVar259 * auVar18._12_4_;
  auVar18 = vrcpps_avx(auVar185);
  fVar229 = auVar18._0_4_;
  auVar231._0_4_ = fVar229 * auVar185._0_4_;
  fVar240 = auVar18._4_4_;
  auVar231._4_4_ = fVar240 * auVar185._4_4_;
  fVar242 = auVar18._8_4_;
  auVar231._8_4_ = fVar242 * auVar185._8_4_;
  fVar244 = auVar18._12_4_;
  auVar231._12_4_ = fVar244 * auVar185._12_4_;
  auVar18 = vsubps_avx(auVar265,auVar231);
  fVar229 = fVar229 + fVar229 * auVar18._0_4_;
  fVar240 = fVar240 + fVar240 * auVar18._4_4_;
  fVar242 = fVar242 + fVar242 * auVar18._8_4_;
  fVar244 = fVar244 + fVar244 * auVar18._12_4_;
  auVar18 = vrcpps_avx(auVar17);
  fVar195 = auVar18._0_4_;
  auVar197._0_4_ = fVar195 * auVar17._0_4_;
  fVar208 = auVar18._4_4_;
  auVar197._4_4_ = fVar208 * auVar17._4_4_;
  fVar209 = auVar18._8_4_;
  auVar197._8_4_ = fVar209 * auVar17._8_4_;
  fVar210 = auVar18._12_4_;
  auVar197._12_4_ = fVar210 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar265,auVar197);
  fVar195 = fVar195 + fVar195 * auVar17._0_4_;
  fVar208 = fVar208 + fVar208 * auVar17._4_4_;
  fVar209 = fVar209 + fVar209 * auVar17._8_4_;
  fVar210 = fVar210 + fVar210 * auVar17._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar123 * 7 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar216);
  auVar181._0_4_ = fVar246 * auVar17._0_4_;
  auVar181._4_4_ = fVar255 * auVar17._4_4_;
  auVar181._8_4_ = fVar257 * auVar17._8_4_;
  auVar181._12_4_ = fVar259 * auVar17._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar123 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar18);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar216);
  auVar217._0_4_ = fVar246 * auVar17._0_4_;
  auVar217._4_4_ = fVar255 * auVar17._4_4_;
  auVar217._8_4_ = fVar257 * auVar17._8_4_;
  auVar217._12_4_ = fVar259 * auVar17._12_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar18 = vpmovsxwd_avx(auVar185);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar123 * -2 + 6);
  auVar17 = vpmovsxwd_avx(auVar198);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar158);
  auVar275._0_4_ = auVar17._0_4_ * fVar229;
  auVar275._4_4_ = auVar17._4_4_ * fVar240;
  auVar275._8_4_ = auVar17._8_4_ * fVar242;
  auVar275._12_4_ = auVar17._12_4_ * fVar244;
  auVar17 = vcvtdq2ps_avx(auVar18);
  auVar17 = vsubps_avx(auVar17,auVar158);
  auVar159._0_4_ = fVar229 * auVar17._0_4_;
  auVar159._4_4_ = fVar240 * auVar17._4_4_;
  auVar159._8_4_ = fVar242 * auVar17._8_4_;
  auVar159._12_4_ = fVar244 * auVar17._12_4_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar126 + uVar123 + 6);
  auVar17 = vpmovsxwd_avx(auVar199);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar128);
  auVar232._0_4_ = auVar17._0_4_ * fVar195;
  auVar232._4_4_ = auVar17._4_4_ * fVar208;
  auVar232._8_4_ = auVar17._8_4_ * fVar209;
  auVar232._12_4_ = auVar17._12_4_ * fVar210;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar123 * 0x17 + 6);
  auVar17 = vpmovsxwd_avx(auVar200);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar128);
  auVar129._0_4_ = auVar17._0_4_ * fVar195;
  auVar129._4_4_ = auVar17._4_4_ * fVar208;
  auVar129._8_4_ = auVar17._8_4_ * fVar209;
  auVar129._12_4_ = auVar17._12_4_ * fVar210;
  auVar17 = vpminsd_avx(auVar181,auVar217);
  auVar18 = vpminsd_avx(auVar275,auVar159);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar18 = vpminsd_avx(auVar232,auVar129);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar290._4_4_ = uVar7;
  auVar290._0_4_ = uVar7;
  auVar290._8_4_ = uVar7;
  auVar290._12_4_ = uVar7;
  auVar298 = ZEXT1664(auVar290);
  auVar18 = vmaxps_avx(auVar18,auVar290);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  local_3f0._0_4_ = auVar17._0_4_ * 0.99999964;
  local_3f0._4_4_ = auVar17._4_4_ * 0.99999964;
  local_3f0._8_4_ = auVar17._8_4_ * 0.99999964;
  local_3f0._12_4_ = auVar17._12_4_ * 0.99999964;
  auVar17 = vpmaxsd_avx(auVar181,auVar217);
  auVar18 = vpmaxsd_avx(auVar275,auVar159);
  auVar17 = vminps_avx(auVar17,auVar18);
  auVar18 = vpmaxsd_avx(auVar232,auVar129);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar182._4_4_ = uVar7;
  auVar182._0_4_ = uVar7;
  auVar182._8_4_ = uVar7;
  auVar182._12_4_ = uVar7;
  auVar18 = vminps_avx(auVar18,auVar182);
  auVar17 = vminps_avx(auVar17,auVar18);
  auVar130._0_4_ = auVar17._0_4_ * 1.0000004;
  auVar130._4_4_ = auVar17._4_4_ * 1.0000004;
  auVar130._8_4_ = auVar17._8_4_ * 1.0000004;
  auVar130._12_4_ = auVar17._12_4_ * 1.0000004;
  auVar17 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar18 = vpcmpgtd_avx(auVar17,_DAT_01f7fcf0);
  auVar17 = vcmpps_avx(local_3f0,auVar130,2);
  auVar17 = vandps_avx(auVar17,auVar18);
  uVar119 = vmovmskps_avx(auVar17);
  if (uVar119 == 0) {
    bVar118 = false;
  }
  else {
    uVar119 = uVar119 & 0xff;
    local_5c8 = pre->ray_space + k;
    local_5c0 = mm_lookupmask_ps._16_8_;
    uStack_5b8 = mm_lookupmask_ps._24_8_;
    uStack_5b0 = mm_lookupmask_ps._16_8_;
    uStack_5a8 = mm_lookupmask_ps._24_8_;
    uVar122 = 1 << ((byte)k & 0x1f);
    local_6d8 = (undefined1 (*) [32])&local_140;
    local_6e0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar122 & 0xf) << 4));
    local_6e8 = mm_lookupmask_ps + (long)((int)uVar122 >> 4) * 0x10;
    do {
      uVar126 = (ulong)uVar119;
      auVar294 = auVar314._0_32_;
      auVar291 = auVar298._0_32_;
      lVar14 = 0;
      if (uVar126 != 0) {
        for (; (uVar119 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar126 = uVar126 - 1 & uVar126;
      uVar119 = *(uint *)(prim + 2);
      uVar122 = *(uint *)(prim + lVar14 * 4 + 6);
      pGVar11 = (context->scene->geometries).items[uVar119].ptr;
      _Var12 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_560._0_8_ = CONCAT44(0,uVar122);
      uVar123 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 + _Var12 * CONCAT44(0,uVar122));
      p_Var13 = pGVar11[1].intersectionFilterN;
      lVar14 = *(long *)&pGVar11[1].time_range.upper;
      auVar17 = *(undefined1 (*) [16])(lVar14 + (long)p_Var13 * uVar123);
      auVar18 = *(undefined1 (*) [16])(lVar14 + (uVar123 + 1) * (long)p_Var13);
      _local_650 = *(undefined1 (*) [16])(lVar14 + (uVar123 + 2) * (long)p_Var13);
      lVar124 = 0;
      if (uVar126 != 0) {
        for (; (uVar126 >> lVar124 & 1) == 0; lVar124 = lVar124 + 1) {
        }
      }
      auVar185 = *(undefined1 (*) [16])(lVar14 + (uVar123 + 3) * (long)p_Var13);
      if (uVar126 != 0) {
        uVar123 = uVar126 - 1 & uVar126;
        lVar124 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                                  *(uint *)(prim + lVar124 * 4 + 6) * _Var12) * (long)p_Var13;
        if ((uVar123 != 0) && (lVar14 = 0, uVar123 != 0)) {
          for (; (uVar123 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
      }
      uVar10 = (uint)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar198 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar129 = vinsertps_avx(auVar198,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar200 = vsubps_avx(auVar17,auVar129);
      auVar198 = vshufps_avx(auVar200,auVar200,0);
      auVar199 = vshufps_avx(auVar200,auVar200,0x55);
      auVar200 = vshufps_avx(auVar200,auVar200,0xaa);
      fVar229 = (local_5c8->vx).field_0.m128[0];
      fVar195 = (local_5c8->vx).field_0.m128[1];
      fVar240 = (local_5c8->vx).field_0.m128[2];
      fVar208 = (local_5c8->vx).field_0.m128[3];
      fVar242 = (local_5c8->vy).field_0.m128[0];
      fVar209 = (local_5c8->vy).field_0.m128[1];
      fVar244 = (local_5c8->vy).field_0.m128[2];
      fVar210 = (local_5c8->vy).field_0.m128[3];
      fVar246 = (local_5c8->vz).field_0.m128[0];
      fVar255 = (local_5c8->vz).field_0.m128[1];
      fVar257 = (local_5c8->vz).field_0.m128[2];
      fVar259 = (local_5c8->vz).field_0.m128[3];
      auVar160._0_4_ =
           auVar198._0_4_ * fVar229 + auVar199._0_4_ * fVar242 + fVar246 * auVar200._0_4_;
      auVar160._4_4_ =
           auVar198._4_4_ * fVar195 + auVar199._4_4_ * fVar209 + fVar255 * auVar200._4_4_;
      auVar160._8_4_ =
           auVar198._8_4_ * fVar240 + auVar199._8_4_ * fVar244 + fVar257 * auVar200._8_4_;
      auVar160._12_4_ =
           auVar198._12_4_ * fVar208 + auVar199._12_4_ * fVar210 + fVar259 * auVar200._12_4_;
      auVar198 = vblendps_avx(auVar160,auVar17,8);
      auVar130 = vsubps_avx(auVar18,auVar129);
      auVar199 = vshufps_avx(auVar130,auVar130,0);
      auVar200 = vshufps_avx(auVar130,auVar130,0x55);
      auVar130 = vshufps_avx(auVar130,auVar130,0xaa);
      auVar335._0_4_ =
           auVar199._0_4_ * fVar229 + auVar200._0_4_ * fVar242 + fVar246 * auVar130._0_4_;
      auVar335._4_4_ =
           auVar199._4_4_ * fVar195 + auVar200._4_4_ * fVar209 + fVar255 * auVar130._4_4_;
      auVar335._8_4_ =
           auVar199._8_4_ * fVar240 + auVar200._8_4_ * fVar244 + fVar257 * auVar130._8_4_;
      auVar335._12_4_ =
           auVar199._12_4_ * fVar208 + auVar200._12_4_ * fVar210 + fVar259 * auVar130._12_4_;
      auVar199 = vblendps_avx(auVar335,auVar18,8);
      auVar159 = vsubps_avx(_local_650,auVar129);
      auVar200 = vshufps_avx(auVar159,auVar159,0);
      auVar130 = vshufps_avx(auVar159,auVar159,0x55);
      auVar159 = vshufps_avx(auVar159,auVar159,0xaa);
      auVar233._0_4_ =
           auVar200._0_4_ * fVar229 + auVar130._0_4_ * fVar242 + fVar246 * auVar159._0_4_;
      auVar233._4_4_ =
           auVar200._4_4_ * fVar195 + auVar130._4_4_ * fVar209 + fVar255 * auVar159._4_4_;
      auVar233._8_4_ =
           auVar200._8_4_ * fVar240 + auVar130._8_4_ * fVar244 + fVar257 * auVar159._8_4_;
      auVar233._12_4_ =
           auVar200._12_4_ * fVar208 + auVar130._12_4_ * fVar210 + fVar259 * auVar159._12_4_;
      auVar159 = vshufps_avx(_local_650,_local_650,0xff);
      auVar200 = vblendps_avx(auVar233,_local_650,8);
      auVar128 = vsubps_avx(auVar185,auVar129);
      auVar129 = vshufps_avx(auVar128,auVar128,0);
      auVar130 = vshufps_avx(auVar128,auVar128,0x55);
      auVar128 = vshufps_avx(auVar128,auVar128,0xaa);
      auVar276._0_4_ =
           auVar129._0_4_ * fVar229 + auVar130._0_4_ * fVar242 + fVar246 * auVar128._0_4_;
      auVar276._4_4_ =
           auVar129._4_4_ * fVar195 + auVar130._4_4_ * fVar209 + fVar255 * auVar128._4_4_;
      auVar276._8_4_ =
           auVar129._8_4_ * fVar240 + auVar130._8_4_ * fVar244 + fVar257 * auVar128._8_4_;
      auVar276._12_4_ =
           auVar129._12_4_ * fVar208 + auVar130._12_4_ * fVar210 + fVar259 * auVar128._12_4_;
      auVar128 = vshufps_avx(auVar185,auVar185,0xff);
      auVar129 = vblendps_avx(auVar276,auVar185,8);
      auVar218._8_4_ = 0x7fffffff;
      auVar218._0_8_ = 0x7fffffff7fffffff;
      auVar218._12_4_ = 0x7fffffff;
      auVar198 = vandps_avx(auVar198,auVar218);
      auVar199 = vandps_avx(auVar199,auVar218);
      auVar130 = vmaxps_avx(auVar198,auVar199);
      auVar198 = vandps_avx(auVar200,auVar218);
      auVar199 = vandps_avx(auVar129,auVar218);
      auVar198 = vmaxps_avx(auVar198,auVar199);
      auVar198 = vmaxps_avx(auVar130,auVar198);
      auVar199 = vmovshdup_avx(auVar198);
      auVar199 = vmaxss_avx(auVar199,auVar198);
      auVar198 = vshufpd_avx(auVar198,auVar198,1);
      auVar198 = vmaxss_avx(auVar198,auVar199);
      lVar14 = (long)(int)uVar10 * 0x44;
      fVar195 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar14 + 0x908);
      fVar240 = *(float *)(catmullrom_basis0 + lVar14 + 0x90c);
      fVar208 = *(float *)(catmullrom_basis0 + lVar14 + 0x910);
      fVar209 = *(float *)(catmullrom_basis0 + lVar14 + 0x914);
      fVar244 = *(float *)(catmullrom_basis0 + lVar14 + 0x918);
      fVar210 = *(float *)(catmullrom_basis0 + lVar14 + 0x91c);
      fVar255 = *(float *)(catmullrom_basis0 + lVar14 + 0x920);
      auVar106 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar14 + 0x908);
      auVar199 = vshufps_avx(auVar233,auVar233,0);
      register0x00001450 = auVar199;
      _local_500 = auVar199;
      auVar200 = vshufps_avx(auVar233,auVar233,0x55);
      register0x000014d0 = auVar159;
      _local_420 = auVar159;
      fVar257 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar14 + 0xd8c);
      fVar259 = *(float *)(catmullrom_basis0 + lVar14 + 0xd90);
      fVar325 = *(float *)(catmullrom_basis0 + lVar14 + 0xd94);
      fVar274 = *(float *)(catmullrom_basis0 + lVar14 + 0xd98);
      fVar211 = *(float *)(catmullrom_basis0 + lVar14 + 0xd9c);
      fVar271 = *(float *)(catmullrom_basis0 + lVar14 + 0xda0);
      fVar279 = *(float *)(catmullrom_basis0 + lVar14 + 0xda4);
      auVar105 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar14 + 0xd8c);
      auVar129 = vshufps_avx(auVar276,auVar276,0);
      register0x00001490 = auVar129;
      _local_520 = auVar129;
      auVar130 = vshufps_avx(auVar276,auVar276,0x55);
      register0x000013d0 = auVar128;
      _local_260 = auVar128;
      fVar307 = auVar129._0_4_;
      fVar315 = auVar129._4_4_;
      fVar316 = auVar129._8_4_;
      fVar317 = auVar129._12_4_;
      fVar230 = auVar130._0_4_;
      fVar241 = auVar130._4_4_;
      fVar243 = auVar130._8_4_;
      fVar245 = auVar130._12_4_;
      fVar287 = auVar199._0_4_;
      fVar299 = auVar199._4_4_;
      fVar302 = auVar199._8_4_;
      fVar305 = auVar199._12_4_;
      fVar247 = auVar200._0_4_;
      fVar256 = auVar200._4_4_;
      fVar258 = auVar200._8_4_;
      fVar260 = auVar200._12_4_;
      fVar262 = auVar128._0_4_;
      fVar268 = auVar128._4_4_;
      fVar269 = auVar128._8_4_;
      fVar270 = auVar128._12_4_;
      fVar318 = auVar159._0_4_;
      fVar320 = auVar159._4_4_;
      fVar322 = auVar159._8_4_;
      auVar199 = vshufps_avx(auVar335,auVar335,0);
      fVar284 = *(float *)(catmullrom_basis0 + lVar14 + 0x484);
      fVar286 = *(float *)(catmullrom_basis0 + lVar14 + 0x488);
      fVar214 = *(float *)(catmullrom_basis0 + lVar14 + 0x48c);
      fVar308 = *(float *)(catmullrom_basis0 + lVar14 + 0x490);
      fVar127 = *(float *)(catmullrom_basis0 + lVar14 + 0x494);
      fVar145 = *(float *)(catmullrom_basis0 + lVar14 + 0x498);
      fVar147 = *(float *)(catmullrom_basis0 + lVar14 + 0x49c);
      fVar280 = *(float *)(catmullrom_basis0 + lVar14 + 0x4a0);
      fVar319 = auVar199._0_4_;
      fVar321 = auVar199._4_4_;
      fVar323 = auVar199._8_4_;
      fVar324 = auVar199._12_4_;
      auVar199 = vshufps_avx(auVar335,auVar335,0x55);
      auVar219._16_16_ = auVar199;
      auVar219._0_16_ = auVar199;
      fVar215 = auVar199._0_4_;
      fVar225 = auVar199._4_4_;
      fVar226 = auVar199._8_4_;
      fVar227 = auVar199._12_4_;
      auVar199 = vshufps_avx(auVar18,auVar18,0xff);
      register0x00001590 = auVar199;
      _local_80 = auVar199;
      fVar341 = auVar199._0_4_;
      fVar344 = auVar199._4_4_;
      fVar345 = auVar199._8_4_;
      fVar346 = auVar199._12_4_;
      fVar193 = *(float *)(catmullrom_basis0 + lVar14 + 0x924) + 0.0 + 0.0;
      auVar199 = vshufps_avx(auVar160,auVar160,0);
      register0x00001550 = auVar199;
      _local_460 = auVar199;
      fVar212 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar14);
      fVar272 = *(float *)(catmullrom_basis0 + lVar14 + 4);
      fVar281 = *(float *)(catmullrom_basis0 + lVar14 + 8);
      fVar282 = *(float *)(catmullrom_basis0 + lVar14 + 0xc);
      fVar213 = *(float *)(catmullrom_basis0 + lVar14 + 0x10);
      fVar273 = *(float *)(catmullrom_basis0 + lVar14 + 0x14);
      fVar149 = *(float *)(catmullrom_basis0 + lVar14 + 0x18);
      auVar107 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar14);
      fVar333 = auVar199._0_4_;
      fVar338 = auVar199._4_4_;
      fVar339 = auVar199._8_4_;
      fVar340 = auVar199._12_4_;
      auVar328._0_4_ = fVar333 * fVar212 + fVar319 * fVar284 + fVar287 * fVar195 + fVar307 * fVar257
      ;
      auVar328._4_4_ = fVar338 * fVar272 + fVar321 * fVar286 + fVar299 * fVar240 + fVar315 * fVar259
      ;
      auVar328._8_4_ = fVar339 * fVar281 + fVar323 * fVar214 + fVar302 * fVar208 + fVar316 * fVar325
      ;
      auVar328._12_4_ =
           fVar340 * fVar282 + fVar324 * fVar308 + fVar305 * fVar209 + fVar317 * fVar274;
      auVar328._16_4_ =
           fVar333 * fVar213 + fVar319 * fVar127 + fVar287 * fVar244 + fVar307 * fVar211;
      auVar328._20_4_ =
           fVar338 * fVar273 + fVar321 * fVar145 + fVar299 * fVar210 + fVar315 * fVar271;
      auVar328._24_4_ =
           fVar339 * fVar149 + fVar323 * fVar147 + fVar302 * fVar255 + fVar316 * fVar279;
      auVar328._28_4_ = fVar280 + 0.0;
      auVar199 = vshufps_avx(auVar160,auVar160,0x55);
      register0x00001210 = auVar199;
      _local_240 = auVar199;
      fVar229 = auVar199._0_4_;
      fVar242 = auVar199._4_4_;
      fVar246 = auVar199._8_4_;
      fVar326 = auVar199._12_4_;
      auVar277._0_4_ = fVar212 * fVar229 + fVar215 * fVar284 + fVar247 * fVar195 + fVar230 * fVar257
      ;
      auVar277._4_4_ = fVar272 * fVar242 + fVar225 * fVar286 + fVar256 * fVar240 + fVar241 * fVar259
      ;
      auVar277._8_4_ = fVar281 * fVar246 + fVar226 * fVar214 + fVar258 * fVar208 + fVar243 * fVar325
      ;
      auVar277._12_4_ =
           fVar282 * fVar326 + fVar227 * fVar308 + fVar260 * fVar209 + fVar245 * fVar274;
      auVar277._16_4_ =
           fVar213 * fVar229 + fVar215 * fVar127 + fVar247 * fVar244 + fVar230 * fVar211;
      auVar277._20_4_ =
           fVar273 * fVar242 + fVar225 * fVar145 + fVar256 * fVar210 + fVar241 * fVar271;
      auVar277._24_4_ =
           fVar149 * fVar246 + fVar226 * fVar147 + fVar258 * fVar255 + fVar243 * fVar279;
      auVar277._28_4_ = 0;
      auVar199 = vpermilps_avx(auVar17,0xff);
      register0x00001450 = auVar199;
      _local_a0 = auVar199;
      fVar288 = auVar199._0_4_;
      fVar300 = auVar199._4_4_;
      fVar303 = auVar199._8_4_;
      fVar157 = fVar288 * fVar212 + fVar341 * fVar284 + fVar318 * fVar195 + fVar262 * fVar257;
      fVar171 = fVar300 * fVar272 + fVar344 * fVar286 + fVar320 * fVar240 + fVar268 * fVar259;
      fVar172 = fVar303 * fVar281 + fVar345 * fVar214 + fVar322 * fVar208 + fVar269 * fVar325;
      fVar173 = auVar199._12_4_ * fVar282 +
                fVar346 * fVar308 + auVar159._12_4_ * fVar209 + fVar270 * fVar274;
      fVar174 = fVar288 * fVar213 + fVar341 * fVar127 + fVar318 * fVar244 + fVar262 * fVar211;
      fVar175 = fVar300 * fVar273 + fVar344 * fVar145 + fVar320 * fVar210 + fVar268 * fVar271;
      fVar176 = fVar303 * fVar149 + fVar345 * fVar147 + fVar322 * fVar255 + fVar269 * fVar279;
      fVar177 = fVar193 + 0.0;
      fVar149 = *(float *)(catmullrom_basis1 + lVar14 + 0x908);
      fVar151 = *(float *)(catmullrom_basis1 + lVar14 + 0x90c);
      fVar153 = *(float *)(catmullrom_basis1 + lVar14 + 0x910);
      fVar194 = *(float *)(catmullrom_basis1 + lVar14 + 0x914);
      fVar146 = *(float *)(catmullrom_basis1 + lVar14 + 0x918);
      fVar148 = *(float *)(catmullrom_basis1 + lVar14 + 0x91c);
      fVar150 = *(float *)(catmullrom_basis1 + lVar14 + 0x920);
      fVar152 = *(float *)(catmullrom_basis1 + lVar14 + 0xd8c);
      fVar154 = *(float *)(catmullrom_basis1 + lVar14 + 0xd90);
      fVar155 = *(float *)(catmullrom_basis1 + lVar14 + 0xd94);
      fVar156 = *(float *)(catmullrom_basis1 + lVar14 + 0xd98);
      fVar228 = *(float *)(catmullrom_basis1 + lVar14 + 0xd9c);
      fVar178 = *(float *)(catmullrom_basis1 + lVar14 + 0xda0);
      fVar261 = *(float *)(catmullrom_basis1 + lVar14 + 0xda4);
      auVar310 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar14 + 0x484);
      auVar254 = ZEXT3264(auVar310);
      fVar195 = auVar310._0_4_;
      fVar209 = auVar310._4_4_;
      fVar255 = auVar310._8_4_;
      fVar325 = auVar310._12_4_;
      fVar271 = auVar310._16_4_;
      fVar212 = auVar310._20_4_;
      fVar282 = auVar310._24_4_;
      fVar208 = fVar340 + fVar193 + 0.0;
      fVar193 = *(float *)(catmullrom_basis1 + lVar14);
      fVar283 = *(float *)(catmullrom_basis1 + lVar14 + 4);
      fVar285 = *(float *)(catmullrom_basis1 + lVar14 + 8);
      fVar289 = *(float *)(catmullrom_basis1 + lVar14 + 0xc);
      fVar301 = *(float *)(catmullrom_basis1 + lVar14 + 0x10);
      fVar304 = *(float *)(catmullrom_basis1 + lVar14 + 0x14);
      fVar306 = *(float *)(catmullrom_basis1 + lVar14 + 0x18);
      auVar220._0_4_ = fVar333 * fVar193 + fVar319 * fVar195 + fVar149 * fVar287 + fVar307 * fVar152
      ;
      auVar220._4_4_ = fVar338 * fVar283 + fVar321 * fVar209 + fVar151 * fVar299 + fVar315 * fVar154
      ;
      auVar220._8_4_ = fVar339 * fVar285 + fVar323 * fVar255 + fVar153 * fVar302 + fVar316 * fVar155
      ;
      auVar220._12_4_ =
           fVar340 * fVar289 + fVar324 * fVar325 + fVar194 * fVar305 + fVar317 * fVar156;
      auVar220._16_4_ =
           fVar333 * fVar301 + fVar319 * fVar271 + fVar146 * fVar287 + fVar307 * fVar228;
      auVar220._20_4_ =
           fVar338 * fVar304 + fVar321 * fVar212 + fVar148 * fVar299 + fVar315 * fVar178;
      auVar220._24_4_ =
           fVar339 * fVar306 + fVar323 * fVar282 + fVar150 * fVar302 + fVar316 * fVar261;
      auVar220._28_4_ = fVar346 + fVar208;
      auVar201._0_4_ = fVar229 * fVar193 + fVar215 * fVar195 + fVar149 * fVar247 + fVar152 * fVar230
      ;
      auVar201._4_4_ = fVar242 * fVar283 + fVar225 * fVar209 + fVar151 * fVar256 + fVar154 * fVar241
      ;
      auVar201._8_4_ = fVar246 * fVar285 + fVar226 * fVar255 + fVar153 * fVar258 + fVar155 * fVar243
      ;
      auVar201._12_4_ =
           fVar326 * fVar289 + fVar227 * fVar325 + fVar194 * fVar260 + fVar156 * fVar245;
      auVar201._16_4_ =
           fVar229 * fVar301 + fVar215 * fVar271 + fVar146 * fVar247 + fVar228 * fVar230;
      auVar201._20_4_ =
           fVar242 * fVar304 + fVar225 * fVar212 + fVar148 * fVar256 + fVar178 * fVar241;
      auVar201._24_4_ =
           fVar246 * fVar306 + fVar226 * fVar282 + fVar150 * fVar258 + fVar261 * fVar243;
      auVar201._28_4_ = fVar208 + fVar340 + fVar280 + 0.0;
      auVar135._0_4_ = fVar341 * fVar195 + fVar149 * fVar318 + fVar152 * fVar262 + fVar288 * fVar193
      ;
      auVar135._4_4_ = fVar344 * fVar209 + fVar151 * fVar320 + fVar154 * fVar268 + fVar300 * fVar283
      ;
      auVar135._8_4_ = fVar345 * fVar255 + fVar153 * fVar322 + fVar155 * fVar269 + fVar303 * fVar285
      ;
      auVar135._12_4_ =
           fVar346 * fVar325 + fVar194 * auVar159._12_4_ + fVar156 * fVar270 +
           auVar199._12_4_ * fVar289;
      auVar135._16_4_ =
           fVar341 * fVar271 + fVar146 * fVar318 + fVar228 * fVar262 + fVar288 * fVar301;
      auVar135._20_4_ =
           fVar344 * fVar212 + fVar148 * fVar320 + fVar178 * fVar268 + fVar300 * fVar304;
      auVar135._24_4_ =
           fVar345 * fVar282 + fVar150 * fVar322 + fVar261 * fVar269 + fVar303 * fVar306;
      auVar135._28_4_ = fVar340 + fVar270 + fVar280 + fVar208;
      auVar19 = vsubps_avx(auVar220,auVar328);
      auVar20 = vsubps_avx(auVar201,auVar277);
      fVar240 = auVar19._0_4_;
      fVar244 = auVar19._4_4_;
      auVar169._4_4_ = auVar277._4_4_ * fVar244;
      auVar169._0_4_ = auVar277._0_4_ * fVar240;
      fVar257 = auVar19._8_4_;
      auVar169._8_4_ = auVar277._8_4_ * fVar257;
      fVar274 = auVar19._12_4_;
      auVar169._12_4_ = auVar277._12_4_ * fVar274;
      fVar279 = auVar19._16_4_;
      auVar169._16_4_ = auVar277._16_4_ * fVar279;
      fVar272 = auVar19._20_4_;
      auVar169._20_4_ = auVar277._20_4_ * fVar272;
      fVar213 = auVar19._24_4_;
      auVar169._24_4_ = auVar277._24_4_ * fVar213;
      auVar169._28_4_ = fVar208;
      fVar208 = auVar20._0_4_;
      fVar210 = auVar20._4_4_;
      auVar21._4_4_ = auVar328._4_4_ * fVar210;
      auVar21._0_4_ = auVar328._0_4_ * fVar208;
      fVar259 = auVar20._8_4_;
      auVar21._8_4_ = auVar328._8_4_ * fVar259;
      fVar211 = auVar20._12_4_;
      auVar21._12_4_ = auVar328._12_4_ * fVar211;
      fVar280 = auVar20._16_4_;
      auVar21._16_4_ = auVar328._16_4_ * fVar280;
      fVar281 = auVar20._20_4_;
      auVar21._20_4_ = auVar328._20_4_ * fVar281;
      fVar273 = auVar20._24_4_;
      auVar21._24_4_ = auVar328._24_4_ * fVar273;
      auVar21._28_4_ = auVar201._28_4_;
      auVar21 = vsubps_avx(auVar169,auVar21);
      auVar22._4_4_ = fVar171;
      auVar22._0_4_ = fVar157;
      auVar22._8_4_ = fVar172;
      auVar22._12_4_ = fVar173;
      auVar22._16_4_ = fVar174;
      auVar22._20_4_ = fVar175;
      auVar22._24_4_ = fVar176;
      auVar22._28_4_ = fVar177;
      auVar169 = vmaxps_avx(auVar22,auVar135);
      auVar26._4_4_ = auVar169._4_4_ * auVar169._4_4_ * (fVar244 * fVar244 + fVar210 * fVar210);
      auVar26._0_4_ = auVar169._0_4_ * auVar169._0_4_ * (fVar240 * fVar240 + fVar208 * fVar208);
      auVar26._8_4_ = auVar169._8_4_ * auVar169._8_4_ * (fVar257 * fVar257 + fVar259 * fVar259);
      auVar26._12_4_ = auVar169._12_4_ * auVar169._12_4_ * (fVar274 * fVar274 + fVar211 * fVar211);
      auVar26._16_4_ = auVar169._16_4_ * auVar169._16_4_ * (fVar279 * fVar279 + fVar280 * fVar280);
      auVar26._20_4_ = auVar169._20_4_ * auVar169._20_4_ * (fVar272 * fVar272 + fVar281 * fVar281);
      auVar26._24_4_ = auVar169._24_4_ * auVar169._24_4_ * (fVar213 * fVar213 + fVar273 * fVar273);
      auVar26._28_4_ = auVar19._28_4_ + auVar201._28_4_;
      auVar16._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar16._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar16._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar16._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar16._16_4_ = auVar21._16_4_ * auVar21._16_4_;
      auVar16._20_4_ = auVar21._20_4_ * auVar21._20_4_;
      auVar16._24_4_ = auVar21._24_4_ * auVar21._24_4_;
      auVar16._28_4_ = auVar21._28_4_;
      auVar169 = vcmpps_avx(auVar16,auVar26,2);
      auVar199 = ZEXT416((uint)(float)(int)uVar10);
      local_540._0_16_ = auVar199;
      auVar199 = vshufps_avx(auVar199,auVar199,0);
      auVar202._16_16_ = auVar199;
      auVar202._0_16_ = auVar199;
      auVar21 = vcmpps_avx(_DAT_01faff40,auVar202,1);
      auVar207 = ZEXT3264(auVar21);
      auVar199 = vpermilps_avx(auVar160,0xaa);
      register0x00001450 = auVar199;
      _local_5a0 = auVar199;
      auVar200 = vpermilps_avx(auVar335,0xaa);
      register0x00001550 = auVar200;
      _local_580 = auVar200;
      auVar129 = vpermilps_avx(auVar233,0xaa);
      register0x00001590 = auVar129;
      _local_c0 = auVar129;
      auVar130 = vpermilps_avx(auVar276,0xaa);
      register0x00001310 = auVar130;
      _local_440 = auVar130;
      auVar26 = auVar21 & auVar169;
      uVar8 = *(uint *)(ray + k * 4 + 0x60);
      auVar198 = ZEXT416((uint)(auVar198._0_4_ * 4.7683716e-07));
      local_940 = auVar17._0_4_;
      fStack_93c = auVar17._4_4_;
      fStack_938 = auVar17._8_4_;
      fStack_934 = auVar17._12_4_;
      local_370 = auVar17._0_8_;
      uVar112 = local_370;
      uStack_368 = auVar17._8_8_;
      uVar113 = uStack_368;
      local_930 = auVar18._0_4_;
      fStack_92c = auVar18._4_4_;
      fStack_928 = auVar18._8_4_;
      fStack_924 = auVar18._12_4_;
      local_360 = auVar18._0_8_;
      uVar114 = local_360;
      uStack_358 = auVar18._8_8_;
      uVar115 = uStack_358;
      local_7b0 = auVar185._0_4_;
      fStack_7ac = auVar185._4_4_;
      fStack_7a8 = auVar185._8_4_;
      fStack_7a4 = auVar185._12_4_;
      local_340 = auVar185._0_8_;
      uVar116 = local_340;
      uStack_338 = auVar185._8_8_;
      uVar117 = uStack_338;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0x7f,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0xbf,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
      {
        auVar298 = ZEXT3264(auVar291);
        auVar314 = ZEXT3264(auVar294);
LAB_00e8d9eb:
        uVar123 = 0;
        bVar118 = false;
      }
      else {
        local_480 = vandps_avx(auVar169,auVar21);
        fVar262 = auVar199._0_4_;
        fVar268 = auVar199._4_4_;
        fVar269 = auVar199._8_4_;
        fVar270 = auVar199._12_4_;
        fVar288 = auVar200._0_4_;
        fVar300 = auVar200._4_4_;
        fVar303 = auVar200._8_4_;
        fVar318 = auVar200._12_4_;
        fVar320 = auVar129._0_4_;
        fVar322 = auVar129._4_4_;
        fVar341 = auVar129._8_4_;
        fVar344 = auVar129._12_4_;
        fVar240 = auVar130._0_4_;
        fVar208 = auVar130._4_4_;
        fVar244 = auVar130._8_4_;
        fVar210 = auVar130._12_4_;
        local_4a0._0_4_ =
             fVar262 * fVar193 + fVar288 * fVar195 + fVar320 * fVar149 + fVar152 * fVar240;
        local_4a0._4_4_ =
             fVar268 * fVar283 + fVar300 * fVar209 + fVar322 * fVar151 + fVar154 * fVar208;
        fStack_498 = fVar269 * fVar285 + fVar303 * fVar255 + fVar341 * fVar153 + fVar155 * fVar244;
        fStack_494 = fVar270 * fVar289 + fVar318 * fVar325 + fVar344 * fVar194 + fVar156 * fVar210;
        fStack_490 = fVar262 * fVar301 + fVar288 * fVar271 + fVar320 * fVar146 + fVar228 * fVar240;
        fStack_48c = fVar268 * fVar304 + fVar300 * fVar212 + fVar322 * fVar148 + fVar178 * fVar208;
        fStack_488 = fVar269 * fVar306 + fVar303 * fVar282 + fVar341 * fVar150 + fVar261 * fVar244;
        fStack_484 = local_480._28_4_ +
                     auVar21._28_4_ + *(float *)(catmullrom_basis1 + lVar14 + 0x924) + 0.0;
        local_640._0_4_ = auVar107._0_4_;
        local_640._4_4_ = auVar107._4_4_;
        fStack_638 = auVar107._8_4_;
        fStack_634 = auVar107._12_4_;
        fStack_630 = auVar107._16_4_;
        fStack_62c = auVar107._20_4_;
        fStack_628 = auVar107._24_4_;
        local_7a0._0_4_ = auVar106._0_4_;
        local_7a0._4_4_ = auVar106._4_4_;
        uStack_798._0_4_ = auVar106._8_4_;
        uStack_798._4_4_ = auVar106._12_4_;
        fStack_790 = auVar106._16_4_;
        fStack_78c = auVar106._20_4_;
        fStack_788 = auVar106._24_4_;
        local_780._0_4_ = auVar105._0_4_;
        local_780._4_4_ = auVar105._4_4_;
        fStack_778 = auVar105._8_4_;
        fStack_774 = auVar105._12_4_;
        fStack_770 = auVar105._16_4_;
        fStack_76c = auVar105._20_4_;
        fStack_768 = auVar105._24_4_;
        local_780._0_4_ =
             fVar262 * (float)local_640._0_4_ +
             fVar288 * fVar284 + fVar320 * (float)local_7a0._0_4_ + fVar240 * (float)local_780._0_4_
        ;
        local_780._4_4_ =
             fVar268 * (float)local_640._4_4_ +
             fVar300 * fVar286 + fVar322 * (float)local_7a0._4_4_ + fVar208 * (float)local_780._4_4_
        ;
        fStack_778 = fVar269 * fStack_638 +
                     fVar303 * fVar214 + fVar341 * (float)uStack_798 + fVar244 * fStack_778;
        fStack_774 = fVar270 * fStack_634 +
                     fVar318 * fVar308 + fVar344 * uStack_798._4_4_ + fVar210 * fStack_774;
        fStack_770 = fVar262 * fStack_630 +
                     fVar288 * fVar127 + fVar320 * fStack_790 + fVar240 * fStack_770;
        fStack_76c = fVar268 * fStack_62c +
                     fVar300 * fVar145 + fVar322 * fStack_78c + fVar208 * fStack_76c;
        fStack_768 = fVar269 * fStack_628 +
                     fVar303 * fVar147 + fVar341 * fStack_788 + fVar244 * fStack_768;
        fStack_764 = fStack_484 + local_480._28_4_ + auVar21._28_4_ + 0.0;
        fVar195 = *(float *)(catmullrom_basis0 + lVar14 + 0x1210);
        fVar209 = *(float *)(catmullrom_basis0 + lVar14 + 0x1214);
        fVar255 = *(float *)(catmullrom_basis0 + lVar14 + 0x1218);
        fVar257 = *(float *)(catmullrom_basis0 + lVar14 + 0x121c);
        fVar259 = *(float *)(catmullrom_basis0 + lVar14 + 0x1220);
        fVar325 = *(float *)(catmullrom_basis0 + lVar14 + 0x1224);
        fVar274 = *(float *)(catmullrom_basis0 + lVar14 + 0x1228);
        fVar211 = *(float *)(catmullrom_basis0 + lVar14 + 0x1694);
        fVar271 = *(float *)(catmullrom_basis0 + lVar14 + 0x1698);
        fVar279 = *(float *)(catmullrom_basis0 + lVar14 + 0x169c);
        fVar280 = *(float *)(catmullrom_basis0 + lVar14 + 0x16a0);
        fVar212 = *(float *)(catmullrom_basis0 + lVar14 + 0x16a4);
        fVar272 = *(float *)(catmullrom_basis0 + lVar14 + 0x16a8);
        fVar281 = *(float *)(catmullrom_basis0 + lVar14 + 0x16ac);
        fVar282 = *(float *)(catmullrom_basis0 + lVar14 + 0x1b18);
        fVar213 = *(float *)(catmullrom_basis0 + lVar14 + 0x1b1c);
        fVar273 = *(float *)(catmullrom_basis0 + lVar14 + 0x1b20);
        fVar284 = *(float *)(catmullrom_basis0 + lVar14 + 0x1b24);
        fVar286 = *(float *)(catmullrom_basis0 + lVar14 + 0x1b28);
        fVar214 = *(float *)(catmullrom_basis0 + lVar14 + 0x1b2c);
        fVar308 = *(float *)(catmullrom_basis0 + lVar14 + 0x1b30);
        fVar127 = *(float *)(catmullrom_basis0 + lVar14 + 0x1f9c);
        fVar145 = *(float *)(catmullrom_basis0 + lVar14 + 0x1fa0);
        fVar147 = *(float *)(catmullrom_basis0 + lVar14 + 0x1fa4);
        fVar149 = *(float *)(catmullrom_basis0 + lVar14 + 0x1fa8);
        fVar151 = *(float *)(catmullrom_basis0 + lVar14 + 0x1fac);
        fVar153 = *(float *)(catmullrom_basis0 + lVar14 + 0x1fb0);
        fVar194 = *(float *)(catmullrom_basis0 + lVar14 + 0x1fb4);
        fVar148 = fVar270 + auVar310._28_4_;
        fVar146 = *(float *)(catmullrom_basis0 + lVar14 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar14 + 0x1fb8);
        fVar150 = *(float *)(catmullrom_basis0 + lVar14 + 0x16b0) + fVar146;
        local_620 = fVar333 * fVar195 + fVar319 * fVar211 + fVar287 * fVar282 + fVar307 * fVar127;
        fStack_61c = fVar338 * fVar209 + fVar321 * fVar271 + fVar299 * fVar213 + fVar315 * fVar145;
        fStack_618 = fVar339 * fVar255 + fVar323 * fVar279 + fVar302 * fVar273 + fVar316 * fVar147;
        fStack_614 = fVar340 * fVar257 + fVar324 * fVar280 + fVar305 * fVar284 + fVar317 * fVar149;
        fStack_610 = fVar333 * fVar259 + fVar319 * fVar212 + fVar287 * fVar286 + fVar307 * fVar151;
        fStack_60c = fVar338 * fVar325 + fVar321 * fVar272 + fVar299 * fVar214 + fVar315 * fVar153;
        fStack_608 = fVar339 * fVar274 + fVar323 * fVar281 + fVar302 * fVar308 + fVar316 * fVar194;
        fStack_604 = *(float *)(catmullrom_basis0 + lVar14 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar14 + 0x1fb8) + fVar148;
        auVar249._0_4_ =
             fVar229 * fVar195 + fVar247 * fVar282 + fVar230 * fVar127 + fVar215 * fVar211;
        auVar249._4_4_ =
             fVar242 * fVar209 + fVar256 * fVar213 + fVar241 * fVar145 + fVar225 * fVar271;
        auVar249._8_4_ =
             fVar246 * fVar255 + fVar258 * fVar273 + fVar243 * fVar147 + fVar226 * fVar279;
        auVar249._12_4_ =
             fVar326 * fVar257 + fVar260 * fVar284 + fVar245 * fVar149 + fVar227 * fVar280;
        auVar249._16_4_ =
             fVar229 * fVar259 + fVar247 * fVar286 + fVar230 * fVar151 + fVar215 * fVar212;
        auVar249._20_4_ =
             fVar242 * fVar325 + fVar256 * fVar214 + fVar241 * fVar153 + fVar225 * fVar272;
        auVar249._24_4_ =
             fVar246 * fVar274 + fVar258 * fVar308 + fVar243 * fVar194 + fVar226 * fVar281;
        auVar249._28_4_ = fVar146 + fVar270 + 0.0 + fVar148;
        local_640._4_4_ =
             fVar300 * fVar271 + fVar322 * fVar213 + fVar208 * fVar145 + fVar268 * fVar209;
        local_640._0_4_ =
             fVar288 * fVar211 + fVar320 * fVar282 + fVar240 * fVar127 + fVar262 * fVar195;
        fStack_638 = fVar303 * fVar279 + fVar341 * fVar273 + fVar244 * fVar147 + fVar269 * fVar255;
        fStack_634 = fVar318 * fVar280 + fVar344 * fVar284 + fVar210 * fVar149 + fVar270 * fVar257;
        fStack_630 = fVar288 * fVar212 + fVar320 * fVar286 + fVar240 * fVar151 + fVar262 * fVar259;
        fStack_62c = fVar300 * fVar272 + fVar322 * fVar214 + fVar208 * fVar153 + fVar268 * fVar325;
        fStack_628 = fVar303 * fVar281 + fVar341 * fVar308 + fVar244 * fVar194 + fVar269 * fVar274;
        fStack_624 = fVar150 + *(float *)(catmullrom_basis0 + lVar14 + 0x122c);
        fVar195 = *(float *)(catmullrom_basis1 + lVar14 + 0x1b18);
        fVar209 = *(float *)(catmullrom_basis1 + lVar14 + 0x1b1c);
        fVar255 = *(float *)(catmullrom_basis1 + lVar14 + 0x1b20);
        fVar257 = *(float *)(catmullrom_basis1 + lVar14 + 0x1b24);
        fVar259 = *(float *)(catmullrom_basis1 + lVar14 + 0x1b28);
        fVar325 = *(float *)(catmullrom_basis1 + lVar14 + 0x1b2c);
        fVar274 = *(float *)(catmullrom_basis1 + lVar14 + 0x1b30);
        fVar211 = *(float *)(catmullrom_basis1 + lVar14 + 0x1f9c);
        fVar271 = *(float *)(catmullrom_basis1 + lVar14 + 0x1fa0);
        fVar279 = *(float *)(catmullrom_basis1 + lVar14 + 0x1fa4);
        fVar280 = *(float *)(catmullrom_basis1 + lVar14 + 0x1fa8);
        fVar212 = *(float *)(catmullrom_basis1 + lVar14 + 0x1fac);
        fVar272 = *(float *)(catmullrom_basis1 + lVar14 + 0x1fb0);
        fVar281 = *(float *)(catmullrom_basis1 + lVar14 + 0x1fb4);
        fVar282 = *(float *)(catmullrom_basis1 + lVar14 + 0x1694);
        fVar213 = *(float *)(catmullrom_basis1 + lVar14 + 0x1698);
        fVar273 = *(float *)(catmullrom_basis1 + lVar14 + 0x169c);
        fVar284 = *(float *)(catmullrom_basis1 + lVar14 + 0x16a0);
        fVar286 = *(float *)(catmullrom_basis1 + lVar14 + 0x16a4);
        fVar214 = *(float *)(catmullrom_basis1 + lVar14 + 0x16a8);
        fVar308 = *(float *)(catmullrom_basis1 + lVar14 + 0x16ac);
        fVar127 = *(float *)(catmullrom_basis1 + lVar14 + 0x1210);
        fVar145 = *(float *)(catmullrom_basis1 + lVar14 + 0x1214);
        fVar147 = *(float *)(catmullrom_basis1 + lVar14 + 0x1218);
        fVar149 = *(float *)(catmullrom_basis1 + lVar14 + 0x121c);
        fVar151 = *(float *)(catmullrom_basis1 + lVar14 + 0x1220);
        fVar153 = *(float *)(catmullrom_basis1 + lVar14 + 0x1224);
        fVar194 = *(float *)(catmullrom_basis1 + lVar14 + 0x1228);
        auVar266._0_4_ =
             fVar333 * fVar127 + fVar319 * fVar282 + fVar287 * fVar195 + fVar307 * fVar211;
        auVar266._4_4_ =
             fVar338 * fVar145 + fVar321 * fVar213 + fVar299 * fVar209 + fVar315 * fVar271;
        auVar266._8_4_ =
             fVar339 * fVar147 + fVar323 * fVar273 + fVar302 * fVar255 + fVar316 * fVar279;
        auVar266._12_4_ =
             fVar340 * fVar149 + fVar324 * fVar284 + fVar305 * fVar257 + fVar317 * fVar280;
        auVar266._16_4_ =
             fVar333 * fVar151 + fVar319 * fVar286 + fVar287 * fVar259 + fVar307 * fVar212;
        auVar266._20_4_ =
             fVar338 * fVar153 + fVar321 * fVar214 + fVar299 * fVar325 + fVar315 * fVar272;
        auVar266._24_4_ =
             fVar339 * fVar194 + fVar323 * fVar308 + fVar302 * fVar274 + fVar316 * fVar281;
        auVar266._28_4_ = fVar260 + fVar260 + fVar150 + fVar317;
        auVar292._0_4_ =
             fVar229 * fVar127 + fVar215 * fVar282 + fVar247 * fVar195 + fVar230 * fVar211;
        auVar292._4_4_ =
             fVar242 * fVar145 + fVar225 * fVar213 + fVar256 * fVar209 + fVar241 * fVar271;
        auVar292._8_4_ =
             fVar246 * fVar147 + fVar226 * fVar273 + fVar258 * fVar255 + fVar243 * fVar279;
        auVar292._12_4_ =
             fVar326 * fVar149 + fVar227 * fVar284 + fVar260 * fVar257 + fVar245 * fVar280;
        auVar292._16_4_ =
             fVar229 * fVar151 + fVar215 * fVar286 + fVar247 * fVar259 + fVar230 * fVar212;
        auVar292._20_4_ =
             fVar242 * fVar153 + fVar225 * fVar214 + fVar256 * fVar325 + fVar241 * fVar272;
        auVar292._24_4_ =
             fVar246 * fVar194 + fVar226 * fVar308 + fVar258 * fVar274 + fVar243 * fVar281;
        auVar292._28_4_ = fVar260 + fVar260 + fVar260 + fVar150;
        auVar187._0_4_ =
             fVar262 * fVar127 + fVar288 * fVar282 + fVar320 * fVar195 + fVar240 * fVar211;
        auVar187._4_4_ =
             fVar268 * fVar145 + fVar300 * fVar213 + fVar322 * fVar209 + fVar208 * fVar271;
        auVar187._8_4_ =
             fVar269 * fVar147 + fVar303 * fVar273 + fVar341 * fVar255 + fVar244 * fVar279;
        auVar187._12_4_ =
             fVar270 * fVar149 + fVar318 * fVar284 + fVar344 * fVar257 + fVar210 * fVar280;
        auVar187._16_4_ =
             fVar262 * fVar151 + fVar288 * fVar286 + fVar320 * fVar259 + fVar240 * fVar212;
        auVar187._20_4_ =
             fVar268 * fVar153 + fVar300 * fVar214 + fVar322 * fVar325 + fVar208 * fVar272;
        auVar187._24_4_ =
             fVar269 * fVar194 + fVar303 * fVar308 + fVar341 * fVar274 + fVar244 * fVar281;
        auVar187._28_4_ =
             *(float *)(catmullrom_basis1 + lVar14 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar14 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar14 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar14 + 0x1fb8);
        auVar221._8_4_ = 0x7fffffff;
        auVar221._0_8_ = 0x7fffffff7fffffff;
        auVar221._12_4_ = 0x7fffffff;
        auVar221._16_4_ = 0x7fffffff;
        auVar221._20_4_ = 0x7fffffff;
        auVar221._24_4_ = 0x7fffffff;
        auVar221._28_4_ = 0x7fffffff;
        auVar103._4_4_ = fStack_61c;
        auVar103._0_4_ = local_620;
        auVar103._8_4_ = fStack_618;
        auVar103._12_4_ = fStack_614;
        auVar103._16_4_ = fStack_610;
        auVar103._20_4_ = fStack_60c;
        auVar103._24_4_ = fStack_608;
        auVar103._28_4_ = fStack_604;
        auVar310 = vandps_avx(auVar103,auVar221);
        auVar169 = vandps_avx(auVar249,auVar221);
        auVar169 = vmaxps_avx(auVar310,auVar169);
        auVar310 = vandps_avx(auVar221,_local_640);
        auVar310 = vmaxps_avx(auVar169,auVar310);
        auVar17 = vpermilps_avx(auVar198,0);
        auVar250._16_16_ = auVar17;
        auVar250._0_16_ = auVar17;
        auVar310 = vcmpps_avx(auVar310,auVar250,1);
        auVar21 = vblendvps_avx(auVar103,auVar19,auVar310);
        auVar26 = vblendvps_avx(auVar249,auVar20,auVar310);
        auVar310 = vandps_avx(auVar266,auVar221);
        auVar169 = vandps_avx(auVar292,auVar221);
        auVar16 = vmaxps_avx(auVar310,auVar169);
        auVar310 = vandps_avx(auVar187,auVar221);
        auVar310 = vmaxps_avx(auVar16,auVar310);
        auVar16 = vcmpps_avx(auVar310,auVar250,1);
        auVar310 = vblendvps_avx(auVar266,auVar19,auVar16);
        auVar19 = vblendvps_avx(auVar292,auVar20,auVar16);
        fVar127 = auVar21._0_4_;
        fVar145 = auVar21._4_4_;
        fVar147 = auVar21._8_4_;
        fVar149 = auVar21._12_4_;
        fVar151 = auVar21._16_4_;
        fVar153 = auVar21._20_4_;
        fVar194 = auVar21._24_4_;
        fVar146 = auVar310._0_4_;
        fVar148 = auVar310._4_4_;
        fVar150 = auVar310._8_4_;
        fVar152 = auVar310._12_4_;
        fVar154 = auVar310._16_4_;
        fVar155 = auVar310._20_4_;
        fVar156 = auVar310._24_4_;
        fVar228 = -auVar310._28_4_;
        fVar229 = auVar26._0_4_;
        fVar242 = auVar26._4_4_;
        fVar246 = auVar26._8_4_;
        fVar326 = auVar26._12_4_;
        fVar271 = auVar26._16_4_;
        fVar272 = auVar26._20_4_;
        fVar273 = auVar26._24_4_;
        auVar136._0_4_ = fVar229 * fVar229 + fVar127 * fVar127;
        auVar136._4_4_ = fVar242 * fVar242 + fVar145 * fVar145;
        auVar136._8_4_ = fVar246 * fVar246 + fVar147 * fVar147;
        auVar136._12_4_ = fVar326 * fVar326 + fVar149 * fVar149;
        auVar136._16_4_ = fVar271 * fVar271 + fVar151 * fVar151;
        auVar136._20_4_ = fVar272 * fVar272 + fVar153 * fVar153;
        auVar136._24_4_ = fVar273 * fVar273 + fVar194 * fVar194;
        auVar136._28_4_ = auVar292._28_4_ + auVar21._28_4_;
        auVar21 = vrsqrtps_avx(auVar136);
        fVar195 = auVar21._0_4_;
        fVar240 = auVar21._4_4_;
        auVar20._4_4_ = fVar240 * 1.5;
        auVar20._0_4_ = fVar195 * 1.5;
        fVar208 = auVar21._8_4_;
        auVar20._8_4_ = fVar208 * 1.5;
        fVar209 = auVar21._12_4_;
        auVar20._12_4_ = fVar209 * 1.5;
        fVar244 = auVar21._16_4_;
        auVar20._16_4_ = fVar244 * 1.5;
        fVar210 = auVar21._20_4_;
        auVar20._20_4_ = fVar210 * 1.5;
        fVar255 = auVar21._24_4_;
        fVar308 = auVar169._28_4_;
        auVar20._24_4_ = fVar255 * 1.5;
        auVar20._28_4_ = fVar308;
        auVar23._4_4_ = fVar240 * fVar240 * fVar240 * auVar136._4_4_ * 0.5;
        auVar23._0_4_ = fVar195 * fVar195 * fVar195 * auVar136._0_4_ * 0.5;
        auVar23._8_4_ = fVar208 * fVar208 * fVar208 * auVar136._8_4_ * 0.5;
        auVar23._12_4_ = fVar209 * fVar209 * fVar209 * auVar136._12_4_ * 0.5;
        auVar23._16_4_ = fVar244 * fVar244 * fVar244 * auVar136._16_4_ * 0.5;
        auVar23._20_4_ = fVar210 * fVar210 * fVar210 * auVar136._20_4_ * 0.5;
        auVar23._24_4_ = fVar255 * fVar255 * fVar255 * auVar136._24_4_ * 0.5;
        auVar23._28_4_ = auVar136._28_4_;
        auVar169 = vsubps_avx(auVar20,auVar23);
        fVar195 = auVar169._0_4_;
        fVar209 = auVar169._4_4_;
        fVar255 = auVar169._8_4_;
        fVar325 = auVar169._12_4_;
        fVar279 = auVar169._16_4_;
        fVar281 = auVar169._20_4_;
        fVar284 = auVar169._24_4_;
        fVar240 = auVar19._0_4_;
        fVar244 = auVar19._4_4_;
        fVar257 = auVar19._8_4_;
        fVar274 = auVar19._12_4_;
        fVar280 = auVar19._16_4_;
        fVar282 = auVar19._20_4_;
        fVar286 = auVar19._24_4_;
        auVar137._0_4_ = fVar240 * fVar240 + fVar146 * fVar146;
        auVar137._4_4_ = fVar244 * fVar244 + fVar148 * fVar148;
        auVar137._8_4_ = fVar257 * fVar257 + fVar150 * fVar150;
        auVar137._12_4_ = fVar274 * fVar274 + fVar152 * fVar152;
        auVar137._16_4_ = fVar280 * fVar280 + fVar154 * fVar154;
        auVar137._20_4_ = fVar282 * fVar282 + fVar155 * fVar155;
        auVar137._24_4_ = fVar286 * fVar286 + fVar156 * fVar156;
        auVar137._28_4_ = auVar310._28_4_ + auVar169._28_4_;
        auVar310 = vrsqrtps_avx(auVar137);
        fVar208 = auVar310._0_4_;
        fVar210 = auVar310._4_4_;
        auVar24._4_4_ = fVar210 * 1.5;
        auVar24._0_4_ = fVar208 * 1.5;
        fVar259 = auVar310._8_4_;
        auVar24._8_4_ = fVar259 * 1.5;
        fVar211 = auVar310._12_4_;
        auVar24._12_4_ = fVar211 * 1.5;
        fVar212 = auVar310._16_4_;
        auVar24._16_4_ = fVar212 * 1.5;
        fVar213 = auVar310._20_4_;
        auVar24._20_4_ = fVar213 * 1.5;
        fVar214 = auVar310._24_4_;
        auVar24._24_4_ = fVar214 * 1.5;
        auVar24._28_4_ = fVar308;
        auVar310._4_4_ = fVar210 * fVar210 * fVar210 * auVar137._4_4_ * 0.5;
        auVar310._0_4_ = fVar208 * fVar208 * fVar208 * auVar137._0_4_ * 0.5;
        auVar310._8_4_ = fVar259 * fVar259 * fVar259 * auVar137._8_4_ * 0.5;
        auVar310._12_4_ = fVar211 * fVar211 * fVar211 * auVar137._12_4_ * 0.5;
        auVar310._16_4_ = fVar212 * fVar212 * fVar212 * auVar137._16_4_ * 0.5;
        auVar310._20_4_ = fVar213 * fVar213 * fVar213 * auVar137._20_4_ * 0.5;
        auVar310._24_4_ = fVar214 * fVar214 * fVar214 * auVar137._24_4_ * 0.5;
        auVar310._28_4_ = auVar137._28_4_;
        auVar310 = vsubps_avx(auVar24,auVar310);
        fVar208 = auVar310._0_4_;
        fVar210 = auVar310._4_4_;
        fVar259 = auVar310._8_4_;
        fVar211 = auVar310._12_4_;
        fVar212 = auVar310._16_4_;
        fVar213 = auVar310._20_4_;
        fVar214 = auVar310._24_4_;
        fVar229 = fVar157 * fVar229 * fVar195;
        fVar242 = fVar171 * fVar242 * fVar209;
        auVar25._4_4_ = fVar242;
        auVar25._0_4_ = fVar229;
        fVar246 = fVar172 * fVar246 * fVar255;
        auVar25._8_4_ = fVar246;
        fVar326 = fVar173 * fVar326 * fVar325;
        auVar25._12_4_ = fVar326;
        fVar271 = fVar174 * fVar271 * fVar279;
        auVar25._16_4_ = fVar271;
        fVar272 = fVar175 * fVar272 * fVar281;
        auVar25._20_4_ = fVar272;
        fVar273 = fVar176 * fVar273 * fVar284;
        auVar25._24_4_ = fVar273;
        auVar25._28_4_ = fVar228;
        local_680._4_4_ = auVar328._4_4_ + fVar242;
        local_680._0_4_ = auVar328._0_4_ + fVar229;
        uStack_678._0_4_ = auVar328._8_4_ + fVar246;
        uStack_678._4_4_ = auVar328._12_4_ + fVar326;
        uStack_670._0_4_ = auVar328._16_4_ + fVar271;
        uStack_670._4_4_ = auVar328._20_4_ + fVar272;
        uStack_668._0_4_ = auVar328._24_4_ + fVar273;
        uStack_668._4_4_ = auVar328._28_4_ + fVar228;
        fVar229 = fVar157 * fVar195 * -fVar127;
        fVar242 = fVar171 * fVar209 * -fVar145;
        auVar27._4_4_ = fVar242;
        auVar27._0_4_ = fVar229;
        fVar246 = fVar172 * fVar255 * -fVar147;
        auVar27._8_4_ = fVar246;
        fVar326 = fVar173 * fVar325 * -fVar149;
        auVar27._12_4_ = fVar326;
        fVar271 = fVar174 * fVar279 * -fVar151;
        auVar27._16_4_ = fVar271;
        fVar272 = fVar175 * fVar281 * -fVar153;
        auVar27._20_4_ = fVar272;
        fVar273 = fVar176 * fVar284 * -fVar194;
        auVar27._24_4_ = fVar273;
        auVar27._28_4_ = fVar308;
        local_6a0._4_4_ = fVar242 + auVar277._4_4_;
        local_6a0._0_4_ = fVar229 + auVar277._0_4_;
        fStack_698 = fVar246 + auVar277._8_4_;
        fStack_694 = fVar326 + auVar277._12_4_;
        fStack_690 = fVar271 + auVar277._16_4_;
        fStack_68c = fVar272 + auVar277._20_4_;
        fStack_688 = fVar273 + auVar277._24_4_;
        fStack_684 = fVar308 + 0.0;
        fVar229 = fVar157 * fVar195 * 0.0;
        fVar195 = fVar171 * fVar209 * 0.0;
        auVar28._4_4_ = fVar195;
        auVar28._0_4_ = fVar229;
        fVar242 = fVar172 * fVar255 * 0.0;
        auVar28._8_4_ = fVar242;
        fVar209 = fVar173 * fVar325 * 0.0;
        auVar28._12_4_ = fVar209;
        fVar246 = fVar174 * fVar279 * 0.0;
        auVar28._16_4_ = fVar246;
        fVar255 = fVar175 * fVar281 * 0.0;
        auVar28._20_4_ = fVar255;
        fVar326 = fVar176 * fVar284 * 0.0;
        auVar28._24_4_ = fVar326;
        auVar28._28_4_ = fVar324;
        auVar251._0_4_ = (float)local_780._0_4_ + fVar229;
        auVar251._4_4_ = (float)local_780._4_4_ + fVar195;
        auVar251._8_4_ = fStack_778 + fVar242;
        auVar251._12_4_ = fStack_774 + fVar209;
        auVar251._16_4_ = fStack_770 + fVar246;
        auVar251._20_4_ = fStack_76c + fVar255;
        auVar251._24_4_ = fStack_768 + fVar326;
        auVar251._28_4_ = fStack_764 + fVar324;
        fVar229 = auVar135._0_4_ * fVar240 * fVar208;
        fVar195 = auVar135._4_4_ * fVar244 * fVar210;
        auVar29._4_4_ = fVar195;
        auVar29._0_4_ = fVar229;
        fVar240 = auVar135._8_4_ * fVar257 * fVar259;
        auVar29._8_4_ = fVar240;
        fVar242 = auVar135._12_4_ * fVar274 * fVar211;
        auVar29._12_4_ = fVar242;
        fVar209 = auVar135._16_4_ * fVar280 * fVar212;
        auVar29._16_4_ = fVar209;
        fVar244 = auVar135._20_4_ * fVar282 * fVar213;
        auVar29._20_4_ = fVar244;
        fVar246 = auVar135._24_4_ * fVar286 * fVar214;
        auVar29._24_4_ = fVar246;
        auVar29._28_4_ = auVar19._28_4_;
        auVar16 = vsubps_avx(auVar328,auVar25);
        auVar293._0_4_ = auVar220._0_4_ + fVar229;
        auVar293._4_4_ = auVar220._4_4_ + fVar195;
        auVar293._8_4_ = auVar220._8_4_ + fVar240;
        auVar293._12_4_ = auVar220._12_4_ + fVar242;
        auVar293._16_4_ = auVar220._16_4_ + fVar209;
        auVar293._20_4_ = auVar220._20_4_ + fVar244;
        auVar293._24_4_ = auVar220._24_4_ + fVar246;
        auVar293._28_4_ = auVar220._28_4_ + auVar19._28_4_;
        fVar229 = auVar135._0_4_ * fVar208 * -fVar146;
        fVar195 = auVar135._4_4_ * fVar210 * -fVar148;
        auVar19._4_4_ = fVar195;
        auVar19._0_4_ = fVar229;
        fVar240 = auVar135._8_4_ * fVar259 * -fVar150;
        auVar19._8_4_ = fVar240;
        fVar242 = auVar135._12_4_ * fVar211 * -fVar152;
        auVar19._12_4_ = fVar242;
        fVar209 = auVar135._16_4_ * fVar212 * -fVar154;
        auVar19._16_4_ = fVar209;
        fVar244 = auVar135._20_4_ * fVar213 * -fVar155;
        auVar19._20_4_ = fVar244;
        fVar246 = auVar135._24_4_ * fVar214 * -fVar156;
        auVar19._24_4_ = fVar246;
        auVar19._28_4_ = fVar318;
        auVar22 = vsubps_avx(auVar277,auVar27);
        auVar309._0_4_ = fVar229 + auVar201._0_4_;
        auVar309._4_4_ = fVar195 + auVar201._4_4_;
        auVar309._8_4_ = fVar240 + auVar201._8_4_;
        auVar309._12_4_ = fVar242 + auVar201._12_4_;
        auVar309._16_4_ = fVar209 + auVar201._16_4_;
        auVar309._20_4_ = fVar244 + auVar201._20_4_;
        auVar309._24_4_ = fVar246 + auVar201._24_4_;
        auVar309._28_4_ = fVar318 + auVar201._28_4_;
        fVar229 = auVar135._0_4_ * fVar208 * 0.0;
        fVar195 = auVar135._4_4_ * fVar210 * 0.0;
        auVar30._4_4_ = fVar195;
        auVar30._0_4_ = fVar229;
        fVar240 = auVar135._8_4_ * fVar259 * 0.0;
        auVar30._8_4_ = fVar240;
        fVar208 = auVar135._12_4_ * fVar211 * 0.0;
        auVar30._12_4_ = fVar208;
        fVar242 = auVar135._16_4_ * fVar212 * 0.0;
        auVar30._16_4_ = fVar242;
        fVar209 = auVar135._20_4_ * fVar213 * 0.0;
        auVar30._20_4_ = fVar209;
        fVar244 = auVar135._24_4_ * fVar214 * 0.0;
        auVar30._24_4_ = fVar244;
        auVar30._28_4_ = 0x3f000000;
        auVar277 = vsubps_avx(_local_780,auVar28);
        auVar342._0_4_ = fVar229 + (float)local_4a0._0_4_;
        auVar342._4_4_ = fVar195 + (float)local_4a0._4_4_;
        auVar342._8_4_ = fVar240 + fStack_498;
        auVar342._12_4_ = fVar208 + fStack_494;
        auVar342._16_4_ = fVar242 + fStack_490;
        auVar342._20_4_ = fVar209 + fStack_48c;
        auVar342._24_4_ = fVar244 + fStack_488;
        auVar342._28_4_ = fStack_484 + 0.5;
        auVar310 = vsubps_avx(auVar220,auVar29);
        auVar169 = vsubps_avx(auVar201,auVar19);
        auVar328 = vsubps_avx(_local_4a0,auVar30);
        auVar21 = vsubps_avx(auVar309,auVar22);
        auVar19 = vsubps_avx(auVar342,auVar277);
        auVar31._4_4_ = auVar277._4_4_ * auVar21._4_4_;
        auVar31._0_4_ = auVar277._0_4_ * auVar21._0_4_;
        auVar31._8_4_ = auVar277._8_4_ * auVar21._8_4_;
        auVar31._12_4_ = auVar277._12_4_ * auVar21._12_4_;
        auVar31._16_4_ = auVar277._16_4_ * auVar21._16_4_;
        auVar31._20_4_ = auVar277._20_4_ * auVar21._20_4_;
        auVar31._24_4_ = auVar277._24_4_ * auVar21._24_4_;
        auVar31._28_4_ = fVar340;
        auVar32._4_4_ = auVar22._4_4_ * auVar19._4_4_;
        auVar32._0_4_ = auVar22._0_4_ * auVar19._0_4_;
        auVar32._8_4_ = auVar22._8_4_ * auVar19._8_4_;
        auVar32._12_4_ = auVar22._12_4_ * auVar19._12_4_;
        auVar32._16_4_ = auVar22._16_4_ * auVar19._16_4_;
        auVar32._20_4_ = auVar22._20_4_ * auVar19._20_4_;
        auVar32._24_4_ = auVar22._24_4_ * auVar19._24_4_;
        auVar32._28_4_ = fStack_484;
        auVar20 = vsubps_avx(auVar32,auVar31);
        auVar33._4_4_ = auVar16._4_4_ * auVar19._4_4_;
        auVar33._0_4_ = auVar16._0_4_ * auVar19._0_4_;
        auVar33._8_4_ = auVar16._8_4_ * auVar19._8_4_;
        auVar33._12_4_ = auVar16._12_4_ * auVar19._12_4_;
        auVar33._16_4_ = auVar16._16_4_ * auVar19._16_4_;
        auVar33._20_4_ = auVar16._20_4_ * auVar19._20_4_;
        auVar33._24_4_ = auVar16._24_4_ * auVar19._24_4_;
        auVar33._28_4_ = auVar19._28_4_;
        auVar26 = vsubps_avx(auVar293,auVar16);
        auVar34._4_4_ = auVar277._4_4_ * auVar26._4_4_;
        auVar34._0_4_ = auVar277._0_4_ * auVar26._0_4_;
        auVar34._8_4_ = auVar277._8_4_ * auVar26._8_4_;
        auVar34._12_4_ = auVar277._12_4_ * auVar26._12_4_;
        auVar34._16_4_ = auVar277._16_4_ * auVar26._16_4_;
        auVar34._20_4_ = auVar277._20_4_ * auVar26._20_4_;
        auVar34._24_4_ = auVar277._24_4_ * auVar26._24_4_;
        auVar34._28_4_ = auVar220._28_4_;
        auVar201 = vsubps_avx(auVar34,auVar33);
        auVar35._4_4_ = auVar26._4_4_ * auVar22._4_4_;
        auVar35._0_4_ = auVar26._0_4_ * auVar22._0_4_;
        auVar35._8_4_ = auVar26._8_4_ * auVar22._8_4_;
        auVar35._12_4_ = auVar26._12_4_ * auVar22._12_4_;
        auVar35._16_4_ = auVar26._16_4_ * auVar22._16_4_;
        auVar35._20_4_ = auVar26._20_4_ * auVar22._20_4_;
        auVar35._24_4_ = auVar26._24_4_ * auVar22._24_4_;
        auVar35._28_4_ = auVar19._28_4_;
        auVar36._4_4_ = auVar16._4_4_ * auVar21._4_4_;
        auVar36._0_4_ = auVar16._0_4_ * auVar21._0_4_;
        auVar36._8_4_ = auVar16._8_4_ * auVar21._8_4_;
        auVar36._12_4_ = auVar16._12_4_ * auVar21._12_4_;
        auVar36._16_4_ = auVar16._16_4_ * auVar21._16_4_;
        auVar36._20_4_ = auVar16._20_4_ * auVar21._20_4_;
        auVar36._24_4_ = auVar16._24_4_ * auVar21._24_4_;
        auVar36._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar36,auVar35);
        auVar138._0_4_ = auVar20._0_4_ * 0.0 + auVar21._0_4_ + auVar201._0_4_ * 0.0;
        auVar138._4_4_ = auVar20._4_4_ * 0.0 + auVar21._4_4_ + auVar201._4_4_ * 0.0;
        auVar138._8_4_ = auVar20._8_4_ * 0.0 + auVar21._8_4_ + auVar201._8_4_ * 0.0;
        auVar138._12_4_ = auVar20._12_4_ * 0.0 + auVar21._12_4_ + auVar201._12_4_ * 0.0;
        auVar138._16_4_ = auVar20._16_4_ * 0.0 + auVar21._16_4_ + auVar201._16_4_ * 0.0;
        auVar138._20_4_ = auVar20._20_4_ * 0.0 + auVar21._20_4_ + auVar201._20_4_ * 0.0;
        auVar138._24_4_ = auVar20._24_4_ * 0.0 + auVar21._24_4_ + auVar201._24_4_ * 0.0;
        auVar138._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar201._28_4_;
        auVar202 = vcmpps_avx(auVar138,ZEXT432(0) << 0x20,2);
        auVar310 = vblendvps_avx(auVar310,_local_680,auVar202);
        auVar169 = vblendvps_avx(auVar169,_local_6a0,auVar202);
        auVar21 = vblendvps_avx(auVar328,auVar251,auVar202);
        auVar254 = ZEXT3264(auVar21);
        auVar19 = vblendvps_avx(auVar16,auVar293,auVar202);
        auVar20 = vblendvps_avx(auVar22,auVar309,auVar202);
        auVar26 = vblendvps_avx(auVar277,auVar342,auVar202);
        auVar16 = vblendvps_avx(auVar293,auVar16,auVar202);
        auVar22 = vblendvps_avx(auVar309,auVar22,auVar202);
        auVar17 = vpackssdw_avx(local_480._0_16_,local_480._16_16_);
        auVar201 = vblendvps_avx(auVar342,auVar277,auVar202);
        auVar16 = vsubps_avx(auVar16,auVar310);
        auVar220 = vsubps_avx(auVar22,auVar169);
        auVar201 = vsubps_avx(auVar201,auVar21);
        auVar277 = vsubps_avx(auVar169,auVar20);
        fVar229 = auVar220._0_4_;
        fVar194 = auVar21._0_4_;
        fVar209 = auVar220._4_4_;
        fVar146 = auVar21._4_4_;
        auVar37._4_4_ = fVar146 * fVar209;
        auVar37._0_4_ = fVar194 * fVar229;
        fVar257 = auVar220._8_4_;
        fVar148 = auVar21._8_4_;
        auVar37._8_4_ = fVar148 * fVar257;
        fVar211 = auVar220._12_4_;
        fVar150 = auVar21._12_4_;
        auVar37._12_4_ = fVar150 * fVar211;
        fVar272 = auVar220._16_4_;
        fVar152 = auVar21._16_4_;
        auVar37._16_4_ = fVar152 * fVar272;
        fVar284 = auVar220._20_4_;
        fVar154 = auVar21._20_4_;
        auVar37._20_4_ = fVar154 * fVar284;
        fVar145 = auVar220._24_4_;
        fVar155 = auVar21._24_4_;
        auVar37._24_4_ = fVar155 * fVar145;
        auVar37._28_4_ = auVar22._28_4_;
        fVar195 = auVar169._0_4_;
        fVar289 = auVar201._0_4_;
        fVar244 = auVar169._4_4_;
        fVar301 = auVar201._4_4_;
        auVar38._4_4_ = fVar301 * fVar244;
        auVar38._0_4_ = fVar289 * fVar195;
        fVar259 = auVar169._8_4_;
        fVar304 = auVar201._8_4_;
        auVar38._8_4_ = fVar304 * fVar259;
        fVar271 = auVar169._12_4_;
        fVar306 = auVar201._12_4_;
        auVar38._12_4_ = fVar306 * fVar271;
        fVar281 = auVar169._16_4_;
        fVar215 = auVar201._16_4_;
        auVar38._16_4_ = fVar215 * fVar281;
        fVar286 = auVar169._20_4_;
        fVar225 = auVar201._20_4_;
        auVar38._20_4_ = fVar225 * fVar286;
        fVar147 = auVar169._24_4_;
        fVar226 = auVar201._24_4_;
        uVar7 = auVar328._28_4_;
        auVar38._24_4_ = fVar226 * fVar147;
        auVar38._28_4_ = uVar7;
        auVar169 = vsubps_avx(auVar38,auVar37);
        fVar240 = auVar310._0_4_;
        fVar210 = auVar310._4_4_;
        auVar39._4_4_ = fVar301 * fVar210;
        auVar39._0_4_ = fVar289 * fVar240;
        fVar326 = auVar310._8_4_;
        auVar39._8_4_ = fVar304 * fVar326;
        fVar279 = auVar310._12_4_;
        auVar39._12_4_ = fVar306 * fVar279;
        fVar282 = auVar310._16_4_;
        auVar39._16_4_ = fVar215 * fVar282;
        fVar214 = auVar310._20_4_;
        auVar39._20_4_ = fVar225 * fVar214;
        fVar149 = auVar310._24_4_;
        auVar39._24_4_ = fVar226 * fVar149;
        auVar39._28_4_ = uVar7;
        fVar208 = auVar16._0_4_;
        fVar246 = auVar16._4_4_;
        auVar40._4_4_ = fVar146 * fVar246;
        auVar40._0_4_ = fVar194 * fVar208;
        fVar325 = auVar16._8_4_;
        auVar40._8_4_ = fVar148 * fVar325;
        fVar280 = auVar16._12_4_;
        auVar40._12_4_ = fVar150 * fVar280;
        fVar213 = auVar16._16_4_;
        auVar40._16_4_ = fVar152 * fVar213;
        fVar308 = auVar16._20_4_;
        auVar40._20_4_ = fVar154 * fVar308;
        fVar151 = auVar16._24_4_;
        auVar40._24_4_ = fVar155 * fVar151;
        auVar40._28_4_ = auVar342._28_4_;
        auVar22 = vsubps_avx(auVar40,auVar39);
        auVar41._4_4_ = fVar244 * fVar246;
        auVar41._0_4_ = fVar195 * fVar208;
        auVar41._8_4_ = fVar259 * fVar325;
        auVar41._12_4_ = fVar271 * fVar280;
        auVar41._16_4_ = fVar281 * fVar213;
        auVar41._20_4_ = fVar286 * fVar308;
        auVar41._24_4_ = fVar147 * fVar151;
        auVar41._28_4_ = uVar7;
        auVar347._0_4_ = fVar240 * fVar229;
        auVar347._4_4_ = fVar210 * fVar209;
        auVar347._8_4_ = fVar326 * fVar257;
        auVar347._12_4_ = fVar279 * fVar211;
        auVar347._16_4_ = fVar282 * fVar272;
        auVar347._20_4_ = fVar214 * fVar284;
        auVar347._24_4_ = fVar149 * fVar145;
        auVar347._28_4_ = 0;
        auVar328 = vsubps_avx(auVar347,auVar41);
        auVar23 = vsubps_avx(auVar21,auVar26);
        fVar242 = auVar328._28_4_ + auVar22._28_4_;
        auVar164._0_4_ = auVar328._0_4_ + auVar22._0_4_ * 0.0 + auVar169._0_4_ * 0.0;
        auVar164._4_4_ = auVar328._4_4_ + auVar22._4_4_ * 0.0 + auVar169._4_4_ * 0.0;
        auVar164._8_4_ = auVar328._8_4_ + auVar22._8_4_ * 0.0 + auVar169._8_4_ * 0.0;
        auVar164._12_4_ = auVar328._12_4_ + auVar22._12_4_ * 0.0 + auVar169._12_4_ * 0.0;
        auVar164._16_4_ = auVar328._16_4_ + auVar22._16_4_ * 0.0 + auVar169._16_4_ * 0.0;
        auVar164._20_4_ = auVar328._20_4_ + auVar22._20_4_ * 0.0 + auVar169._20_4_ * 0.0;
        auVar164._24_4_ = auVar328._24_4_ + auVar22._24_4_ * 0.0 + auVar169._24_4_ * 0.0;
        auVar164._28_4_ = fVar242 + auVar169._28_4_;
        fVar156 = auVar277._0_4_;
        fVar228 = auVar277._4_4_;
        auVar42._4_4_ = fVar228 * auVar26._4_4_;
        auVar42._0_4_ = fVar156 * auVar26._0_4_;
        fVar178 = auVar277._8_4_;
        auVar42._8_4_ = fVar178 * auVar26._8_4_;
        fVar261 = auVar277._12_4_;
        auVar42._12_4_ = fVar261 * auVar26._12_4_;
        fVar193 = auVar277._16_4_;
        auVar42._16_4_ = fVar193 * auVar26._16_4_;
        fVar283 = auVar277._20_4_;
        auVar42._20_4_ = fVar283 * auVar26._20_4_;
        fVar285 = auVar277._24_4_;
        auVar42._24_4_ = fVar285 * auVar26._24_4_;
        auVar42._28_4_ = fVar242;
        fVar242 = auVar23._0_4_;
        fVar255 = auVar23._4_4_;
        auVar43._4_4_ = auVar20._4_4_ * fVar255;
        auVar43._0_4_ = auVar20._0_4_ * fVar242;
        fVar274 = auVar23._8_4_;
        auVar43._8_4_ = auVar20._8_4_ * fVar274;
        fVar212 = auVar23._12_4_;
        auVar43._12_4_ = auVar20._12_4_ * fVar212;
        fVar273 = auVar23._16_4_;
        auVar43._16_4_ = auVar20._16_4_ * fVar273;
        fVar127 = auVar23._20_4_;
        auVar43._20_4_ = auVar20._20_4_ * fVar127;
        fVar153 = auVar23._24_4_;
        auVar43._24_4_ = auVar20._24_4_ * fVar153;
        auVar43._28_4_ = auVar328._28_4_;
        auVar22 = vsubps_avx(auVar43,auVar42);
        auVar277 = vsubps_avx(auVar310,auVar19);
        fVar227 = auVar277._0_4_;
        fVar262 = auVar277._4_4_;
        auVar44._4_4_ = fVar262 * auVar26._4_4_;
        auVar44._0_4_ = fVar227 * auVar26._0_4_;
        fVar268 = auVar277._8_4_;
        auVar44._8_4_ = fVar268 * auVar26._8_4_;
        fVar269 = auVar277._12_4_;
        auVar44._12_4_ = fVar269 * auVar26._12_4_;
        fVar270 = auVar277._16_4_;
        auVar44._16_4_ = fVar270 * auVar26._16_4_;
        fVar287 = auVar277._20_4_;
        auVar44._20_4_ = fVar287 * auVar26._20_4_;
        fVar288 = auVar277._24_4_;
        auVar44._24_4_ = fVar288 * auVar26._24_4_;
        auVar44._28_4_ = auVar26._28_4_;
        auVar45._4_4_ = auVar19._4_4_ * fVar255;
        auVar45._0_4_ = auVar19._0_4_ * fVar242;
        auVar45._8_4_ = auVar19._8_4_ * fVar274;
        auVar45._12_4_ = auVar19._12_4_ * fVar212;
        auVar45._16_4_ = auVar19._16_4_ * fVar273;
        auVar45._20_4_ = auVar19._20_4_ * fVar127;
        auVar45._24_4_ = auVar19._24_4_ * fVar153;
        auVar45._28_4_ = auVar169._28_4_;
        auVar169 = vsubps_avx(auVar44,auVar45);
        auVar46._4_4_ = auVar20._4_4_ * fVar262;
        auVar46._0_4_ = auVar20._0_4_ * fVar227;
        auVar46._8_4_ = auVar20._8_4_ * fVar268;
        auVar46._12_4_ = auVar20._12_4_ * fVar269;
        auVar46._16_4_ = auVar20._16_4_ * fVar270;
        auVar46._20_4_ = auVar20._20_4_ * fVar287;
        auVar46._24_4_ = auVar20._24_4_ * fVar288;
        auVar46._28_4_ = auVar26._28_4_;
        auVar47._4_4_ = auVar19._4_4_ * fVar228;
        auVar47._0_4_ = auVar19._0_4_ * fVar156;
        auVar47._8_4_ = auVar19._8_4_ * fVar178;
        auVar47._12_4_ = auVar19._12_4_ * fVar261;
        auVar47._16_4_ = auVar19._16_4_ * fVar193;
        auVar47._20_4_ = auVar19._20_4_ * fVar283;
        auVar47._24_4_ = auVar19._24_4_ * fVar285;
        auVar47._28_4_ = auVar19._28_4_;
        auVar19 = vsubps_avx(auVar47,auVar46);
        auVar239 = ZEXT864(0) << 0x20;
        auVar222._0_4_ = auVar22._0_4_ * 0.0 + auVar19._0_4_ + auVar169._0_4_ * 0.0;
        auVar222._4_4_ = auVar22._4_4_ * 0.0 + auVar19._4_4_ + auVar169._4_4_ * 0.0;
        auVar222._8_4_ = auVar22._8_4_ * 0.0 + auVar19._8_4_ + auVar169._8_4_ * 0.0;
        auVar222._12_4_ = auVar22._12_4_ * 0.0 + auVar19._12_4_ + auVar169._12_4_ * 0.0;
        auVar222._16_4_ = auVar22._16_4_ * 0.0 + auVar19._16_4_ + auVar169._16_4_ * 0.0;
        auVar222._20_4_ = auVar22._20_4_ * 0.0 + auVar19._20_4_ + auVar169._20_4_ * 0.0;
        auVar222._24_4_ = auVar22._24_4_ * 0.0 + auVar19._24_4_ + auVar169._24_4_ * 0.0;
        auVar222._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar169._28_4_;
        auVar169 = vmaxps_avx(auVar164,auVar222);
        auVar169 = vcmpps_avx(auVar169,ZEXT832(0) << 0x20,2);
        auVar18 = vpackssdw_avx(auVar169._0_16_,auVar169._16_16_);
        auVar17 = vpand_avx(auVar18,auVar17);
        auVar18 = vpmovsxwd_avx(auVar17);
        auVar185 = vpunpckhwd_avx(auVar17,auVar17);
        auVar203._16_16_ = auVar185;
        auVar203._0_16_ = auVar18;
        if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar203 >> 0x7f,0) == '\0') &&
              (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar185 >> 0x3f,0) == '\0') &&
            (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar185[0xf]) {
LAB_00e8f07d:
          auVar207 = ZEXT3264(auVar203);
          auVar236._8_8_ = uStack_5b8;
          auVar236._0_8_ = local_5c0;
          auVar236._16_8_ = uStack_5b0;
          auVar236._24_8_ = uStack_5a8;
          auVar298 = ZEXT3264(auVar291);
          auVar314 = ZEXT3264(auVar294);
          auVar291._4_4_ = fVar171;
          auVar291._0_4_ = fVar157;
          auVar291._8_4_ = fVar172;
          auVar291._12_4_ = fVar173;
          auVar291._16_4_ = fVar174;
          auVar291._20_4_ = fVar175;
          auVar291._24_4_ = fVar176;
          auVar291._28_4_ = fVar177;
        }
        else {
          auVar48._4_4_ = fVar255 * fVar209;
          auVar48._0_4_ = fVar242 * fVar229;
          auVar48._8_4_ = fVar274 * fVar257;
          auVar48._12_4_ = fVar212 * fVar211;
          auVar48._16_4_ = fVar273 * fVar272;
          auVar48._20_4_ = fVar127 * fVar284;
          auVar48._24_4_ = fVar153 * fVar145;
          auVar48._28_4_ = auVar185._12_4_;
          auVar329._0_4_ = fVar156 * fVar289;
          auVar329._4_4_ = fVar228 * fVar301;
          auVar329._8_4_ = fVar178 * fVar304;
          auVar329._12_4_ = fVar261 * fVar306;
          auVar329._16_4_ = fVar193 * fVar215;
          auVar329._20_4_ = fVar283 * fVar225;
          auVar329._24_4_ = fVar285 * fVar226;
          auVar329._28_4_ = 0;
          auVar169 = vsubps_avx(auVar329,auVar48);
          auVar49._4_4_ = fVar262 * fVar301;
          auVar49._0_4_ = fVar227 * fVar289;
          auVar49._8_4_ = fVar268 * fVar304;
          auVar49._12_4_ = fVar269 * fVar306;
          auVar49._16_4_ = fVar270 * fVar215;
          auVar49._20_4_ = fVar287 * fVar225;
          auVar49._24_4_ = fVar288 * fVar226;
          auVar49._28_4_ = auVar201._28_4_;
          auVar50._4_4_ = fVar255 * fVar246;
          auVar50._0_4_ = fVar242 * fVar208;
          auVar50._8_4_ = fVar274 * fVar325;
          auVar50._12_4_ = fVar212 * fVar280;
          auVar50._16_4_ = fVar273 * fVar213;
          auVar50._20_4_ = fVar127 * fVar308;
          auVar50._24_4_ = fVar153 * fVar151;
          auVar50._28_4_ = auVar23._28_4_;
          auVar20 = vsubps_avx(auVar50,auVar49);
          auVar51._4_4_ = fVar228 * fVar246;
          auVar51._0_4_ = fVar156 * fVar208;
          auVar51._8_4_ = fVar178 * fVar325;
          auVar51._12_4_ = fVar261 * fVar280;
          auVar51._16_4_ = fVar193 * fVar213;
          auVar51._20_4_ = fVar283 * fVar308;
          auVar51._24_4_ = fVar285 * fVar151;
          auVar51._28_4_ = auVar164._28_4_;
          auVar52._4_4_ = fVar262 * fVar209;
          auVar52._0_4_ = fVar227 * fVar229;
          auVar52._8_4_ = fVar268 * fVar257;
          auVar52._12_4_ = fVar269 * fVar211;
          auVar52._16_4_ = fVar270 * fVar272;
          auVar52._20_4_ = fVar287 * fVar284;
          auVar52._24_4_ = fVar288 * fVar145;
          auVar52._28_4_ = auVar220._28_4_;
          auVar26 = vsubps_avx(auVar52,auVar51);
          auVar267._0_4_ = auVar169._0_4_ * 0.0 + auVar26._0_4_ + auVar20._0_4_ * 0.0;
          auVar267._4_4_ = auVar169._4_4_ * 0.0 + auVar26._4_4_ + auVar20._4_4_ * 0.0;
          auVar267._8_4_ = auVar169._8_4_ * 0.0 + auVar26._8_4_ + auVar20._8_4_ * 0.0;
          auVar267._12_4_ = auVar169._12_4_ * 0.0 + auVar26._12_4_ + auVar20._12_4_ * 0.0;
          auVar267._16_4_ = auVar169._16_4_ * 0.0 + auVar26._16_4_ + auVar20._16_4_ * 0.0;
          auVar267._20_4_ = auVar169._20_4_ * 0.0 + auVar26._20_4_ + auVar20._20_4_ * 0.0;
          auVar267._24_4_ = auVar169._24_4_ * 0.0 + auVar26._24_4_ + auVar20._24_4_ * 0.0;
          auVar267._28_4_ = auVar220._28_4_ + auVar26._28_4_ + auVar164._28_4_;
          auVar19 = vrcpps_avx(auVar267);
          fVar229 = auVar19._0_4_;
          fVar208 = auVar19._4_4_;
          auVar53._4_4_ = auVar267._4_4_ * fVar208;
          auVar53._0_4_ = auVar267._0_4_ * fVar229;
          fVar242 = auVar19._8_4_;
          auVar53._8_4_ = auVar267._8_4_ * fVar242;
          fVar209 = auVar19._12_4_;
          auVar53._12_4_ = auVar267._12_4_ * fVar209;
          fVar246 = auVar19._16_4_;
          auVar53._16_4_ = auVar267._16_4_ * fVar246;
          fVar255 = auVar19._20_4_;
          auVar53._20_4_ = auVar267._20_4_ * fVar255;
          fVar257 = auVar19._24_4_;
          auVar53._24_4_ = auVar267._24_4_ * fVar257;
          auVar53._28_4_ = auVar23._28_4_;
          auVar330._8_4_ = 0x3f800000;
          auVar330._0_8_ = 0x3f8000003f800000;
          auVar330._12_4_ = 0x3f800000;
          auVar330._16_4_ = 0x3f800000;
          auVar330._20_4_ = 0x3f800000;
          auVar330._24_4_ = 0x3f800000;
          auVar330._28_4_ = 0x3f800000;
          auVar22 = vsubps_avx(auVar330,auVar53);
          fVar229 = auVar22._0_4_ * fVar229 + fVar229;
          fVar208 = auVar22._4_4_ * fVar208 + fVar208;
          fVar242 = auVar22._8_4_ * fVar242 + fVar242;
          fVar209 = auVar22._12_4_ * fVar209 + fVar209;
          fVar246 = auVar22._16_4_ * fVar246 + fVar246;
          fVar255 = auVar22._20_4_ * fVar255 + fVar255;
          fVar257 = auVar22._24_4_ * fVar257 + fVar257;
          auVar54._4_4_ =
               (auVar169._4_4_ * fVar210 + auVar20._4_4_ * fVar244 + auVar26._4_4_ * fVar146) *
               fVar208;
          auVar54._0_4_ =
               (auVar169._0_4_ * fVar240 + auVar20._0_4_ * fVar195 + auVar26._0_4_ * fVar194) *
               fVar229;
          auVar54._8_4_ =
               (auVar169._8_4_ * fVar326 + auVar20._8_4_ * fVar259 + auVar26._8_4_ * fVar148) *
               fVar242;
          auVar54._12_4_ =
               (auVar169._12_4_ * fVar279 + auVar20._12_4_ * fVar271 + auVar26._12_4_ * fVar150) *
               fVar209;
          auVar54._16_4_ =
               (auVar169._16_4_ * fVar282 + auVar20._16_4_ * fVar281 + auVar26._16_4_ * fVar152) *
               fVar246;
          auVar54._20_4_ =
               (auVar169._20_4_ * fVar214 + auVar20._20_4_ * fVar286 + auVar26._20_4_ * fVar154) *
               fVar255;
          auVar54._24_4_ =
               (auVar169._24_4_ * fVar149 + auVar20._24_4_ * fVar147 + auVar26._24_4_ * fVar155) *
               fVar257;
          auVar54._28_4_ = auVar310._28_4_ + auVar16._28_4_ + auVar21._28_4_;
          auVar18 = vpermilps_avx(ZEXT416(uVar8),0);
          auVar204._16_16_ = auVar18;
          auVar204._0_16_ = auVar18;
          auVar310 = vcmpps_avx(auVar204,auVar54,2);
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar234._4_4_ = uVar7;
          auVar234._0_4_ = uVar7;
          auVar234._8_4_ = uVar7;
          auVar234._12_4_ = uVar7;
          auVar234._16_4_ = uVar7;
          auVar234._20_4_ = uVar7;
          auVar234._24_4_ = uVar7;
          auVar234._28_4_ = uVar7;
          auVar169 = vcmpps_avx(auVar54,auVar234,2);
          auVar310 = vandps_avx(auVar169,auVar310);
          auVar18 = vpackssdw_avx(auVar310._0_16_,auVar310._16_16_);
          auVar17 = vpand_avx(auVar17,auVar18);
          auVar18 = vpmovsxwd_avx(auVar17);
          auVar185 = vpshufd_avx(auVar17,0xee);
          auVar185 = vpmovsxwd_avx(auVar185);
          auVar254 = ZEXT1664(auVar185);
          auVar203._16_16_ = auVar185;
          auVar203._0_16_ = auVar18;
          if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar203 >> 0x7f,0) == '\0') &&
                (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar185 >> 0x3f,0) == '\0') &&
              (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar185[0xf]) goto LAB_00e8f07d;
          auVar310 = vcmpps_avx(ZEXT832(0) << 0x20,auVar267,4);
          auVar18 = vpackssdw_avx(auVar310._0_16_,auVar310._16_16_);
          auVar17 = vpand_avx(auVar17,auVar18);
          auVar18 = vpmovsxwd_avx(auVar17);
          auVar17 = vpunpckhwd_avx(auVar17,auVar17);
          auVar207 = ZEXT1664(auVar17);
          auVar252._16_16_ = auVar17;
          auVar252._0_16_ = auVar18;
          auVar254 = ZEXT3264(auVar252);
          auVar236._8_8_ = uStack_5b8;
          auVar236._0_8_ = local_5c0;
          auVar236._16_8_ = uStack_5b0;
          auVar236._24_8_ = uStack_5a8;
          auVar298 = ZEXT3264(auVar291);
          auVar314 = ZEXT3264(auVar294);
          auVar291._4_4_ = fVar171;
          auVar291._0_4_ = fVar157;
          auVar291._8_4_ = fVar172;
          auVar291._12_4_ = fVar173;
          auVar291._16_4_ = fVar174;
          auVar291._20_4_ = fVar175;
          auVar291._24_4_ = fVar176;
          auVar291._28_4_ = fVar177;
          if ((((((((auVar252 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar252 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar252 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar252 >> 0x7f,0) != '\0') ||
                (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar17 >> 0x3f,0) != '\0') ||
              (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0xf] < '\0') {
            auVar205._0_4_ = auVar164._0_4_ * fVar229;
            auVar205._4_4_ = auVar164._4_4_ * fVar208;
            auVar205._8_4_ = auVar164._8_4_ * fVar242;
            auVar205._12_4_ = auVar164._12_4_ * fVar209;
            auVar205._16_4_ = auVar164._16_4_ * fVar246;
            auVar205._20_4_ = auVar164._20_4_ * fVar255;
            auVar205._24_4_ = auVar164._24_4_ * fVar257;
            auVar205._28_4_ = 0;
            auVar55._4_4_ = auVar222._4_4_ * fVar208;
            auVar55._0_4_ = auVar222._0_4_ * fVar229;
            auVar55._8_4_ = auVar222._8_4_ * fVar242;
            auVar55._12_4_ = auVar222._12_4_ * fVar209;
            auVar55._16_4_ = auVar222._16_4_ * fVar246;
            auVar55._20_4_ = auVar222._20_4_ * fVar255;
            auVar55._24_4_ = auVar222._24_4_ * fVar257;
            auVar55._28_4_ = auVar22._28_4_ + auVar19._28_4_;
            auVar235._8_4_ = 0x3f800000;
            auVar235._0_8_ = 0x3f8000003f800000;
            auVar235._12_4_ = 0x3f800000;
            auVar235._16_4_ = 0x3f800000;
            auVar235._20_4_ = 0x3f800000;
            auVar235._24_4_ = 0x3f800000;
            auVar235._28_4_ = 0x3f800000;
            auVar294 = vsubps_avx(auVar235,auVar205);
            auVar294 = vblendvps_avx(auVar294,auVar205,auVar202);
            auVar298 = ZEXT3264(auVar294);
            auVar294 = vsubps_avx(auVar235,auVar55);
            auVar207 = ZEXT3264(auVar294);
            _local_4c0 = vblendvps_avx(auVar294,auVar55,auVar202);
            auVar314 = ZEXT3264(auVar54);
            auVar236 = auVar252;
          }
        }
        if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar236 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar236 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar236 >> 0x7f,0) == '\0') &&
              (auVar236 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar236 >> 0xbf,0) == '\0') &&
            (auVar236 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar236[0x1f]) goto LAB_00e8d9eb;
        auVar294 = vsubps_avx(auVar135,auVar291);
        fVar195 = auVar291._0_4_ + auVar298._0_4_ * auVar294._0_4_;
        fVar240 = auVar291._4_4_ + auVar298._4_4_ * auVar294._4_4_;
        fVar208 = auVar291._8_4_ + auVar298._8_4_ * auVar294._8_4_;
        fVar242 = auVar291._12_4_ + auVar298._12_4_ * auVar294._12_4_;
        fVar209 = auVar291._16_4_ + auVar298._16_4_ * auVar294._16_4_;
        fVar244 = auVar291._20_4_ + auVar298._20_4_ * auVar294._20_4_;
        fVar210 = auVar291._24_4_ + auVar298._24_4_ * auVar294._24_4_;
        fVar246 = auVar291._28_4_ + auVar294._28_4_;
        fVar229 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar294._4_4_ = (fVar240 + fVar240) * fVar229;
        auVar294._0_4_ = (fVar195 + fVar195) * fVar229;
        auVar294._8_4_ = (fVar208 + fVar208) * fVar229;
        auVar294._12_4_ = (fVar242 + fVar242) * fVar229;
        auVar294._16_4_ = (fVar209 + fVar209) * fVar229;
        auVar294._20_4_ = (fVar244 + fVar244) * fVar229;
        auVar294._24_4_ = (fVar210 + fVar210) * fVar229;
        auVar294._28_4_ = fVar246 + fVar246;
        auVar310 = auVar314._0_32_;
        auVar291 = vcmpps_avx(auVar310,auVar294,6);
        auVar294 = auVar236 & auVar291;
        if ((((((((auVar294 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar294 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar294 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar294 >> 0x7f,0) == '\0') &&
              (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar294 >> 0xbf,0) == '\0') &&
            (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar294[0x1f]) goto LAB_00e8d9eb;
        local_320 = vandps_avx(auVar291,auVar236);
        local_3c0 = (float)local_4c0._0_4_ + (float)local_4c0._0_4_ + -1.0;
        fStack_3bc = (float)local_4c0._4_4_ + (float)local_4c0._4_4_ + -1.0;
        fStack_3b8 = (float)uStack_4b8 + (float)uStack_4b8 + -1.0;
        fStack_3b4 = uStack_4b8._4_4_ + uStack_4b8._4_4_ + -1.0;
        fStack_3b0 = (float)uStack_4b0 + (float)uStack_4b0 + -1.0;
        fStack_3ac = uStack_4b0._4_4_ + uStack_4b0._4_4_ + -1.0;
        fStack_3a8 = (float)uStack_4a8 + (float)uStack_4a8 + -1.0;
        fStack_3a4 = uStack_4a8._4_4_ + uStack_4a8._4_4_ + -1.0;
        auVar294 = auVar298._0_32_;
        local_380 = 0;
        local_350 = local_650;
        uStack_348 = uStack_648;
        local_4c0._4_4_ = fStack_3bc;
        local_4c0._0_4_ = local_3c0;
        uStack_4b8._0_4_ = fStack_3b8;
        uStack_4b8._4_4_ = fStack_3b4;
        uStack_4b0._0_4_ = fStack_3b0;
        uStack_4b0._4_4_ = fStack_3ac;
        auVar110 = _local_4c0;
        uStack_4a8._0_4_ = fStack_3a8;
        uStack_4a8._4_4_ = fStack_3a4;
        auVar291 = _local_4c0;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_00e8d9eb;
        _local_4c0 = auVar291;
        if (context->args->filter == (RTCFilterFunctionN)0x0) {
          uVar123 = CONCAT71((int7)((ulong)context->args >> 8),1);
          bVar118 = true;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) goto LAB_00e8db0f;
        }
        else {
LAB_00e8db0f:
          auVar183._0_4_ = 1.0 / (float)(int)uVar10;
          auVar183._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar17 = vshufps_avx(auVar183,auVar183,0);
          local_300[0] = auVar17._0_4_ * (auVar298._0_4_ + 0.0);
          local_300[1] = auVar17._4_4_ * (auVar298._4_4_ + 1.0);
          local_300[2] = auVar17._8_4_ * (auVar298._8_4_ + 2.0);
          local_300[3] = auVar17._12_4_ * (auVar298._12_4_ + 3.0);
          fStack_2f0 = auVar17._0_4_ * (auVar298._16_4_ + 4.0);
          fStack_2ec = auVar17._4_4_ * (auVar298._20_4_ + 5.0);
          fStack_2e8 = auVar17._8_4_ * (auVar298._24_4_ + 6.0);
          fStack_2e4 = auVar298._28_4_ + 7.0;
          uStack_4b0 = auVar110._16_8_;
          uStack_4a8 = auVar291._24_8_;
          local_2e0 = local_4c0;
          uStack_2d8 = uStack_4b8;
          uStack_2d0 = uStack_4b0;
          uStack_2c8 = uStack_4a8;
          local_2c0 = auVar310;
          iVar120 = vmovmskps_avx(local_320);
          uVar125 = CONCAT44((int)((ulong)lVar124 >> 0x20),iVar120);
          uVar121 = 0;
          if (uVar125 != 0) {
            for (; (uVar125 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
            }
          }
          if (iVar120 == 0) {
            uVar123 = 0;
            bVar118 = false;
          }
          else {
            auVar17 = vshufps_avx(ZEXT416(uVar119),ZEXT416(uVar119),0);
            auVar18 = vshufps_avx(ZEXT416(uVar122),ZEXT416(uVar122),0);
            local_600._16_16_ = auVar18;
            local_600._0_16_ = auVar18;
            auVar18 = *local_6e0;
            uStack_670 = *(undefined8 *)(local_6e8 + 0x10);
            _local_680 = *local_6e0;
            uStack_668 = *(undefined8 *)(local_6e8 + 0x18);
            local_6a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
            local_3e0 = auVar294;
            local_3a0 = auVar310;
            local_37c = uVar10;
            do {
              local_1c0 = local_300[uVar121];
              local_1a0 = *(undefined4 *)((long)&local_2e0 + uVar121 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar121 * 4);
              fVar195 = 1.0 - local_1c0;
              fVar229 = local_1c0 * 3.0;
              auVar254 = ZEXT464(0x3f000000);
              auVar185 = ZEXT416((uint)((fVar195 * -2.0 * local_1c0 + local_1c0 * local_1c0) * 0.5))
              ;
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar199 = ZEXT416((uint)(((fVar195 + fVar195) * (fVar229 + 2.0) +
                                        fVar195 * fVar195 * -3.0) * 0.5));
              auVar199 = vshufps_avx(auVar199,auVar199,0);
              auVar200 = ZEXT416((uint)(((local_1c0 + local_1c0) * (fVar229 + -5.0) +
                                        local_1c0 * fVar229) * 0.5));
              auVar200 = vshufps_avx(auVar200,auVar200,0);
              local_6d0.context = context->user;
              auVar129 = ZEXT416((uint)((local_1c0 * (fVar195 + fVar195) - fVar195 * fVar195) * 0.5)
                                );
              auVar129 = vshufps_avx(auVar129,auVar129,0);
              auVar184._0_4_ =
                   local_940 * auVar129._0_4_ +
                   local_930 * auVar200._0_4_ +
                   local_7b0 * auVar185._0_4_ + auVar199._0_4_ * (float)local_650._0_4_;
              auVar184._4_4_ =
                   fStack_93c * auVar129._4_4_ +
                   fStack_92c * auVar200._4_4_ +
                   fStack_7ac * auVar185._4_4_ + auVar199._4_4_ * (float)local_650._4_4_;
              auVar184._8_4_ =
                   fStack_938 * auVar129._8_4_ +
                   fStack_928 * auVar200._8_4_ +
                   fStack_7a8 * auVar185._8_4_ + auVar199._8_4_ * (float)uStack_648;
              auVar184._12_4_ =
                   fStack_934 * auVar129._12_4_ +
                   fStack_924 * auVar200._12_4_ +
                   fStack_7a4 * auVar185._12_4_ + auVar199._12_4_ * uStack_648._4_4_;
              local_210 = vshufps_avx(auVar184,auVar184,0);
              local_220[0] = (RTCHitN)local_210[0];
              local_220[1] = (RTCHitN)local_210[1];
              local_220[2] = (RTCHitN)local_210[2];
              local_220[3] = (RTCHitN)local_210[3];
              local_220[4] = (RTCHitN)local_210[4];
              local_220[5] = (RTCHitN)local_210[5];
              local_220[6] = (RTCHitN)local_210[6];
              local_220[7] = (RTCHitN)local_210[7];
              local_220[8] = (RTCHitN)local_210[8];
              local_220[9] = (RTCHitN)local_210[9];
              local_220[10] = (RTCHitN)local_210[10];
              local_220[0xb] = (RTCHitN)local_210[0xb];
              local_220[0xc] = (RTCHitN)local_210[0xc];
              local_220[0xd] = (RTCHitN)local_210[0xd];
              local_220[0xe] = (RTCHitN)local_210[0xe];
              local_220[0xf] = (RTCHitN)local_210[0xf];
              local_1f0 = vshufps_avx(auVar184,auVar184,0x55);
              local_200 = local_1f0;
              local_1d0 = vshufps_avx(auVar184,auVar184,0xaa);
              local_1e0 = local_1d0;
              fStack_1bc = local_1c0;
              fStack_1b8 = local_1c0;
              fStack_1b4 = local_1c0;
              fStack_1b0 = local_1c0;
              fStack_1ac = local_1c0;
              fStack_1a8 = local_1c0;
              fStack_1a4 = local_1c0;
              uStack_19c = local_1a0;
              uStack_198 = local_1a0;
              uStack_194 = local_1a0;
              uStack_190 = local_1a0;
              uStack_18c = local_1a0;
              uStack_188 = local_1a0;
              uStack_184 = local_1a0;
              local_180 = local_600._0_8_;
              uStack_178 = local_600._8_8_;
              uStack_170 = local_600._16_8_;
              uStack_168 = local_600._24_8_;
              local_760 = auVar17._0_8_;
              uStack_758 = auVar17._8_8_;
              local_160 = local_760;
              uStack_158 = uStack_758;
              uStack_150 = local_760;
              uStack_148 = uStack_758;
              auVar291 = vcmpps_avx(auVar239._0_32_,auVar239._0_32_,0xf);
              local_6d8[1] = auVar291;
              *local_6d8 = auVar291;
              local_140 = (local_6d0.context)->instID[0];
              uStack_13c = local_140;
              uStack_138 = local_140;
              uStack_134 = local_140;
              uStack_130 = local_140;
              uStack_12c = local_140;
              uStack_128 = local_140;
              uStack_124 = local_140;
              local_120 = (local_6d0.context)->instPrimID[0];
              uStack_11c = local_120;
              uStack_118 = local_120;
              uStack_114 = local_120;
              uStack_110 = local_120;
              uStack_10c = local_120;
              uStack_108 = local_120;
              uStack_104 = local_120;
              local_720 = local_680;
              uStack_718 = uStack_678;
              uStack_710 = uStack_670;
              uStack_708 = uStack_668;
              local_6d0.valid = (int *)&local_720;
              local_6d0.geometryUserPtr = pGVar11->userPtr;
              local_6d0.hit = local_220;
              local_6d0.N = 8;
              auVar132 = _local_780;
              auVar161 = auVar18;
              local_6d0.ray = (RTCRayN *)ray;
              if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar254 = ZEXT1664(auVar254._0_16_);
                (*pGVar11->occlusionFilterN)(&local_6d0);
                auVar314 = ZEXT3264(auVar310);
                auVar298 = ZEXT3264(auVar294);
                auVar239 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar161._8_8_ = uStack_718;
                auVar161._0_8_ = local_720;
                auVar132._8_8_ = uStack_708;
                auVar132._0_8_ = uStack_710;
              }
              auVar185 = vpcmpeqd_avx(auVar161,ZEXT816(0) << 0x40);
              auVar199 = vpcmpeqd_avx(auVar132,ZEXT816(0) << 0x40);
              auVar207 = ZEXT1664(auVar199);
              auVar188._16_16_ = auVar199;
              auVar188._0_16_ = auVar185;
              auVar169 = auVar291 & ~auVar188;
              if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar169 >> 0x7f,0) == '\0') &&
                    (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar169 >> 0xbf,0) == '\0') &&
                  (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar169[0x1f]) {
                auVar139._0_4_ = auVar185._0_4_ ^ auVar291._0_4_;
                auVar139._4_4_ = auVar185._4_4_ ^ auVar291._4_4_;
                auVar139._8_4_ = auVar185._8_4_ ^ auVar291._8_4_;
                auVar139._12_4_ = auVar185._12_4_ ^ auVar291._12_4_;
                auVar139._16_4_ = auVar199._0_4_ ^ auVar291._16_4_;
                auVar139._20_4_ = auVar199._4_4_ ^ auVar291._20_4_;
                auVar139._24_4_ = auVar199._8_4_ ^ auVar291._24_4_;
                auVar139._28_4_ = auVar199._12_4_ ^ auVar291._28_4_;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar207 = ZEXT1664(auVar199);
                  auVar254 = ZEXT1664(auVar254._0_16_);
                  (*p_Var13)(&local_6d0);
                  auVar314 = ZEXT3264(auVar310);
                  auVar298 = ZEXT3264(auVar294);
                  auVar239 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar161._8_8_ = uStack_718;
                  auVar161._0_8_ = local_720;
                  auVar132._8_8_ = uStack_708;
                  auVar132._0_8_ = uStack_710;
                }
                auVar185 = vpcmpeqd_avx(auVar161,ZEXT816(0) << 0x40);
                auVar199 = vpcmpeqd_avx(auVar132,ZEXT816(0) << 0x40);
                auVar165._16_16_ = auVar199;
                auVar165._0_16_ = auVar185;
                auVar139._0_4_ = auVar185._0_4_ ^ auVar291._0_4_;
                auVar139._4_4_ = auVar185._4_4_ ^ auVar291._4_4_;
                auVar139._8_4_ = auVar185._8_4_ ^ auVar291._8_4_;
                auVar139._12_4_ = auVar185._12_4_ ^ auVar291._12_4_;
                auVar139._16_4_ = auVar199._0_4_ ^ auVar291._16_4_;
                auVar139._20_4_ = auVar199._4_4_ ^ auVar291._20_4_;
                auVar139._24_4_ = auVar199._8_4_ ^ auVar291._24_4_;
                auVar139._28_4_ = auVar199._12_4_ ^ auVar291._28_4_;
                auVar189._8_4_ = 0xff800000;
                auVar189._0_8_ = 0xff800000ff800000;
                auVar189._12_4_ = 0xff800000;
                auVar189._16_4_ = 0xff800000;
                auVar189._20_4_ = 0xff800000;
                auVar189._24_4_ = 0xff800000;
                auVar189._28_4_ = 0xff800000;
                auVar291 = vblendvps_avx(auVar189,*(undefined1 (*) [32])(local_6d0.ray + 0x100),
                                         auVar165);
                *(undefined1 (*) [32])(local_6d0.ray + 0x100) = auVar291;
              }
              if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar139 >> 0x7f,0) != '\0') ||
                    (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar139 >> 0xbf,0) != '\0') ||
                  (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar139[0x1f] < '\0') {
                uVar123 = CONCAT71((int7)(uVar121 >> 8),1);
                bVar118 = true;
                break;
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = local_6a0._0_4_;
              uVar125 = uVar125 ^ 1L << (uVar121 & 0x3f);
              uVar121 = 0;
              if (uVar125 != 0) {
                for (; (uVar125 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                }
              }
              uVar123 = 0;
              bVar118 = false;
            } while (uVar125 != 0);
          }
        }
      }
      auVar239 = ZEXT3264(auVar219);
      if (8 < (int)uVar10) {
        auVar17 = vpshufd_avx(ZEXT416(uVar10),0);
        local_480._0_16_ = auVar17;
        auVar17 = vshufps_avx(auVar198,auVar198,0);
        register0x00001210 = auVar17;
        _local_4a0 = auVar17;
        auVar17 = vpermilps_avx(ZEXT416(uVar8),0);
        local_e0._16_16_ = auVar17;
        local_e0._0_16_ = auVar17;
        auVar133._0_4_ = 1.0 / (float)local_540._0_4_;
        auVar133._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar17 = vshufps_avx(auVar133,auVar133,0);
        register0x00001210 = auVar17;
        _local_100 = auVar17;
        auVar17 = vshufps_avx(ZEXT416(uVar119),ZEXT416(uVar119),0);
        local_540._16_16_ = auVar17;
        local_540._0_16_ = auVar17;
        auVar17 = vshufps_avx(ZEXT416((uint)local_560._0_4_),ZEXT416((uint)local_560._0_4_),0);
        local_560._16_16_ = auVar17;
        local_560._0_16_ = auVar17;
        auVar144 = ZEXT3264(local_560);
        lVar124 = 8;
        auVar291 = auVar298._0_32_;
        auVar294 = auVar314._0_32_;
        do {
          pauVar1 = (undefined1 (*) [28])(catmullrom_basis0 + lVar124 * 4 + lVar14);
          fVar195 = *(float *)*pauVar1;
          fVar240 = *(float *)(*pauVar1 + 4);
          fVar242 = *(float *)(*pauVar1 + 8);
          fVar209 = *(float *)(*pauVar1 + 0xc);
          fVar210 = *(float *)(*pauVar1 + 0x10);
          fVar246 = *(float *)(*pauVar1 + 0x14);
          fVar257 = *(float *)(*pauVar1 + 0x18);
          auVar109 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar14 + 0x21b37f0 + lVar124 * 4);
          fVar259 = *(float *)*pauVar1;
          fVar325 = *(float *)(*pauVar1 + 4);
          fVar274 = *(float *)(*pauVar1 + 8);
          fVar271 = *(float *)(*pauVar1 + 0xc);
          fVar279 = *(float *)(*pauVar1 + 0x10);
          fVar212 = *(float *)(*pauVar1 + 0x14);
          fVar272 = *(float *)(*pauVar1 + 0x18);
          auVar107 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar14 + 0x21b3c74 + lVar124 * 4);
          fVar281 = *(float *)*pauVar1;
          fVar282 = *(float *)(*pauVar1 + 4);
          fVar213 = *(float *)(*pauVar1 + 8);
          fVar273 = *(float *)(*pauVar1 + 0xc);
          fVar284 = *(float *)(*pauVar1 + 0x10);
          fVar286 = *(float *)(*pauVar1 + 0x14);
          fVar214 = *(float *)(*pauVar1 + 0x18);
          auVar106 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar14 + 0x21b40f8 + lVar124 * 4);
          fVar308 = *(float *)*pauVar1;
          fVar127 = *(float *)(*pauVar1 + 4);
          fVar145 = *(float *)(*pauVar1 + 8);
          fVar147 = *(float *)(*pauVar1 + 0xc);
          fVar149 = *(float *)(*pauVar1 + 0x10);
          fVar151 = *(float *)(*pauVar1 + 0x14);
          fVar153 = *(float *)(*pauVar1 + 0x18);
          auVar105 = *pauVar1;
          fVar146 = auVar207._28_4_;
          fVar194 = fVar146 + *(float *)pauVar1[1];
          fVar156 = fVar146 + fVar146 + auVar144._28_4_;
          fVar229 = auVar239._0_4_;
          fVar208 = auVar239._4_4_;
          fVar244 = auVar239._8_4_;
          fVar255 = auVar239._12_4_;
          fVar326 = auVar239._16_4_;
          fVar211 = auVar239._20_4_;
          fVar280 = auVar239._24_4_;
          fVar228 = fVar146 + fVar194;
          auVar295._0_4_ =
               (float)local_460._0_4_ * fVar195 +
               fVar259 * fVar319 +
               (float)local_500._0_4_ * fVar281 + (float)local_520._0_4_ * fVar308;
          auVar295._4_4_ =
               (float)local_460._4_4_ * fVar240 +
               fVar325 * fVar321 +
               (float)local_500._4_4_ * fVar282 + (float)local_520._4_4_ * fVar127;
          auVar295._8_4_ =
               fStack_458 * fVar242 +
               fVar274 * fVar323 + fStack_4f8 * fVar213 + fStack_518 * fVar145;
          auVar295._12_4_ =
               fStack_454 * fVar209 +
               fVar271 * fVar324 + fStack_4f4 * fVar273 + fStack_514 * fVar147;
          auVar295._16_4_ =
               fStack_450 * fVar210 +
               fVar279 * fVar319 + fStack_4f0 * fVar284 + fStack_510 * fVar149;
          auVar295._20_4_ =
               fStack_44c * fVar246 +
               fVar212 * fVar321 + fStack_4ec * fVar286 + fStack_50c * fVar151;
          auVar295._24_4_ =
               fStack_448 * fVar257 +
               fVar272 * fVar323 + fStack_4e8 * fVar214 + fStack_508 * fVar153;
          auVar295._28_4_ = fVar194 + fVar156;
          auVar190._0_4_ =
               fVar259 * fVar229 + fVar247 * fVar281 + fVar230 * fVar308 +
               (float)local_240._0_4_ * fVar195;
          auVar190._4_4_ =
               fVar325 * fVar208 + fVar256 * fVar282 + fVar241 * fVar127 +
               (float)local_240._4_4_ * fVar240;
          auVar190._8_4_ =
               fVar274 * fVar244 + fVar258 * fVar213 + fVar243 * fVar145 + fStack_238 * fVar242;
          auVar190._12_4_ =
               fVar271 * fVar255 + fVar260 * fVar273 + fVar245 * fVar147 + fStack_234 * fVar209;
          auVar190._16_4_ =
               fVar279 * fVar326 + fVar247 * fVar284 + fVar230 * fVar149 + fStack_230 * fVar210;
          auVar190._20_4_ =
               fVar212 * fVar211 + fVar256 * fVar286 + fVar241 * fVar151 + fStack_22c * fVar246;
          auVar190._24_4_ =
               fVar272 * fVar280 + fVar258 * fVar214 + fVar243 * fVar153 + fStack_228 * fVar257;
          auVar190._28_4_ = fVar146 + fVar146 + auVar254._28_4_ + fVar156;
          fVar194 = (float)local_a0._0_4_ * fVar195 +
                    (float)local_80._0_4_ * fVar259 +
                    fVar281 * (float)local_420._0_4_ + fVar308 * (float)local_260._0_4_;
          fVar146 = (float)local_a0._4_4_ * fVar240 +
                    (float)local_80._4_4_ * fVar325 +
                    fVar282 * (float)local_420._4_4_ + fVar127 * (float)local_260._4_4_;
          fVar148 = fStack_98 * fVar242 +
                    fStack_78 * fVar274 + fVar213 * fStack_418 + fVar145 * fStack_258;
          fVar150 = fStack_94 * fVar209 +
                    fStack_74 * fVar271 + fVar273 * fStack_414 + fVar147 * fStack_254;
          fVar152 = fStack_90 * fVar210 +
                    fStack_70 * fVar279 + fVar284 * fStack_410 + fVar149 * fStack_250;
          fVar154 = fStack_8c * fVar246 +
                    fStack_6c * fVar212 + fVar286 * fStack_40c + fVar151 * fStack_24c;
          fVar155 = fStack_88 * fVar257 +
                    fStack_68 * fVar272 + fVar214 * fStack_408 + fVar153 * fStack_248;
          fVar156 = fVar156 + fVar228;
          pfVar2 = (float *)(catmullrom_basis1 + lVar124 * 4 + lVar14);
          fVar281 = *pfVar2;
          fVar282 = pfVar2[1];
          fVar213 = pfVar2[2];
          fVar273 = pfVar2[3];
          fVar284 = pfVar2[4];
          fVar286 = pfVar2[5];
          fVar214 = pfVar2[6];
          pauVar3 = (undefined1 (*) [24])(lVar14 + 0x21b5c10 + lVar124 * 4);
          auVar110 = *pauVar3;
          pauVar1 = (undefined1 (*) [28])(lVar14 + 0x21b6094 + lVar124 * 4);
          fVar195 = *(float *)*pauVar1;
          fVar240 = *(float *)(*pauVar1 + 4);
          fVar242 = *(float *)(*pauVar1 + 8);
          fVar209 = *(float *)(*pauVar1 + 0xc);
          fVar210 = *(float *)(*pauVar1 + 0x10);
          fVar246 = *(float *)(*pauVar1 + 0x14);
          fVar257 = *(float *)(*pauVar1 + 0x18);
          auVar111 = *pauVar1;
          pfVar4 = (float *)(lVar14 + 0x21b6518 + lVar124 * 4);
          fVar308 = *pfVar4;
          fVar127 = pfVar4[1];
          fVar145 = pfVar4[2];
          fVar147 = pfVar4[3];
          fVar149 = pfVar4[4];
          fVar151 = pfVar4[5];
          fVar153 = pfVar4[6];
          local_7e0 = auVar110._0_4_;
          fStack_7dc = auVar110._4_4_;
          fStack_7d8 = auVar110._8_4_;
          fStack_7d4 = auVar110._12_4_;
          fStack_7d0 = auVar110._16_4_;
          fStack_7cc = auVar110._20_4_;
          fStack_7c8 = (float)*(undefined8 *)pauVar3[1];
          fVar259 = fVar245 + fVar245 + fVar228;
          auVar343._0_4_ =
               (float)local_460._0_4_ * fVar281 +
               local_7e0 * fVar319 +
               (float)local_500._0_4_ * fVar195 + (float)local_520._0_4_ * fVar308;
          auVar343._4_4_ =
               (float)local_460._4_4_ * fVar282 +
               fStack_7dc * fVar321 +
               (float)local_500._4_4_ * fVar240 + (float)local_520._4_4_ * fVar127;
          auVar343._8_4_ =
               fStack_458 * fVar213 +
               fStack_7d8 * fVar323 + fStack_4f8 * fVar242 + fStack_518 * fVar145;
          auVar343._12_4_ =
               fStack_454 * fVar273 +
               fStack_7d4 * fVar324 + fStack_4f4 * fVar209 + fStack_514 * fVar147;
          auVar343._16_4_ =
               fStack_450 * fVar284 +
               fStack_7d0 * fVar319 + fStack_4f0 * fVar210 + fStack_510 * fVar149;
          auVar343._20_4_ =
               fStack_44c * fVar286 +
               fStack_7cc * fVar321 + fStack_4ec * fVar246 + fStack_50c * fVar151;
          auVar343._24_4_ =
               fStack_448 * fVar214 +
               fStack_7c8 * fVar323 + fStack_4e8 * fVar257 + fStack_508 * fVar153;
          auVar343._28_4_ = fVar324 + fVar259;
          auVar237._0_4_ =
               (float)local_240._0_4_ * fVar281 +
               fVar229 * local_7e0 + fVar247 * fVar195 + fVar230 * fVar308;
          auVar237._4_4_ =
               (float)local_240._4_4_ * fVar282 +
               fVar208 * fStack_7dc + fVar256 * fVar240 + fVar241 * fVar127;
          auVar237._8_4_ =
               fStack_238 * fVar213 + fVar244 * fStack_7d8 + fVar258 * fVar242 + fVar243 * fVar145;
          auVar237._12_4_ =
               fStack_234 * fVar273 + fVar255 * fStack_7d4 + fVar260 * fVar209 + fVar245 * fVar147;
          auVar237._16_4_ =
               fStack_230 * fVar284 + fVar326 * fStack_7d0 + fVar247 * fVar210 + fVar230 * fVar149;
          auVar237._20_4_ =
               fStack_22c * fVar286 + fVar211 * fStack_7cc + fVar256 * fVar246 + fVar241 * fVar151;
          auVar237._24_4_ =
               fStack_228 * fVar214 + fVar280 * fStack_7c8 + fVar258 * fVar257 + fVar243 * fVar153;
          auVar237._28_4_ = fVar259 + fVar245 + fVar245 + auVar239._28_4_;
          auVar311._0_4_ =
               (float)local_80._0_4_ * local_7e0 +
               fVar195 * (float)local_420._0_4_ + fVar308 * (float)local_260._0_4_ +
               (float)local_a0._0_4_ * fVar281;
          auVar311._4_4_ =
               (float)local_80._4_4_ * fStack_7dc +
               fVar240 * (float)local_420._4_4_ + fVar127 * (float)local_260._4_4_ +
               (float)local_a0._4_4_ * fVar282;
          auVar311._8_4_ =
               fStack_78 * fStack_7d8 + fVar242 * fStack_418 + fVar145 * fStack_258 +
               fStack_98 * fVar213;
          auVar311._12_4_ =
               fStack_74 * fStack_7d4 + fVar209 * fStack_414 + fVar147 * fStack_254 +
               fStack_94 * fVar273;
          auVar311._16_4_ =
               fStack_70 * fStack_7d0 + fVar210 * fStack_410 + fVar149 * fStack_250 +
               fStack_90 * fVar284;
          auVar311._20_4_ =
               fStack_6c * fStack_7cc + fVar246 * fStack_40c + fVar151 * fStack_24c +
               fStack_8c * fVar286;
          auVar311._24_4_ =
               fStack_68 * fStack_7c8 + fVar257 * fStack_408 + fVar153 * fStack_248 +
               fStack_88 * fVar214;
          auVar311._28_4_ = fVar245 + fVar245 + pfVar4[7] + fVar259;
          auVar169 = vsubps_avx(auVar343,auVar295);
          auVar21 = vsubps_avx(auVar237,auVar190);
          fVar195 = auVar169._0_4_;
          fVar242 = auVar169._4_4_;
          auVar56._4_4_ = auVar190._4_4_ * fVar242;
          auVar56._0_4_ = auVar190._0_4_ * fVar195;
          fVar210 = auVar169._8_4_;
          auVar56._8_4_ = auVar190._8_4_ * fVar210;
          fVar257 = auVar169._12_4_;
          auVar56._12_4_ = auVar190._12_4_ * fVar257;
          fVar325 = auVar169._16_4_;
          auVar56._16_4_ = auVar190._16_4_ * fVar325;
          fVar271 = auVar169._20_4_;
          auVar56._20_4_ = auVar190._20_4_ * fVar271;
          fVar212 = auVar169._24_4_;
          auVar56._24_4_ = auVar190._24_4_ * fVar212;
          auVar56._28_4_ = fVar259;
          fVar240 = auVar21._0_4_;
          fVar209 = auVar21._4_4_;
          auVar57._4_4_ = auVar295._4_4_ * fVar209;
          auVar57._0_4_ = auVar295._0_4_ * fVar240;
          fVar246 = auVar21._8_4_;
          auVar57._8_4_ = auVar295._8_4_ * fVar246;
          fVar259 = auVar21._12_4_;
          auVar57._12_4_ = auVar295._12_4_ * fVar259;
          fVar274 = auVar21._16_4_;
          auVar57._16_4_ = auVar295._16_4_ * fVar274;
          fVar279 = auVar21._20_4_;
          auVar57._20_4_ = auVar295._20_4_ * fVar279;
          fVar272 = auVar21._24_4_;
          auVar57._24_4_ = auVar295._24_4_ * fVar272;
          auVar57._28_4_ = auVar237._28_4_;
          auVar19 = vsubps_avx(auVar56,auVar57);
          auVar101._4_4_ = fVar146;
          auVar101._0_4_ = fVar194;
          auVar101._8_4_ = fVar148;
          auVar101._12_4_ = fVar150;
          auVar101._16_4_ = fVar152;
          auVar101._20_4_ = fVar154;
          auVar101._24_4_ = fVar155;
          auVar101._28_4_ = fVar156;
          auVar310 = vmaxps_avx(auVar101,auVar311);
          auVar58._4_4_ = auVar310._4_4_ * auVar310._4_4_ * (fVar242 * fVar242 + fVar209 * fVar209);
          auVar58._0_4_ = auVar310._0_4_ * auVar310._0_4_ * (fVar195 * fVar195 + fVar240 * fVar240);
          auVar58._8_4_ = auVar310._8_4_ * auVar310._8_4_ * (fVar210 * fVar210 + fVar246 * fVar246);
          auVar58._12_4_ =
               auVar310._12_4_ * auVar310._12_4_ * (fVar257 * fVar257 + fVar259 * fVar259);
          auVar58._16_4_ =
               auVar310._16_4_ * auVar310._16_4_ * (fVar325 * fVar325 + fVar274 * fVar274);
          auVar58._20_4_ =
               auVar310._20_4_ * auVar310._20_4_ * (fVar271 * fVar271 + fVar279 * fVar279);
          auVar58._24_4_ =
               auVar310._24_4_ * auVar310._24_4_ * (fVar212 * fVar212 + fVar272 * fVar272);
          auVar58._28_4_ = fVar324 + auVar237._28_4_;
          auVar59._4_4_ = auVar19._4_4_ * auVar19._4_4_;
          auVar59._0_4_ = auVar19._0_4_ * auVar19._0_4_;
          auVar59._8_4_ = auVar19._8_4_ * auVar19._8_4_;
          auVar59._12_4_ = auVar19._12_4_ * auVar19._12_4_;
          auVar59._16_4_ = auVar19._16_4_ * auVar19._16_4_;
          auVar59._20_4_ = auVar19._20_4_ * auVar19._20_4_;
          auVar59._24_4_ = auVar19._24_4_ * auVar19._24_4_;
          auVar59._28_4_ = auVar19._28_4_;
          auVar310 = vcmpps_avx(auVar59,auVar58,2);
          auVar144 = ZEXT3264(auVar310);
          local_380 = (uint)lVar124;
          auVar18 = vpshufd_avx(ZEXT416(local_380),0);
          auVar17 = vpor_avx(auVar18,_DAT_01f7fcf0);
          auVar18 = vpor_avx(auVar18,_DAT_01fafea0);
          auVar17 = vpcmpgtd_avx(local_480._0_16_,auVar17);
          auVar254 = ZEXT1664(auVar17);
          auVar18 = vpcmpgtd_avx(local_480._0_16_,auVar18);
          auVar206._16_16_ = auVar18;
          auVar206._0_16_ = auVar17;
          auVar207 = ZEXT3264(auVar206);
          auVar19 = auVar206 & auVar310;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0x7f,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar19 >> 0xbf,0) == '\0') &&
              (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar19[0x1f]) {
            auVar239 = ZEXT3264(auVar239._0_32_);
          }
          else {
            local_640._0_4_ = auVar111._0_4_;
            local_640._4_4_ = auVar111._4_4_;
            fStack_638 = auVar111._8_4_;
            fStack_634 = auVar111._12_4_;
            fStack_630 = auVar111._16_4_;
            fStack_62c = auVar111._20_4_;
            fStack_628 = auVar111._24_4_;
            local_620 = fVar281 * (float)local_5a0._0_4_ +
                        local_7e0 * (float)local_580._0_4_ +
                        (float)local_c0._0_4_ * (float)local_640._0_4_ +
                        (float)local_440._0_4_ * fVar308;
            fStack_61c = fVar282 * (float)local_5a0._4_4_ +
                         fStack_7dc * (float)local_580._4_4_ +
                         (float)local_c0._4_4_ * (float)local_640._4_4_ +
                         (float)local_440._4_4_ * fVar127;
            fStack_618 = fVar213 * fStack_598 +
                         fStack_7d8 * fStack_578 + fStack_b8 * fStack_638 + fStack_438 * fVar145;
            fStack_614 = fVar273 * fStack_594 +
                         fStack_7d4 * fStack_574 + fStack_b4 * fStack_634 + fStack_434 * fVar147;
            fStack_610 = fVar284 * fStack_590 +
                         fStack_7d0 * fStack_570 + fStack_b0 * fStack_630 + fStack_430 * fVar149;
            fStack_60c = fVar286 * fStack_58c +
                         fStack_7cc * fStack_56c + fStack_ac * fStack_62c + fStack_42c * fVar151;
            fStack_608 = fVar214 * fStack_588 +
                         fStack_7c8 * fStack_568 + fStack_a8 * fStack_628 + fStack_428 * fVar153;
            fStack_604 = auVar295._28_4_ + auVar310._28_4_ + pfVar2[7] + 0.0;
            local_780._0_4_ = auVar107._0_4_;
            local_780._4_4_ = auVar107._4_4_;
            fStack_778 = auVar107._8_4_;
            fStack_774 = auVar107._12_4_;
            fStack_770 = auVar107._16_4_;
            fStack_76c = auVar107._20_4_;
            fStack_768 = auVar107._24_4_;
            local_680._0_4_ = auVar106._0_4_;
            local_680._4_4_ = auVar106._4_4_;
            uStack_678._0_4_ = auVar106._8_4_;
            uStack_678._4_4_ = auVar106._12_4_;
            uStack_670._0_4_ = auVar106._16_4_;
            uStack_670._4_4_ = auVar106._20_4_;
            uStack_668._0_4_ = auVar106._24_4_;
            local_6a0._0_4_ = auVar105._0_4_;
            local_6a0._4_4_ = auVar105._4_4_;
            fStack_698 = auVar105._8_4_;
            fStack_694 = auVar105._12_4_;
            fStack_690 = auVar105._16_4_;
            fStack_68c = auVar105._20_4_;
            fStack_688 = auVar105._24_4_;
            local_680._0_4_ =
                 (float)local_580._0_4_ * (float)local_780._0_4_ +
                 (float)local_c0._0_4_ * (float)local_680._0_4_ +
                 (float)local_440._0_4_ * (float)local_6a0._0_4_;
            local_680._4_4_ =
                 (float)local_580._4_4_ * (float)local_780._4_4_ +
                 (float)local_c0._4_4_ * (float)local_680._4_4_ +
                 (float)local_440._4_4_ * (float)local_6a0._4_4_;
            uStack_678._0_4_ =
                 fStack_578 * fStack_778 + fStack_b8 * (float)uStack_678 + fStack_438 * fStack_698;
            uStack_678._4_4_ =
                 fStack_574 * fStack_774 + fStack_b4 * uStack_678._4_4_ + fStack_434 * fStack_694;
            uStack_670._0_4_ =
                 fStack_570 * fStack_770 + fStack_b0 * (float)uStack_670 + fStack_430 * fStack_690;
            uStack_670._4_4_ =
                 fStack_56c * fStack_76c + fStack_ac * uStack_670._4_4_ + fStack_42c * fStack_68c;
            uStack_668._0_4_ =
                 fStack_568 * fStack_768 + fStack_a8 * (float)uStack_668 + fStack_428 * fStack_688;
            uStack_668._4_4_ = fStack_604 + pfVar2[7] + 0.0;
            pfVar2 = (float *)(lVar14 + 0x21b4e84 + lVar124 * 4);
            fVar195 = *pfVar2;
            fVar240 = pfVar2[1];
            fVar242 = pfVar2[2];
            fVar209 = pfVar2[3];
            fVar210 = pfVar2[4];
            fVar246 = pfVar2[5];
            fVar257 = pfVar2[6];
            pfVar4 = (float *)(lVar14 + 0x21b5308 + lVar124 * 4);
            fVar259 = *pfVar4;
            fVar325 = pfVar4[1];
            fVar274 = pfVar4[2];
            fVar271 = pfVar4[3];
            fVar279 = pfVar4[4];
            fVar212 = pfVar4[5];
            fVar272 = pfVar4[6];
            pfVar5 = (float *)(lVar14 + 0x21b4a00 + lVar124 * 4);
            fVar281 = *pfVar5;
            fVar282 = pfVar5[1];
            fVar213 = pfVar5[2];
            fVar273 = pfVar5[3];
            fVar284 = pfVar5[4];
            fVar286 = pfVar5[5];
            fVar214 = pfVar5[6];
            fVar228 = pfVar2[7] + pfVar4[7];
            fVar178 = pfVar4[7] + auVar343._28_4_ + 0.0;
            fVar261 = auVar343._28_4_ + fStack_224 + auVar343._28_4_ + 0.0;
            pfVar2 = (float *)(lVar14 + 0x21b457c + lVar124 * 4);
            fVar308 = *pfVar2;
            fVar127 = pfVar2[1];
            fVar145 = pfVar2[2];
            fVar147 = pfVar2[3];
            fVar149 = pfVar2[4];
            fVar151 = pfVar2[5];
            fVar153 = pfVar2[6];
            local_6a0._4_4_ =
                 fVar127 * (float)local_460._4_4_ +
                 fVar321 * fVar282 +
                 (float)local_500._4_4_ * fVar240 + (float)local_520._4_4_ * fVar325;
            local_6a0._0_4_ =
                 fVar308 * (float)local_460._0_4_ +
                 fVar319 * fVar281 +
                 (float)local_500._0_4_ * fVar195 + (float)local_520._0_4_ * fVar259;
            fStack_698 = fVar145 * fStack_458 +
                         fVar323 * fVar213 + fStack_4f8 * fVar242 + fStack_518 * fVar274;
            fStack_694 = fVar147 * fStack_454 +
                         fVar324 * fVar273 + fStack_4f4 * fVar209 + fStack_514 * fVar271;
            fStack_690 = fVar149 * fStack_450 +
                         fVar319 * fVar284 + fStack_4f0 * fVar210 + fStack_510 * fVar279;
            fStack_68c = fVar151 * fStack_44c +
                         fVar321 * fVar286 + fStack_4ec * fVar246 + fStack_50c * fVar212;
            fStack_688 = fVar153 * fStack_448 +
                         fVar323 * fVar214 + fStack_4e8 * fVar257 + fStack_508 * fVar272;
            fStack_684 = fVar228 + fVar178;
            auVar166._0_4_ =
                 (float)local_240._0_4_ * fVar308 +
                 fVar247 * fVar195 + fVar230 * fVar259 + fVar281 * fVar229;
            auVar166._4_4_ =
                 (float)local_240._4_4_ * fVar127 +
                 fVar256 * fVar240 + fVar241 * fVar325 + fVar282 * fVar208;
            auVar166._8_4_ =
                 fStack_238 * fVar145 + fVar258 * fVar242 + fVar243 * fVar274 + fVar213 * fVar244;
            auVar166._12_4_ =
                 fStack_234 * fVar147 + fVar260 * fVar209 + fVar245 * fVar271 + fVar273 * fVar255;
            auVar166._16_4_ =
                 fStack_230 * fVar149 + fVar247 * fVar210 + fVar230 * fVar279 + fVar284 * fVar326;
            auVar166._20_4_ =
                 fStack_22c * fVar151 + fVar256 * fVar246 + fVar241 * fVar212 + fVar286 * fVar211;
            auVar166._24_4_ =
                 fStack_228 * fVar153 + fVar258 * fVar257 + fVar243 * fVar272 + fVar214 * fVar280;
            auVar166._28_4_ = fVar178 + fVar261;
            auVar336._0_4_ =
                 fVar281 * (float)local_580._0_4_ +
                 (float)local_c0._0_4_ * fVar195 + (float)local_440._0_4_ * fVar259 +
                 fVar308 * (float)local_5a0._0_4_;
            auVar336._4_4_ =
                 fVar282 * (float)local_580._4_4_ +
                 (float)local_c0._4_4_ * fVar240 + (float)local_440._4_4_ * fVar325 +
                 fVar127 * (float)local_5a0._4_4_;
            auVar336._8_4_ =
                 fVar213 * fStack_578 + fStack_b8 * fVar242 + fStack_438 * fVar274 +
                 fVar145 * fStack_598;
            auVar336._12_4_ =
                 fVar273 * fStack_574 + fStack_b4 * fVar209 + fStack_434 * fVar271 +
                 fVar147 * fStack_594;
            auVar336._16_4_ =
                 fVar284 * fStack_570 + fStack_b0 * fVar210 + fStack_430 * fVar279 +
                 fVar149 * fStack_590;
            auVar336._20_4_ =
                 fVar286 * fStack_56c + fStack_ac * fVar246 + fStack_42c * fVar212 +
                 fVar151 * fStack_58c;
            auVar336._24_4_ =
                 fVar214 * fStack_568 + fStack_a8 * fVar257 + fStack_428 * fVar272 +
                 fVar153 * fStack_588;
            auVar336._28_4_ = pfVar5[7] + fVar228 + fVar261;
            pfVar2 = (float *)(lVar14 + 0x21b72a4 + lVar124 * 4);
            fVar195 = *pfVar2;
            fVar240 = pfVar2[1];
            fVar242 = pfVar2[2];
            fVar209 = pfVar2[3];
            fVar210 = pfVar2[4];
            fVar246 = pfVar2[5];
            fVar257 = pfVar2[6];
            pfVar4 = (float *)(lVar14 + 0x21b7728 + lVar124 * 4);
            fVar259 = *pfVar4;
            fVar325 = pfVar4[1];
            fVar274 = pfVar4[2];
            fVar271 = pfVar4[3];
            fVar279 = pfVar4[4];
            fVar212 = pfVar4[5];
            fVar272 = pfVar4[6];
            pfVar5 = (float *)(lVar14 + 0x21b6e20 + lVar124 * 4);
            fVar281 = *pfVar5;
            fVar282 = pfVar5[1];
            fVar213 = pfVar5[2];
            fVar273 = pfVar5[3];
            fVar284 = pfVar5[4];
            fVar286 = pfVar5[5];
            fVar214 = pfVar5[6];
            pfVar6 = (float *)(lVar14 + 0x21b699c + lVar124 * 4);
            fVar308 = *pfVar6;
            fVar127 = pfVar6[1];
            fVar145 = pfVar6[2];
            fVar147 = pfVar6[3];
            fVar149 = pfVar6[4];
            fVar151 = pfVar6[5];
            fVar153 = pfVar6[6];
            auVar296._0_4_ =
                 fVar308 * (float)local_460._0_4_ +
                 fVar319 * fVar281 +
                 (float)local_500._0_4_ * fVar195 + fVar259 * (float)local_520._0_4_;
            auVar296._4_4_ =
                 fVar127 * (float)local_460._4_4_ +
                 fVar321 * fVar282 +
                 (float)local_500._4_4_ * fVar240 + fVar325 * (float)local_520._4_4_;
            auVar296._8_4_ =
                 fVar145 * fStack_458 +
                 fVar323 * fVar213 + fStack_4f8 * fVar242 + fVar274 * fStack_518;
            auVar296._12_4_ =
                 fVar147 * fStack_454 +
                 fVar324 * fVar273 + fStack_4f4 * fVar209 + fVar271 * fStack_514;
            auVar296._16_4_ =
                 fVar149 * fStack_450 +
                 fVar319 * fVar284 + fStack_4f0 * fVar210 + fVar279 * fStack_510;
            auVar296._20_4_ =
                 fVar151 * fStack_44c +
                 fVar321 * fVar286 + fStack_4ec * fVar246 + fVar212 * fStack_50c;
            auVar296._24_4_ =
                 fVar153 * fStack_448 +
                 fVar323 * fVar214 + fStack_4e8 * fVar257 + fVar272 * fStack_508;
            auVar296._28_4_ = fVar245 + fVar245 + fStack_224 + fStack_504;
            auVar331._0_4_ =
                 fVar308 * (float)local_240._0_4_ +
                 fVar281 * fVar229 + fVar247 * fVar195 + fVar230 * fVar259;
            auVar331._4_4_ =
                 fVar127 * (float)local_240._4_4_ +
                 fVar282 * fVar208 + fVar256 * fVar240 + fVar241 * fVar325;
            auVar331._8_4_ =
                 fVar145 * fStack_238 + fVar213 * fVar244 + fVar258 * fVar242 + fVar243 * fVar274;
            auVar331._12_4_ =
                 fVar147 * fStack_234 + fVar273 * fVar255 + fVar260 * fVar209 + fVar245 * fVar271;
            auVar331._16_4_ =
                 fVar149 * fStack_230 + fVar284 * fVar326 + fVar247 * fVar210 + fVar230 * fVar279;
            auVar331._20_4_ =
                 fVar151 * fStack_22c + fVar286 * fVar211 + fVar256 * fVar246 + fVar241 * fVar212;
            auVar331._24_4_ =
                 fVar153 * fStack_228 + fVar214 * fVar280 + fVar258 * fVar257 + fVar243 * fVar272;
            auVar331._28_4_ = fVar245 + fVar245 + fVar260 + fVar245;
            auVar238._8_4_ = 0x7fffffff;
            auVar238._0_8_ = 0x7fffffff7fffffff;
            auVar238._12_4_ = 0x7fffffff;
            auVar238._16_4_ = 0x7fffffff;
            auVar238._20_4_ = 0x7fffffff;
            auVar238._24_4_ = 0x7fffffff;
            auVar238._28_4_ = 0x7fffffff;
            auVar19 = vandps_avx(_local_6a0,auVar238);
            auVar20 = vandps_avx(auVar166,auVar238);
            auVar20 = vmaxps_avx(auVar19,auVar20);
            auVar19 = vandps_avx(auVar336,auVar238);
            auVar20 = vmaxps_avx(auVar20,auVar19);
            auVar20 = vcmpps_avx(auVar20,_local_4a0,1);
            auVar26 = vblendvps_avx(_local_6a0,auVar169,auVar20);
            auVar140._0_4_ =
                 fVar308 * (float)local_5a0._0_4_ +
                 fVar281 * (float)local_580._0_4_ +
                 fVar259 * (float)local_440._0_4_ + (float)local_c0._0_4_ * fVar195;
            auVar140._4_4_ =
                 fVar127 * (float)local_5a0._4_4_ +
                 fVar282 * (float)local_580._4_4_ +
                 fVar325 * (float)local_440._4_4_ + (float)local_c0._4_4_ * fVar240;
            auVar140._8_4_ =
                 fVar145 * fStack_598 +
                 fVar213 * fStack_578 + fVar274 * fStack_438 + fStack_b8 * fVar242;
            auVar140._12_4_ =
                 fVar147 * fStack_594 +
                 fVar273 * fStack_574 + fVar271 * fStack_434 + fStack_b4 * fVar209;
            auVar140._16_4_ =
                 fVar149 * fStack_590 +
                 fVar284 * fStack_570 + fVar279 * fStack_430 + fStack_b0 * fVar210;
            auVar140._20_4_ =
                 fVar151 * fStack_58c +
                 fVar286 * fStack_56c + fVar212 * fStack_42c + fStack_ac * fVar246;
            auVar140._24_4_ =
                 fVar153 * fStack_588 +
                 fVar214 * fStack_568 + fVar272 * fStack_428 + fStack_a8 * fVar257;
            auVar140._28_4_ = auVar19._28_4_ + pfVar5[7] + pfVar4[7] + pfVar2[7];
            auVar16 = vblendvps_avx(auVar166,auVar21,auVar20);
            auVar19 = vandps_avx(auVar296,auVar238);
            auVar20 = vandps_avx(auVar331,auVar238);
            auVar20 = vmaxps_avx(auVar19,auVar20);
            auVar19 = vandps_avx(auVar140,auVar238);
            auVar19 = vmaxps_avx(auVar20,auVar19);
            local_760._0_4_ = auVar109._0_4_;
            local_760._4_4_ = auVar109._4_4_;
            uStack_758._0_4_ = auVar109._8_4_;
            uStack_758._4_4_ = auVar109._12_4_;
            fStack_750 = auVar109._16_4_;
            fStack_74c = auVar109._20_4_;
            fStack_748 = auVar109._24_4_;
            auVar19 = vcmpps_avx(auVar19,_local_4a0,1);
            auVar169 = vblendvps_avx(auVar296,auVar169,auVar19);
            auVar141._0_4_ =
                 (float)local_5a0._0_4_ * (float)local_760._0_4_ + (float)local_680._0_4_;
            auVar141._4_4_ =
                 (float)local_5a0._4_4_ * (float)local_760._4_4_ + (float)local_680._4_4_;
            auVar141._8_4_ = fStack_598 * (float)uStack_758 + (float)uStack_678;
            auVar141._12_4_ = fStack_594 * uStack_758._4_4_ + uStack_678._4_4_;
            auVar141._16_4_ = fStack_590 * fStack_750 + (float)uStack_670;
            auVar141._20_4_ = fStack_58c * fStack_74c + uStack_670._4_4_;
            auVar141._24_4_ = fStack_588 * fStack_748 + (float)uStack_668;
            auVar141._28_4_ = auVar20._28_4_ + uStack_668._4_4_;
            auVar21 = vblendvps_avx(auVar331,auVar21,auVar19);
            fVar228 = auVar26._0_4_;
            fVar178 = auVar26._4_4_;
            fVar261 = auVar26._8_4_;
            fVar193 = auVar26._12_4_;
            fVar283 = auVar26._16_4_;
            fVar285 = auVar26._20_4_;
            fVar289 = auVar26._24_4_;
            fVar301 = auVar26._28_4_;
            fVar274 = auVar169._0_4_;
            fVar271 = auVar169._4_4_;
            fVar280 = auVar169._8_4_;
            fVar272 = auVar169._12_4_;
            fVar282 = auVar169._16_4_;
            fVar273 = auVar169._20_4_;
            fVar286 = auVar169._24_4_;
            fVar229 = auVar16._0_4_;
            fVar240 = auVar16._4_4_;
            fVar242 = auVar16._8_4_;
            fVar244 = auVar16._12_4_;
            fVar246 = auVar16._16_4_;
            fVar257 = auVar16._20_4_;
            fVar326 = auVar16._24_4_;
            auVar312._0_4_ = fVar229 * fVar229 + fVar228 * fVar228;
            auVar312._4_4_ = fVar240 * fVar240 + fVar178 * fVar178;
            auVar312._8_4_ = fVar242 * fVar242 + fVar261 * fVar261;
            auVar312._12_4_ = fVar244 * fVar244 + fVar193 * fVar193;
            auVar312._16_4_ = fVar246 * fVar246 + fVar283 * fVar283;
            auVar312._20_4_ = fVar257 * fVar257 + fVar285 * fVar285;
            auVar312._24_4_ = fVar326 * fVar326 + fVar289 * fVar289;
            auVar312._28_4_ = fStack_4e4 + fStack_a4;
            auVar19 = vrsqrtps_avx(auVar312);
            fVar195 = auVar19._0_4_;
            fVar208 = auVar19._4_4_;
            auVar60._4_4_ = fVar208 * 1.5;
            auVar60._0_4_ = fVar195 * 1.5;
            fVar209 = auVar19._8_4_;
            auVar60._8_4_ = fVar209 * 1.5;
            fVar210 = auVar19._12_4_;
            auVar60._12_4_ = fVar210 * 1.5;
            fVar255 = auVar19._16_4_;
            auVar60._16_4_ = fVar255 * 1.5;
            fVar259 = auVar19._20_4_;
            auVar60._20_4_ = fVar259 * 1.5;
            fVar325 = auVar19._24_4_;
            auVar60._24_4_ = fVar325 * 1.5;
            auVar60._28_4_ = auVar331._28_4_;
            auVar61._4_4_ = fVar208 * fVar208 * fVar208 * auVar312._4_4_ * 0.5;
            auVar61._0_4_ = fVar195 * fVar195 * fVar195 * auVar312._0_4_ * 0.5;
            auVar61._8_4_ = fVar209 * fVar209 * fVar209 * auVar312._8_4_ * 0.5;
            auVar61._12_4_ = fVar210 * fVar210 * fVar210 * auVar312._12_4_ * 0.5;
            auVar61._16_4_ = fVar255 * fVar255 * fVar255 * auVar312._16_4_ * 0.5;
            auVar61._20_4_ = fVar259 * fVar259 * fVar259 * auVar312._20_4_ * 0.5;
            auVar61._24_4_ = fVar325 * fVar325 * fVar325 * auVar312._24_4_ * 0.5;
            auVar61._28_4_ = auVar312._28_4_;
            auVar20 = vsubps_avx(auVar60,auVar61);
            fVar308 = auVar20._0_4_;
            fVar127 = auVar20._4_4_;
            fVar145 = auVar20._8_4_;
            fVar147 = auVar20._12_4_;
            fVar149 = auVar20._16_4_;
            fVar151 = auVar20._20_4_;
            fVar153 = auVar20._24_4_;
            fVar195 = auVar21._0_4_;
            fVar208 = auVar21._4_4_;
            fVar209 = auVar21._8_4_;
            fVar210 = auVar21._12_4_;
            fVar255 = auVar21._16_4_;
            fVar259 = auVar21._20_4_;
            fVar325 = auVar21._24_4_;
            auVar278._0_4_ = fVar195 * fVar195 + fVar274 * fVar274;
            auVar278._4_4_ = fVar208 * fVar208 + fVar271 * fVar271;
            auVar278._8_4_ = fVar209 * fVar209 + fVar280 * fVar280;
            auVar278._12_4_ = fVar210 * fVar210 + fVar272 * fVar272;
            auVar278._16_4_ = fVar255 * fVar255 + fVar282 * fVar282;
            auVar278._20_4_ = fVar259 * fVar259 + fVar273 * fVar273;
            auVar278._24_4_ = fVar325 * fVar325 + fVar286 * fVar286;
            auVar278._28_4_ = auVar19._28_4_ + auVar169._28_4_;
            auVar169 = vrsqrtps_avx(auVar278);
            fVar211 = auVar169._0_4_;
            fVar279 = auVar169._4_4_;
            auVar62._4_4_ = fVar279 * 1.5;
            auVar62._0_4_ = fVar211 * 1.5;
            fVar212 = auVar169._8_4_;
            auVar62._8_4_ = fVar212 * 1.5;
            fVar281 = auVar169._12_4_;
            auVar62._12_4_ = fVar281 * 1.5;
            fVar213 = auVar169._16_4_;
            auVar62._16_4_ = fVar213 * 1.5;
            fVar284 = auVar169._20_4_;
            auVar62._20_4_ = fVar284 * 1.5;
            fVar214 = auVar169._24_4_;
            auVar62._24_4_ = fVar214 * 1.5;
            auVar62._28_4_ = auVar331._28_4_;
            auVar63._4_4_ = fVar279 * fVar279 * fVar279 * auVar278._4_4_ * 0.5;
            auVar63._0_4_ = fVar211 * fVar211 * fVar211 * auVar278._0_4_ * 0.5;
            auVar63._8_4_ = fVar212 * fVar212 * fVar212 * auVar278._8_4_ * 0.5;
            auVar63._12_4_ = fVar281 * fVar281 * fVar281 * auVar278._12_4_ * 0.5;
            auVar63._16_4_ = fVar213 * fVar213 * fVar213 * auVar278._16_4_ * 0.5;
            auVar63._20_4_ = fVar284 * fVar284 * fVar284 * auVar278._20_4_ * 0.5;
            auVar63._24_4_ = fVar214 * fVar214 * fVar214 * auVar278._24_4_ * 0.5;
            auVar63._28_4_ = auVar278._28_4_;
            auVar21 = vsubps_avx(auVar62,auVar63);
            fVar211 = auVar21._0_4_;
            fVar279 = auVar21._4_4_;
            fVar212 = auVar21._8_4_;
            fVar281 = auVar21._12_4_;
            fVar213 = auVar21._16_4_;
            fVar284 = auVar21._20_4_;
            fVar214 = auVar21._24_4_;
            fVar229 = fVar194 * fVar308 * fVar229;
            fVar240 = fVar146 * fVar127 * fVar240;
            auVar64._4_4_ = fVar240;
            auVar64._0_4_ = fVar229;
            fVar242 = fVar148 * fVar145 * fVar242;
            auVar64._8_4_ = fVar242;
            fVar244 = fVar150 * fVar147 * fVar244;
            auVar64._12_4_ = fVar244;
            fVar246 = fVar152 * fVar149 * fVar246;
            auVar64._16_4_ = fVar246;
            fVar257 = fVar154 * fVar151 * fVar257;
            auVar64._20_4_ = fVar257;
            fVar326 = fVar155 * fVar153 * fVar326;
            auVar64._24_4_ = fVar326;
            auVar64._28_4_ = auVar169._28_4_;
            local_760._4_4_ = fVar240 + auVar295._4_4_;
            local_760._0_4_ = fVar229 + auVar295._0_4_;
            uStack_758._0_4_ = fVar242 + auVar295._8_4_;
            uStack_758._4_4_ = fVar244 + auVar295._12_4_;
            fStack_750 = fVar246 + auVar295._16_4_;
            fStack_74c = fVar257 + auVar295._20_4_;
            fStack_748 = fVar326 + auVar295._24_4_;
            fStack_744 = auVar169._28_4_ + auVar295._28_4_;
            fVar229 = fVar194 * fVar308 * -fVar228;
            fVar240 = fVar146 * fVar127 * -fVar178;
            auVar65._4_4_ = fVar240;
            auVar65._0_4_ = fVar229;
            fVar242 = fVar148 * fVar145 * -fVar261;
            auVar65._8_4_ = fVar242;
            fVar244 = fVar150 * fVar147 * -fVar193;
            auVar65._12_4_ = fVar244;
            fVar246 = fVar152 * fVar149 * -fVar283;
            auVar65._16_4_ = fVar246;
            fVar257 = fVar154 * fVar151 * -fVar285;
            auVar65._20_4_ = fVar257;
            fVar326 = fVar155 * fVar153 * -fVar289;
            auVar65._24_4_ = fVar326;
            auVar65._28_4_ = -fVar301;
            local_7a0._4_4_ = auVar190._4_4_ + fVar240;
            local_7a0._0_4_ = auVar190._0_4_ + fVar229;
            uStack_798._0_4_ = auVar190._8_4_ + fVar242;
            uStack_798._4_4_ = auVar190._12_4_ + fVar244;
            fStack_790 = auVar190._16_4_ + fVar246;
            fStack_78c = auVar190._20_4_ + fVar257;
            fStack_788 = auVar190._24_4_ + fVar326;
            fStack_784 = auVar190._28_4_ + -fVar301;
            fVar229 = fVar308 * 0.0 * fVar194;
            fVar240 = fVar127 * 0.0 * fVar146;
            auVar66._4_4_ = fVar240;
            auVar66._0_4_ = fVar229;
            fVar242 = fVar145 * 0.0 * fVar148;
            auVar66._8_4_ = fVar242;
            fVar244 = fVar147 * 0.0 * fVar150;
            auVar66._12_4_ = fVar244;
            fVar246 = fVar149 * 0.0 * fVar152;
            auVar66._16_4_ = fVar246;
            fVar257 = fVar151 * 0.0 * fVar154;
            auVar66._20_4_ = fVar257;
            fVar326 = fVar153 * 0.0 * fVar155;
            auVar66._24_4_ = fVar326;
            auVar66._28_4_ = fVar301;
            auVar169 = vsubps_avx(auVar295,auVar64);
            auVar348._0_4_ = fVar229 + auVar141._0_4_;
            auVar348._4_4_ = fVar240 + auVar141._4_4_;
            auVar348._8_4_ = fVar242 + auVar141._8_4_;
            auVar348._12_4_ = fVar244 + auVar141._12_4_;
            auVar348._16_4_ = fVar246 + auVar141._16_4_;
            auVar348._20_4_ = fVar257 + auVar141._20_4_;
            auVar348._24_4_ = fVar326 + auVar141._24_4_;
            auVar348._28_4_ = fVar301 + auVar141._28_4_;
            fVar229 = auVar311._0_4_ * fVar211 * fVar195;
            fVar195 = auVar311._4_4_ * fVar279 * fVar208;
            auVar67._4_4_ = fVar195;
            auVar67._0_4_ = fVar229;
            fVar240 = auVar311._8_4_ * fVar212 * fVar209;
            auVar67._8_4_ = fVar240;
            fVar208 = auVar311._12_4_ * fVar281 * fVar210;
            auVar67._12_4_ = fVar208;
            fVar242 = auVar311._16_4_ * fVar213 * fVar255;
            auVar67._16_4_ = fVar242;
            fVar209 = auVar311._20_4_ * fVar284 * fVar259;
            auVar67._20_4_ = fVar209;
            fVar244 = auVar311._24_4_ * fVar214 * fVar325;
            auVar67._24_4_ = fVar244;
            auVar67._28_4_ = fVar156;
            auVar277 = vsubps_avx(auVar190,auVar65);
            auVar337._0_4_ = auVar343._0_4_ + fVar229;
            auVar337._4_4_ = auVar343._4_4_ + fVar195;
            auVar337._8_4_ = auVar343._8_4_ + fVar240;
            auVar337._12_4_ = auVar343._12_4_ + fVar208;
            auVar337._16_4_ = auVar343._16_4_ + fVar242;
            auVar337._20_4_ = auVar343._20_4_ + fVar209;
            auVar337._24_4_ = auVar343._24_4_ + fVar244;
            auVar337._28_4_ = auVar343._28_4_ + fVar156;
            fVar229 = fVar211 * -fVar274 * auVar311._0_4_;
            fVar195 = fVar279 * -fVar271 * auVar311._4_4_;
            auVar68._4_4_ = fVar195;
            auVar68._0_4_ = fVar229;
            fVar240 = fVar212 * -fVar280 * auVar311._8_4_;
            auVar68._8_4_ = fVar240;
            fVar208 = fVar281 * -fVar272 * auVar311._12_4_;
            auVar68._12_4_ = fVar208;
            fVar242 = fVar213 * -fVar282 * auVar311._16_4_;
            auVar68._16_4_ = fVar242;
            fVar209 = fVar284 * -fVar273 * auVar311._20_4_;
            auVar68._20_4_ = fVar209;
            fVar244 = fVar214 * -fVar286 * auVar311._24_4_;
            auVar68._24_4_ = fVar244;
            auVar68._28_4_ = auVar295._28_4_;
            auVar328 = vsubps_avx(auVar141,auVar66);
            auVar223._0_4_ = auVar237._0_4_ + fVar229;
            auVar223._4_4_ = auVar237._4_4_ + fVar195;
            auVar223._8_4_ = auVar237._8_4_ + fVar240;
            auVar223._12_4_ = auVar237._12_4_ + fVar208;
            auVar223._16_4_ = auVar237._16_4_ + fVar242;
            auVar223._20_4_ = auVar237._20_4_ + fVar209;
            auVar223._24_4_ = auVar237._24_4_ + fVar244;
            auVar223._28_4_ = auVar237._28_4_ + auVar295._28_4_;
            fVar229 = fVar211 * 0.0 * auVar311._0_4_;
            fVar195 = fVar279 * 0.0 * auVar311._4_4_;
            auVar69._4_4_ = fVar195;
            auVar69._0_4_ = fVar229;
            fVar240 = fVar212 * 0.0 * auVar311._8_4_;
            auVar69._8_4_ = fVar240;
            fVar208 = fVar281 * 0.0 * auVar311._12_4_;
            auVar69._12_4_ = fVar208;
            fVar242 = fVar213 * 0.0 * auVar311._16_4_;
            auVar69._16_4_ = fVar242;
            fVar209 = fVar284 * 0.0 * auVar311._20_4_;
            auVar69._20_4_ = fVar209;
            fVar244 = fVar214 * 0.0 * auVar311._24_4_;
            auVar69._24_4_ = fVar244;
            auVar69._28_4_ = auVar141._28_4_;
            auVar19 = vsubps_avx(auVar343,auVar67);
            auVar104._4_4_ = fStack_61c;
            auVar104._0_4_ = local_620;
            auVar104._8_4_ = fStack_618;
            auVar104._12_4_ = fStack_614;
            auVar104._16_4_ = fStack_610;
            auVar104._20_4_ = fStack_60c;
            auVar104._24_4_ = fStack_608;
            auVar104._28_4_ = fStack_604;
            auVar297._0_4_ = local_620 + fVar229;
            auVar297._4_4_ = fStack_61c + fVar195;
            auVar297._8_4_ = fStack_618 + fVar240;
            auVar297._12_4_ = fStack_614 + fVar208;
            auVar297._16_4_ = fStack_610 + fVar242;
            auVar297._20_4_ = fStack_60c + fVar209;
            auVar297._24_4_ = fStack_608 + fVar244;
            auVar297._28_4_ = fStack_604 + auVar141._28_4_;
            auVar20 = vsubps_avx(auVar237,auVar68);
            auVar26 = vsubps_avx(auVar104,auVar69);
            auVar16 = vsubps_avx(auVar223,auVar277);
            auVar22 = vsubps_avx(auVar297,auVar328);
            auVar70._4_4_ = auVar328._4_4_ * auVar16._4_4_;
            auVar70._0_4_ = auVar328._0_4_ * auVar16._0_4_;
            auVar70._8_4_ = auVar328._8_4_ * auVar16._8_4_;
            auVar70._12_4_ = auVar328._12_4_ * auVar16._12_4_;
            auVar70._16_4_ = auVar328._16_4_ * auVar16._16_4_;
            auVar70._20_4_ = auVar328._20_4_ * auVar16._20_4_;
            auVar70._24_4_ = auVar328._24_4_ * auVar16._24_4_;
            auVar70._28_4_ = auVar331._28_4_;
            auVar71._4_4_ = auVar277._4_4_ * auVar22._4_4_;
            auVar71._0_4_ = auVar277._0_4_ * auVar22._0_4_;
            auVar71._8_4_ = auVar277._8_4_ * auVar22._8_4_;
            auVar71._12_4_ = auVar277._12_4_ * auVar22._12_4_;
            auVar71._16_4_ = auVar277._16_4_ * auVar22._16_4_;
            auVar71._20_4_ = auVar277._20_4_ * auVar22._20_4_;
            auVar71._24_4_ = auVar277._24_4_ * auVar22._24_4_;
            auVar71._28_4_ = auVar237._28_4_;
            auVar135 = vsubps_avx(auVar71,auVar70);
            auVar72._4_4_ = auVar169._4_4_ * auVar22._4_4_;
            auVar72._0_4_ = auVar169._0_4_ * auVar22._0_4_;
            auVar72._8_4_ = auVar169._8_4_ * auVar22._8_4_;
            auVar72._12_4_ = auVar169._12_4_ * auVar22._12_4_;
            auVar72._16_4_ = auVar169._16_4_ * auVar22._16_4_;
            auVar72._20_4_ = auVar169._20_4_ * auVar22._20_4_;
            auVar72._24_4_ = auVar169._24_4_ * auVar22._24_4_;
            auVar72._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar337,auVar169);
            auVar73._4_4_ = auVar328._4_4_ * auVar22._4_4_;
            auVar73._0_4_ = auVar328._0_4_ * auVar22._0_4_;
            auVar73._8_4_ = auVar328._8_4_ * auVar22._8_4_;
            auVar73._12_4_ = auVar328._12_4_ * auVar22._12_4_;
            auVar73._16_4_ = auVar328._16_4_ * auVar22._16_4_;
            auVar73._20_4_ = auVar328._20_4_ * auVar22._20_4_;
            auVar73._24_4_ = auVar328._24_4_ * auVar22._24_4_;
            auVar73._28_4_ = auVar21._28_4_;
            auVar201 = vsubps_avx(auVar73,auVar72);
            auVar74._4_4_ = auVar277._4_4_ * auVar22._4_4_;
            auVar74._0_4_ = auVar277._0_4_ * auVar22._0_4_;
            auVar74._8_4_ = auVar277._8_4_ * auVar22._8_4_;
            auVar74._12_4_ = auVar277._12_4_ * auVar22._12_4_;
            auVar74._16_4_ = auVar277._16_4_ * auVar22._16_4_;
            auVar74._20_4_ = auVar277._20_4_ * auVar22._20_4_;
            auVar74._24_4_ = auVar277._24_4_ * auVar22._24_4_;
            auVar74._28_4_ = auVar21._28_4_;
            auVar75._4_4_ = auVar169._4_4_ * auVar16._4_4_;
            auVar75._0_4_ = auVar169._0_4_ * auVar16._0_4_;
            auVar75._8_4_ = auVar169._8_4_ * auVar16._8_4_;
            auVar75._12_4_ = auVar169._12_4_ * auVar16._12_4_;
            auVar75._16_4_ = auVar169._16_4_ * auVar16._16_4_;
            auVar75._20_4_ = auVar169._20_4_ * auVar16._20_4_;
            auVar75._24_4_ = auVar169._24_4_ * auVar16._24_4_;
            auVar75._28_4_ = auVar16._28_4_;
            auVar21 = vsubps_avx(auVar75,auVar74);
            auVar167._0_4_ = auVar135._0_4_ * 0.0 + auVar21._0_4_ + auVar201._0_4_ * 0.0;
            auVar167._4_4_ = auVar135._4_4_ * 0.0 + auVar21._4_4_ + auVar201._4_4_ * 0.0;
            auVar167._8_4_ = auVar135._8_4_ * 0.0 + auVar21._8_4_ + auVar201._8_4_ * 0.0;
            auVar167._12_4_ = auVar135._12_4_ * 0.0 + auVar21._12_4_ + auVar201._12_4_ * 0.0;
            auVar167._16_4_ = auVar135._16_4_ * 0.0 + auVar21._16_4_ + auVar201._16_4_ * 0.0;
            auVar167._20_4_ = auVar135._20_4_ * 0.0 + auVar21._20_4_ + auVar201._20_4_ * 0.0;
            auVar167._24_4_ = auVar135._24_4_ * 0.0 + auVar21._24_4_ + auVar201._24_4_ * 0.0;
            auVar167._28_4_ = auVar135._28_4_ + auVar21._28_4_ + auVar201._28_4_;
            auVar220 = vcmpps_avx(auVar167,ZEXT832(0) << 0x20,2);
            auVar19 = vblendvps_avx(auVar19,_local_760,auVar220);
            auVar207 = ZEXT3264(auVar19);
            auVar21 = vblendvps_avx(auVar20,_local_7a0,auVar220);
            auVar20 = vblendvps_avx(auVar26,auVar348,auVar220);
            auVar26 = vblendvps_avx(auVar169,auVar337,auVar220);
            auVar16 = vblendvps_avx(auVar277,auVar223,auVar220);
            auVar22 = vblendvps_avx(auVar328,auVar297,auVar220);
            auVar135 = vblendvps_avx(auVar337,auVar169,auVar220);
            auVar201 = vblendvps_avx(auVar223,auVar277,auVar220);
            auVar202 = vblendvps_avx(auVar297,auVar328,auVar220);
            auVar169 = vandps_avx(auVar310,auVar206);
            auVar135 = vsubps_avx(auVar135,auVar19);
            auVar23 = vsubps_avx(auVar201,auVar21);
            auVar202 = vsubps_avx(auVar202,auVar20);
            auVar24 = vsubps_avx(auVar21,auVar16);
            fVar229 = auVar23._0_4_;
            fVar174 = auVar20._0_4_;
            fVar210 = auVar23._4_4_;
            fVar175 = auVar20._4_4_;
            auVar76._4_4_ = fVar175 * fVar210;
            auVar76._0_4_ = fVar174 * fVar229;
            fVar274 = auVar23._8_4_;
            fVar176 = auVar20._8_4_;
            auVar76._8_4_ = fVar176 * fVar274;
            fVar281 = auVar23._12_4_;
            fVar177 = auVar20._12_4_;
            auVar76._12_4_ = fVar177 * fVar281;
            fVar308 = auVar23._16_4_;
            fVar215 = auVar20._16_4_;
            auVar76._16_4_ = fVar215 * fVar308;
            fVar228 = auVar23._20_4_;
            fVar225 = auVar20._20_4_;
            auVar76._20_4_ = fVar225 * fVar228;
            fVar301 = auVar23._24_4_;
            fVar226 = auVar20._24_4_;
            auVar76._24_4_ = fVar226 * fVar301;
            auVar76._28_4_ = auVar201._28_4_;
            fVar195 = auVar21._0_4_;
            fVar227 = auVar202._0_4_;
            fVar246 = auVar21._4_4_;
            fVar262 = auVar202._4_4_;
            auVar77._4_4_ = fVar262 * fVar246;
            auVar77._0_4_ = fVar227 * fVar195;
            fVar211 = auVar21._8_4_;
            fVar268 = auVar202._8_4_;
            auVar77._8_4_ = fVar268 * fVar211;
            fVar282 = auVar21._12_4_;
            fVar269 = auVar202._12_4_;
            auVar77._12_4_ = fVar269 * fVar282;
            fVar127 = auVar21._16_4_;
            fVar270 = auVar202._16_4_;
            auVar77._16_4_ = fVar270 * fVar127;
            fVar178 = auVar21._20_4_;
            fVar287 = auVar202._20_4_;
            auVar77._20_4_ = fVar287 * fVar178;
            fVar304 = auVar21._24_4_;
            fVar288 = auVar202._24_4_;
            uVar7 = auVar277._28_4_;
            auVar77._24_4_ = fVar288 * fVar304;
            auVar77._28_4_ = uVar7;
            auVar201 = vsubps_avx(auVar77,auVar76);
            fVar240 = auVar19._0_4_;
            fVar255 = auVar19._4_4_;
            auVar78._4_4_ = fVar262 * fVar255;
            auVar78._0_4_ = fVar227 * fVar240;
            fVar271 = auVar19._8_4_;
            auVar78._8_4_ = fVar268 * fVar271;
            fVar213 = auVar19._12_4_;
            auVar78._12_4_ = fVar269 * fVar213;
            fVar145 = auVar19._16_4_;
            auVar78._16_4_ = fVar270 * fVar145;
            fVar261 = auVar19._20_4_;
            auVar78._20_4_ = fVar287 * fVar261;
            fVar306 = auVar19._24_4_;
            auVar78._24_4_ = fVar288 * fVar306;
            auVar78._28_4_ = uVar7;
            fVar208 = auVar135._0_4_;
            fVar257 = auVar135._4_4_;
            auVar79._4_4_ = fVar175 * fVar257;
            auVar79._0_4_ = fVar174 * fVar208;
            fVar279 = auVar135._8_4_;
            auVar79._8_4_ = fVar176 * fVar279;
            fVar273 = auVar135._12_4_;
            auVar79._12_4_ = fVar177 * fVar273;
            fVar147 = auVar135._16_4_;
            auVar79._16_4_ = fVar215 * fVar147;
            fVar193 = auVar135._20_4_;
            auVar79._20_4_ = fVar225 * fVar193;
            fVar157 = auVar135._24_4_;
            auVar79._24_4_ = fVar226 * fVar157;
            auVar79._28_4_ = auVar337._28_4_;
            auVar277 = vsubps_avx(auVar79,auVar78);
            auVar80._4_4_ = fVar246 * fVar257;
            auVar80._0_4_ = fVar195 * fVar208;
            auVar80._8_4_ = fVar211 * fVar279;
            auVar80._12_4_ = fVar282 * fVar273;
            auVar80._16_4_ = fVar127 * fVar147;
            auVar80._20_4_ = fVar178 * fVar193;
            auVar80._24_4_ = fVar304 * fVar157;
            auVar80._28_4_ = uVar7;
            auVar81._4_4_ = fVar255 * fVar210;
            auVar81._0_4_ = fVar240 * fVar229;
            auVar81._8_4_ = fVar271 * fVar274;
            auVar81._12_4_ = fVar213 * fVar281;
            auVar81._16_4_ = fVar145 * fVar308;
            auVar81._20_4_ = fVar261 * fVar228;
            auVar81._24_4_ = fVar306 * fVar301;
            auVar81._28_4_ = auVar328._28_4_;
            auVar328 = vsubps_avx(auVar81,auVar80);
            auVar25 = vsubps_avx(auVar20,auVar22);
            fVar209 = auVar328._28_4_ + auVar277._28_4_;
            auVar313._0_4_ = auVar328._0_4_ + auVar277._0_4_ * 0.0 + auVar201._0_4_ * 0.0;
            auVar313._4_4_ = auVar328._4_4_ + auVar277._4_4_ * 0.0 + auVar201._4_4_ * 0.0;
            auVar313._8_4_ = auVar328._8_4_ + auVar277._8_4_ * 0.0 + auVar201._8_4_ * 0.0;
            auVar313._12_4_ = auVar328._12_4_ + auVar277._12_4_ * 0.0 + auVar201._12_4_ * 0.0;
            auVar313._16_4_ = auVar328._16_4_ + auVar277._16_4_ * 0.0 + auVar201._16_4_ * 0.0;
            auVar313._20_4_ = auVar328._20_4_ + auVar277._20_4_ * 0.0 + auVar201._20_4_ * 0.0;
            auVar313._24_4_ = auVar328._24_4_ + auVar277._24_4_ * 0.0 + auVar201._24_4_ * 0.0;
            auVar313._28_4_ = fVar209 + auVar201._28_4_;
            fVar242 = auVar24._0_4_;
            fVar259 = auVar24._4_4_;
            auVar82._4_4_ = auVar22._4_4_ * fVar259;
            auVar82._0_4_ = auVar22._0_4_ * fVar242;
            fVar280 = auVar24._8_4_;
            auVar82._8_4_ = auVar22._8_4_ * fVar280;
            fVar284 = auVar24._12_4_;
            auVar82._12_4_ = auVar22._12_4_ * fVar284;
            fVar149 = auVar24._16_4_;
            auVar82._16_4_ = auVar22._16_4_ * fVar149;
            fVar283 = auVar24._20_4_;
            auVar82._20_4_ = auVar22._20_4_ * fVar283;
            fVar171 = auVar24._24_4_;
            auVar82._24_4_ = auVar22._24_4_ * fVar171;
            auVar82._28_4_ = fVar209;
            fVar209 = auVar25._0_4_;
            fVar326 = auVar25._4_4_;
            auVar83._4_4_ = auVar16._4_4_ * fVar326;
            auVar83._0_4_ = auVar16._0_4_ * fVar209;
            fVar212 = auVar25._8_4_;
            auVar83._8_4_ = auVar16._8_4_ * fVar212;
            fVar286 = auVar25._12_4_;
            auVar83._12_4_ = auVar16._12_4_ * fVar286;
            fVar151 = auVar25._16_4_;
            auVar83._16_4_ = auVar16._16_4_ * fVar151;
            fVar285 = auVar25._20_4_;
            auVar83._20_4_ = auVar16._20_4_ * fVar285;
            fVar172 = auVar25._24_4_;
            auVar83._24_4_ = auVar16._24_4_ * fVar172;
            auVar83._28_4_ = auVar328._28_4_;
            auVar277 = vsubps_avx(auVar83,auVar82);
            auVar328 = vsubps_avx(auVar19,auVar26);
            fVar244 = auVar328._0_4_;
            fVar325 = auVar328._4_4_;
            auVar84._4_4_ = auVar22._4_4_ * fVar325;
            auVar84._0_4_ = auVar22._0_4_ * fVar244;
            fVar272 = auVar328._8_4_;
            auVar84._8_4_ = auVar22._8_4_ * fVar272;
            fVar214 = auVar328._12_4_;
            auVar84._12_4_ = auVar22._12_4_ * fVar214;
            fVar153 = auVar328._16_4_;
            auVar84._16_4_ = auVar22._16_4_ * fVar153;
            fVar289 = auVar328._20_4_;
            auVar84._20_4_ = auVar22._20_4_ * fVar289;
            fVar173 = auVar328._24_4_;
            auVar84._24_4_ = auVar22._24_4_ * fVar173;
            auVar84._28_4_ = auVar22._28_4_;
            auVar85._4_4_ = fVar326 * auVar26._4_4_;
            auVar85._0_4_ = fVar209 * auVar26._0_4_;
            auVar85._8_4_ = fVar212 * auVar26._8_4_;
            auVar85._12_4_ = fVar286 * auVar26._12_4_;
            auVar85._16_4_ = fVar151 * auVar26._16_4_;
            auVar85._20_4_ = fVar285 * auVar26._20_4_;
            auVar85._24_4_ = fVar172 * auVar26._24_4_;
            auVar85._28_4_ = auVar201._28_4_;
            auVar22 = vsubps_avx(auVar84,auVar85);
            auVar86._4_4_ = auVar16._4_4_ * fVar325;
            auVar86._0_4_ = auVar16._0_4_ * fVar244;
            auVar86._8_4_ = auVar16._8_4_ * fVar272;
            auVar86._12_4_ = auVar16._12_4_ * fVar214;
            auVar86._16_4_ = auVar16._16_4_ * fVar153;
            auVar86._20_4_ = auVar16._20_4_ * fVar289;
            auVar86._24_4_ = auVar16._24_4_ * fVar173;
            auVar86._28_4_ = auVar16._28_4_;
            auVar87._4_4_ = fVar259 * auVar26._4_4_;
            auVar87._0_4_ = fVar242 * auVar26._0_4_;
            auVar87._8_4_ = fVar280 * auVar26._8_4_;
            auVar87._12_4_ = fVar284 * auVar26._12_4_;
            auVar87._16_4_ = fVar149 * auVar26._16_4_;
            auVar87._20_4_ = fVar283 * auVar26._20_4_;
            auVar87._24_4_ = fVar171 * auVar26._24_4_;
            auVar87._28_4_ = auVar26._28_4_;
            auVar26 = vsubps_avx(auVar87,auVar86);
            auVar142._0_4_ = auVar277._0_4_ * 0.0 + auVar26._0_4_ + auVar22._0_4_ * 0.0;
            auVar142._4_4_ = auVar277._4_4_ * 0.0 + auVar26._4_4_ + auVar22._4_4_ * 0.0;
            auVar142._8_4_ = auVar277._8_4_ * 0.0 + auVar26._8_4_ + auVar22._8_4_ * 0.0;
            auVar142._12_4_ = auVar277._12_4_ * 0.0 + auVar26._12_4_ + auVar22._12_4_ * 0.0;
            auVar142._16_4_ = auVar277._16_4_ * 0.0 + auVar26._16_4_ + auVar22._16_4_ * 0.0;
            auVar142._20_4_ = auVar277._20_4_ * 0.0 + auVar26._20_4_ + auVar22._20_4_ * 0.0;
            auVar142._24_4_ = auVar277._24_4_ * 0.0 + auVar26._24_4_ + auVar22._24_4_ * 0.0;
            auVar142._28_4_ = auVar22._28_4_ + auVar26._28_4_ + auVar22._28_4_;
            auVar144 = ZEXT3264(auVar142);
            auVar26 = vmaxps_avx(auVar313,auVar142);
            auVar26 = vcmpps_avx(auVar26,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar16 = auVar169 & auVar26;
            if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar16 >> 0x7f,0) == '\0') &&
                  (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar16 >> 0xbf,0) == '\0') &&
                (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar16[0x1f]) {
LAB_00e8efee:
              auVar254 = ZEXT3264(auVar21);
              auVar298 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            }
            else {
              auVar16 = vandps_avx(auVar26,auVar169);
              auVar88._4_4_ = fVar326 * fVar210;
              auVar88._0_4_ = fVar209 * fVar229;
              auVar88._8_4_ = fVar212 * fVar274;
              auVar88._12_4_ = fVar286 * fVar281;
              auVar88._16_4_ = fVar151 * fVar308;
              auVar88._20_4_ = fVar285 * fVar228;
              auVar88._24_4_ = fVar172 * fVar301;
              auVar88._28_4_ = auVar169._28_4_;
              auVar89._4_4_ = fVar259 * fVar262;
              auVar89._0_4_ = fVar242 * fVar227;
              auVar89._8_4_ = fVar280 * fVar268;
              auVar89._12_4_ = fVar284 * fVar269;
              auVar89._16_4_ = fVar149 * fVar270;
              auVar89._20_4_ = fVar283 * fVar287;
              auVar89._24_4_ = fVar171 * fVar288;
              auVar89._28_4_ = auVar26._28_4_;
              auVar26 = vsubps_avx(auVar89,auVar88);
              auVar90._4_4_ = fVar325 * fVar262;
              auVar90._0_4_ = fVar244 * fVar227;
              auVar90._8_4_ = fVar272 * fVar268;
              auVar90._12_4_ = fVar214 * fVar269;
              auVar90._16_4_ = fVar153 * fVar270;
              auVar90._20_4_ = fVar289 * fVar287;
              auVar90._24_4_ = fVar173 * fVar288;
              auVar90._28_4_ = auVar202._28_4_;
              auVar91._4_4_ = fVar326 * fVar257;
              auVar91._0_4_ = fVar209 * fVar208;
              auVar91._8_4_ = fVar212 * fVar279;
              auVar91._12_4_ = fVar286 * fVar273;
              auVar91._16_4_ = fVar151 * fVar147;
              auVar91._20_4_ = fVar285 * fVar193;
              auVar91._24_4_ = fVar172 * fVar157;
              auVar91._28_4_ = auVar25._28_4_;
              auVar22 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar259 * fVar257;
              auVar92._0_4_ = fVar242 * fVar208;
              auVar92._8_4_ = fVar280 * fVar279;
              auVar92._12_4_ = fVar284 * fVar273;
              auVar92._16_4_ = fVar149 * fVar147;
              auVar92._20_4_ = fVar283 * fVar193;
              auVar92._24_4_ = fVar171 * fVar157;
              auVar92._28_4_ = auVar135._28_4_;
              auVar93._4_4_ = fVar325 * fVar210;
              auVar93._0_4_ = fVar244 * fVar229;
              auVar93._8_4_ = fVar272 * fVar274;
              auVar93._12_4_ = fVar214 * fVar281;
              auVar93._16_4_ = fVar153 * fVar308;
              auVar93._20_4_ = fVar289 * fVar228;
              auVar93._24_4_ = fVar173 * fVar301;
              auVar93._28_4_ = auVar23._28_4_;
              auVar201 = vsubps_avx(auVar93,auVar92);
              auVar168._0_4_ = auVar26._0_4_ * 0.0 + auVar201._0_4_ + auVar22._0_4_ * 0.0;
              auVar168._4_4_ = auVar26._4_4_ * 0.0 + auVar201._4_4_ + auVar22._4_4_ * 0.0;
              auVar168._8_4_ = auVar26._8_4_ * 0.0 + auVar201._8_4_ + auVar22._8_4_ * 0.0;
              auVar168._12_4_ = auVar26._12_4_ * 0.0 + auVar201._12_4_ + auVar22._12_4_ * 0.0;
              auVar168._16_4_ = auVar26._16_4_ * 0.0 + auVar201._16_4_ + auVar22._16_4_ * 0.0;
              auVar168._20_4_ = auVar26._20_4_ * 0.0 + auVar201._20_4_ + auVar22._20_4_ * 0.0;
              auVar168._24_4_ = auVar26._24_4_ * 0.0 + auVar201._24_4_ + auVar22._24_4_ * 0.0;
              auVar168._28_4_ = auVar23._28_4_ + auVar201._28_4_ + auVar135._28_4_;
              auVar169 = vrcpps_avx(auVar168);
              fVar229 = auVar169._0_4_;
              fVar208 = auVar169._4_4_;
              auVar94._4_4_ = auVar168._4_4_ * fVar208;
              auVar94._0_4_ = auVar168._0_4_ * fVar229;
              fVar242 = auVar169._8_4_;
              auVar94._8_4_ = auVar168._8_4_ * fVar242;
              fVar209 = auVar169._12_4_;
              auVar94._12_4_ = auVar168._12_4_ * fVar209;
              fVar244 = auVar169._16_4_;
              auVar94._16_4_ = auVar168._16_4_ * fVar244;
              fVar210 = auVar169._20_4_;
              auVar94._20_4_ = auVar168._20_4_ * fVar210;
              fVar257 = auVar169._24_4_;
              auVar94._24_4_ = auVar168._24_4_ * fVar257;
              auVar94._28_4_ = auVar25._28_4_;
              auVar332._8_4_ = 0x3f800000;
              auVar332._0_8_ = 0x3f8000003f800000;
              auVar332._12_4_ = 0x3f800000;
              auVar332._16_4_ = 0x3f800000;
              auVar332._20_4_ = 0x3f800000;
              auVar332._24_4_ = 0x3f800000;
              auVar332._28_4_ = 0x3f800000;
              auVar169 = vsubps_avx(auVar332,auVar94);
              fVar229 = auVar169._0_4_ * fVar229 + fVar229;
              fVar208 = auVar169._4_4_ * fVar208 + fVar208;
              fVar242 = auVar169._8_4_ * fVar242 + fVar242;
              fVar209 = auVar169._12_4_ * fVar209 + fVar209;
              fVar244 = auVar169._16_4_ * fVar244 + fVar244;
              fVar210 = auVar169._20_4_ * fVar210 + fVar210;
              fVar257 = auVar169._24_4_ * fVar257 + fVar257;
              auVar95._4_4_ =
                   (fVar255 * auVar26._4_4_ + auVar22._4_4_ * fVar246 + auVar201._4_4_ * fVar175) *
                   fVar208;
              auVar95._0_4_ =
                   (fVar240 * auVar26._0_4_ + auVar22._0_4_ * fVar195 + auVar201._0_4_ * fVar174) *
                   fVar229;
              auVar95._8_4_ =
                   (fVar271 * auVar26._8_4_ + auVar22._8_4_ * fVar211 + auVar201._8_4_ * fVar176) *
                   fVar242;
              auVar95._12_4_ =
                   (fVar213 * auVar26._12_4_ + auVar22._12_4_ * fVar282 + auVar201._12_4_ * fVar177)
                   * fVar209;
              auVar95._16_4_ =
                   (fVar145 * auVar26._16_4_ + auVar22._16_4_ * fVar127 + auVar201._16_4_ * fVar215)
                   * fVar244;
              auVar95._20_4_ =
                   (fVar261 * auVar26._20_4_ + auVar22._20_4_ * fVar178 + auVar201._20_4_ * fVar225)
                   * fVar210;
              auVar95._24_4_ =
                   (fVar306 * auVar26._24_4_ + auVar22._24_4_ * fVar304 + auVar201._24_4_ * fVar226)
                   * fVar257;
              auVar95._28_4_ = auVar19._28_4_ + auVar21._28_4_ + auVar20._28_4_;
              auVar207 = ZEXT3264(auVar95);
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar224._4_4_ = uVar7;
              auVar224._0_4_ = uVar7;
              auVar224._8_4_ = uVar7;
              auVar224._12_4_ = uVar7;
              auVar224._16_4_ = uVar7;
              auVar224._20_4_ = uVar7;
              auVar224._24_4_ = uVar7;
              auVar224._28_4_ = uVar7;
              auVar169 = vcmpps_avx(local_e0,auVar95,2);
              auVar19 = vcmpps_avx(auVar95,auVar224,2);
              auVar21 = vandps_avx(auVar169,auVar19);
              auVar169 = auVar16 & auVar21;
              if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar169 >> 0x7f,0) == '\0') &&
                    (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar169 >> 0xbf,0) == '\0') &&
                  (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar169[0x1f]) goto LAB_00e8efee;
              auVar169 = vandps_avx(auVar16,auVar21);
              auVar254 = ZEXT3264(auVar169);
              auVar21 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar168,4);
              auVar20 = auVar169 & auVar21;
              auVar298 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                auVar169 = vandps_avx(auVar21,auVar169);
                auVar298 = ZEXT3264(auVar169);
                auVar96._4_4_ = auVar313._4_4_ * fVar208;
                auVar96._0_4_ = auVar313._0_4_ * fVar229;
                auVar96._8_4_ = auVar313._8_4_ * fVar242;
                auVar96._12_4_ = auVar313._12_4_ * fVar209;
                auVar96._16_4_ = auVar313._16_4_ * fVar244;
                auVar96._20_4_ = auVar313._20_4_ * fVar210;
                auVar96._24_4_ = auVar313._24_4_ * fVar257;
                auVar96._28_4_ = auVar19._28_4_;
                auVar97._4_4_ = auVar142._4_4_ * fVar208;
                auVar97._0_4_ = auVar142._0_4_ * fVar229;
                auVar97._8_4_ = auVar142._8_4_ * fVar242;
                auVar97._12_4_ = auVar142._12_4_ * fVar209;
                auVar97._16_4_ = auVar142._16_4_ * fVar244;
                auVar97._20_4_ = auVar142._20_4_ * fVar210;
                auVar97._24_4_ = auVar142._24_4_ * fVar257;
                auVar97._28_4_ = auVar142._28_4_;
                auVar253._8_4_ = 0x3f800000;
                auVar253._0_8_ = 0x3f8000003f800000;
                auVar253._12_4_ = 0x3f800000;
                auVar253._16_4_ = 0x3f800000;
                auVar253._20_4_ = 0x3f800000;
                auVar253._24_4_ = 0x3f800000;
                auVar253._28_4_ = 0x3f800000;
                auVar254 = ZEXT3264(auVar253);
                auVar169 = vsubps_avx(auVar253,auVar96);
                local_280 = vblendvps_avx(auVar169,auVar96,auVar220);
                auVar169 = vsubps_avx(auVar253,auVar97);
                _local_4e0 = vblendvps_avx(auVar169,auVar97,auVar220);
                auVar144 = ZEXT3264(_local_4e0);
                local_2a0 = auVar95;
              }
            }
            auVar169 = auVar298._0_32_;
            auVar102._4_4_ = fVar146;
            auVar102._0_4_ = fVar194;
            auVar102._8_4_ = fVar148;
            auVar102._12_4_ = fVar150;
            auVar102._16_4_ = fVar152;
            auVar102._20_4_ = fVar154;
            auVar102._24_4_ = fVar155;
            auVar102._28_4_ = fVar156;
            if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar169 >> 0x7f,0) != '\0') ||
                  (auVar298 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar169 >> 0xbf,0) != '\0') ||
                (auVar298 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar298[0x1f] < '\0') {
              auVar21 = vsubps_avx(auVar311,auVar102);
              auVar207 = ZEXT3264(local_280);
              fVar194 = fVar194 + auVar21._0_4_ * local_280._0_4_;
              fVar146 = fVar146 + auVar21._4_4_ * local_280._4_4_;
              fVar148 = fVar148 + auVar21._8_4_ * local_280._8_4_;
              fVar150 = fVar150 + auVar21._12_4_ * local_280._12_4_;
              fVar152 = fVar152 + auVar21._16_4_ * local_280._16_4_;
              fVar154 = fVar154 + auVar21._20_4_ * local_280._20_4_;
              fVar155 = fVar155 + auVar21._24_4_ * local_280._24_4_;
              fVar156 = fVar156 + auVar21._28_4_;
              fVar229 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar98._4_4_ = (fVar146 + fVar146) * fVar229;
              auVar98._0_4_ = (fVar194 + fVar194) * fVar229;
              auVar98._8_4_ = (fVar148 + fVar148) * fVar229;
              auVar98._12_4_ = (fVar150 + fVar150) * fVar229;
              auVar98._16_4_ = (fVar152 + fVar152) * fVar229;
              auVar98._20_4_ = (fVar154 + fVar154) * fVar229;
              auVar98._24_4_ = (fVar155 + fVar155) * fVar229;
              auVar98._28_4_ = fVar156 + fVar156;
              auVar21 = vcmpps_avx(local_2a0,auVar98,6);
              auVar144 = ZEXT3264(auVar21);
              auVar19 = auVar169 & auVar21;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                local_320 = vandps_avx(auVar21,auVar169);
                auVar144 = ZEXT3264(local_320);
                local_3c0 = (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0;
                fStack_3bc = (float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0;
                fStack_3b8 = (float)uStack_4d8 + (float)uStack_4d8 + -1.0;
                fStack_3b4 = uStack_4d8._4_4_ + uStack_4d8._4_4_ + -1.0;
                fStack_3b0 = (float)uStack_4d0 + (float)uStack_4d0 + -1.0;
                fStack_3ac = uStack_4d0._4_4_ + uStack_4d0._4_4_ + -1.0;
                fStack_3a8 = (float)uStack_4c8 + (float)uStack_4c8 + -1.0;
                fStack_3a4 = uStack_4c8._4_4_ + uStack_4c8._4_4_ + -1.0;
                local_3e0 = local_280;
                local_3a0 = local_2a0;
                local_350 = local_650;
                uStack_348 = uStack_648;
                pGVar11 = (context->scene->geometries).items[uVar119].ptr;
                local_4e0._4_4_ = fStack_3bc;
                local_4e0._0_4_ = local_3c0;
                uStack_4d8._0_4_ = fStack_3b8;
                uStack_4d8._4_4_ = fStack_3b4;
                uStack_4d0._0_4_ = fStack_3b0;
                uStack_4d0._4_4_ = fStack_3ac;
                auVar110 = _local_4e0;
                uStack_4c8._0_4_ = fStack_3a8;
                uStack_4c8._4_4_ = fStack_3a4;
                auVar169 = _local_4e0;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar108 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar108 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar162._0_4_ = (float)(int)local_380;
                  auVar162._4_8_ = SUB128(ZEXT812(0),4);
                  auVar162._12_4_ = 0;
                  auVar17 = vshufps_avx(auVar162,auVar162,0);
                  local_300[0] = (auVar17._0_4_ + local_280._0_4_ + 0.0) * (float)local_100._0_4_;
                  local_300[1] = (auVar17._4_4_ + local_280._4_4_ + 1.0) * (float)local_100._4_4_;
                  local_300[2] = (auVar17._8_4_ + local_280._8_4_ + 2.0) * fStack_f8;
                  local_300[3] = (auVar17._12_4_ + local_280._12_4_ + 3.0) * fStack_f4;
                  fStack_2f0 = (auVar17._0_4_ + local_280._16_4_ + 4.0) * fStack_f0;
                  fStack_2ec = (auVar17._4_4_ + local_280._20_4_ + 5.0) * fStack_ec;
                  fStack_2e8 = (auVar17._8_4_ + local_280._24_4_ + 6.0) * fStack_e8;
                  fStack_2e4 = auVar17._12_4_ + (float)local_280._28_4_ + 7.0;
                  uStack_4d0 = auVar110._16_8_;
                  uStack_4c8 = auVar169._24_8_;
                  local_2e0 = local_4e0;
                  uStack_2d8 = uStack_4d8;
                  uStack_2d0 = uStack_4d0;
                  uStack_2c8 = uStack_4c8;
                  local_2c0 = local_2a0;
                  iVar120 = vmovmskps_avx(local_320);
                  local_740 = CONCAT44((int)(uVar123 >> 0x20),iVar120);
                  lVar15 = 0;
                  if (local_740 != 0) {
                    for (; (local_740 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                    }
                  }
                  local_920 = (uint)lVar15;
                  uStack_91c = (undefined4)((ulong)lVar15 >> 0x20);
                  _local_4e0 = auVar169;
                  if (iVar120 == 0) {
                    bVar108 = 0;
LAB_00e8f01d:
                    uVar123 = 0;
                  }
                  else {
                    auVar18 = *local_6e0;
                    auVar17 = *local_6e0;
                    uVar99 = *(undefined8 *)(local_6e8 + 0x10);
                    uVar100 = *(undefined8 *)(local_6e8 + 0x18);
                    local_600._0_16_ = auVar310._0_16_;
                    local_600._16_8_ = uVar99;
                    local_600._24_8_ = uVar100;
                    uVar122 = *(uint *)(ray + k * 4 + 0x100);
                    _local_640 = auVar206;
                    local_37c = uVar10;
                    local_370 = uVar112;
                    uStack_368 = uVar113;
                    local_360 = uVar114;
                    uStack_358 = uVar115;
                    local_340 = uVar116;
                    uStack_338 = uVar117;
                    do {
                      lVar15 = CONCAT44(uStack_91c,local_920);
                      local_1c0 = local_300[lVar15];
                      local_1a0 = *(undefined4 *)((long)&local_2e0 + lVar15 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + lVar15 * 4)
                      ;
                      fVar195 = 1.0 - local_1c0;
                      fVar229 = local_1c0 * 3.0;
                      auVar254 = ZEXT464(0x3f000000);
                      auVar185 = ZEXT416((uint)((fVar195 * -2.0 * local_1c0 + local_1c0 * local_1c0)
                                               * 0.5));
                      auVar185 = vshufps_avx(auVar185,auVar185,0);
                      auVar198 = ZEXT416((uint)(((fVar195 + fVar195) * (fVar229 + 2.0) +
                                                fVar195 * fVar195 * -3.0) * 0.5));
                      auVar198 = vshufps_avx(auVar198,auVar198,0);
                      auVar199 = ZEXT416((uint)(((local_1c0 + local_1c0) * (fVar229 + -5.0) +
                                                local_1c0 * fVar229) * 0.5));
                      auVar199 = vshufps_avx(auVar199,auVar199,0);
                      local_6d0.context = context->user;
                      auVar200 = ZEXT416((uint)((local_1c0 * (fVar195 + fVar195) - fVar195 * fVar195
                                                ) * 0.5));
                      auVar200 = vshufps_avx(auVar200,auVar200,0);
                      auVar186._0_4_ =
                           local_940 * auVar200._0_4_ +
                           local_930 * auVar199._0_4_ +
                           local_7b0 * auVar185._0_4_ + auVar198._0_4_ * (float)local_650._0_4_;
                      auVar186._4_4_ =
                           fStack_93c * auVar200._4_4_ +
                           fStack_92c * auVar199._4_4_ +
                           fStack_7ac * auVar185._4_4_ + auVar198._4_4_ * (float)local_650._4_4_;
                      auVar186._8_4_ =
                           fStack_938 * auVar200._8_4_ +
                           fStack_928 * auVar199._8_4_ +
                           fStack_7a8 * auVar185._8_4_ + auVar198._8_4_ * (float)uStack_648;
                      auVar186._12_4_ =
                           fStack_934 * auVar200._12_4_ +
                           fStack_924 * auVar199._12_4_ +
                           fStack_7a4 * auVar185._12_4_ + auVar198._12_4_ * uStack_648._4_4_;
                      local_210 = vshufps_avx(auVar186,auVar186,0);
                      local_220[0] = (RTCHitN)local_210[0];
                      local_220[1] = (RTCHitN)local_210[1];
                      local_220[2] = (RTCHitN)local_210[2];
                      local_220[3] = (RTCHitN)local_210[3];
                      local_220[4] = (RTCHitN)local_210[4];
                      local_220[5] = (RTCHitN)local_210[5];
                      local_220[6] = (RTCHitN)local_210[6];
                      local_220[7] = (RTCHitN)local_210[7];
                      local_220[8] = (RTCHitN)local_210[8];
                      local_220[9] = (RTCHitN)local_210[9];
                      local_220[10] = (RTCHitN)local_210[10];
                      local_220[0xb] = (RTCHitN)local_210[0xb];
                      local_220[0xc] = (RTCHitN)local_210[0xc];
                      local_220[0xd] = (RTCHitN)local_210[0xd];
                      local_220[0xe] = (RTCHitN)local_210[0xe];
                      local_220[0xf] = (RTCHitN)local_210[0xf];
                      local_1f0 = vshufps_avx(auVar186,auVar186,0x55);
                      local_200 = local_1f0;
                      local_1d0 = vshufps_avx(auVar186,auVar186,0xaa);
                      local_1e0 = local_1d0;
                      fStack_1bc = local_1c0;
                      fStack_1b8 = local_1c0;
                      fStack_1b4 = local_1c0;
                      fStack_1b0 = local_1c0;
                      fStack_1ac = local_1c0;
                      fStack_1a8 = local_1c0;
                      fStack_1a4 = local_1c0;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_560._0_8_;
                      uStack_178 = local_560._8_8_;
                      uStack_170 = local_560._16_8_;
                      uStack_168 = local_560._24_8_;
                      local_160 = local_540._0_8_;
                      uStack_158 = local_540._8_8_;
                      uStack_150 = local_540._16_8_;
                      uStack_148 = local_540._24_8_;
                      auVar310 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x40),
                                            ZEXT1632(ZEXT816(0) << 0x40),0xf);
                      local_6d8[1] = auVar310;
                      *local_6d8 = auVar310;
                      local_140 = (local_6d0.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_6d0.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_7a0 = auVar18._0_8_;
                      uStack_798 = auVar18._8_8_;
                      local_720 = local_7a0;
                      uStack_718 = uStack_798;
                      local_6d0.valid = (int *)&local_720;
                      local_6d0.geometryUserPtr = pGVar11->userPtr;
                      local_6d0.hit = local_220;
                      local_6d0.N = 8;
                      auVar134 = local_600._0_16_;
                      auVar163 = auVar17;
                      uStack_710 = uVar99;
                      uStack_708 = uVar100;
                      local_6d0.ray = (RTCRayN *)ray;
                      if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar254 = ZEXT1664(auVar254._0_16_);
                        (*pGVar11->occlusionFilterN)(&local_6d0);
                        auVar163._8_8_ = uStack_718;
                        auVar163._0_8_ = local_720;
                        auVar134._8_8_ = uStack_708;
                        auVar134._0_8_ = uStack_710;
                      }
                      auVar185 = vpcmpeqd_avx(auVar163,ZEXT816(0) << 0x40);
                      auVar198 = vpcmpeqd_avx(auVar134,ZEXT816(0) << 0x40);
                      auVar207 = ZEXT1664(auVar198);
                      auVar191._16_16_ = auVar198;
                      auVar191._0_16_ = auVar185;
                      auVar169 = auVar310 & ~auVar191;
                      local_7e0 = auVar310._0_4_;
                      fStack_7dc = auVar310._4_4_;
                      fStack_7d8 = auVar310._8_4_;
                      fStack_7d4 = auVar310._12_4_;
                      fStack_7d0 = auVar310._16_4_;
                      fStack_7cc = auVar310._20_4_;
                      fStack_7c8 = auVar310._24_4_;
                      uStack_7c4 = auVar310._28_4_;
                      if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar169 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar169 >> 0x7f,0) == '\0') &&
                            (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar169 >> 0xbf,0) == '\0') &&
                          (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar169[0x1f]) {
                        auVar143._0_4_ = auVar185._0_4_ ^ (uint)local_7e0;
                        auVar143._4_4_ = auVar185._4_4_ ^ (uint)fStack_7dc;
                        auVar143._8_4_ = auVar185._8_4_ ^ (uint)fStack_7d8;
                        auVar143._12_4_ = auVar185._12_4_ ^ (uint)fStack_7d4;
                        auVar143._16_4_ = auVar198._0_4_ ^ (uint)fStack_7d0;
                        auVar143._20_4_ = auVar198._4_4_ ^ (uint)fStack_7cc;
                        auVar143._24_4_ = auVar198._8_4_ ^ (uint)fStack_7c8;
                        auVar143._28_4_ = auVar198._12_4_ ^ uStack_7c4;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar207 = ZEXT1664(auVar198);
                          auVar254 = ZEXT1664(auVar254._0_16_);
                          (*p_Var13)(&local_6d0);
                          auVar163._8_8_ = uStack_718;
                          auVar163._0_8_ = local_720;
                          auVar134._8_8_ = uStack_708;
                          auVar134._0_8_ = uStack_710;
                        }
                        auVar185 = vpcmpeqd_avx(auVar163,ZEXT816(0) << 0x40);
                        auVar198 = vpcmpeqd_avx(auVar134,ZEXT816(0) << 0x40);
                        auVar170._16_16_ = auVar198;
                        auVar170._0_16_ = auVar185;
                        auVar143._0_4_ = auVar185._0_4_ ^ (uint)local_7e0;
                        auVar143._4_4_ = auVar185._4_4_ ^ (uint)fStack_7dc;
                        auVar143._8_4_ = auVar185._8_4_ ^ (uint)fStack_7d8;
                        auVar143._12_4_ = auVar185._12_4_ ^ (uint)fStack_7d4;
                        auVar143._16_4_ = auVar198._0_4_ ^ (uint)fStack_7d0;
                        auVar143._20_4_ = auVar198._4_4_ ^ (uint)fStack_7cc;
                        auVar143._24_4_ = auVar198._8_4_ ^ (uint)fStack_7c8;
                        auVar143._28_4_ = auVar198._12_4_ ^ uStack_7c4;
                        auVar192._8_4_ = 0xff800000;
                        auVar192._0_8_ = 0xff800000ff800000;
                        auVar192._12_4_ = 0xff800000;
                        auVar192._16_4_ = 0xff800000;
                        auVar192._20_4_ = 0xff800000;
                        auVar192._24_4_ = 0xff800000;
                        auVar192._28_4_ = 0xff800000;
                        auVar310 = vblendvps_avx(auVar192,*(undefined1 (*) [32])
                                                           (local_6d0.ray + 0x100),auVar170);
                        *(undefined1 (*) [32])(local_6d0.ray + 0x100) = auVar310;
                      }
                      auVar144 = ZEXT3264(auVar143);
                      if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar143 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar143 >> 0x7f,0) != '\0') ||
                            (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar143 >> 0xbf,0) != '\0') ||
                          (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar143[0x1f] < '\0') {
                        bVar108 = 1;
                        goto LAB_00e8f01d;
                      }
                      auVar144 = ZEXT464(uVar122);
                      *(uint *)(ray + k * 4 + 0x100) = uVar122;
                      local_740 = local_740 ^ 1L << ((ulong)local_920 & 0x3f);
                      lVar15 = 0;
                      if (local_740 != 0) {
                        for (; (local_740 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                        }
                      }
                      local_920 = (uint)lVar15;
                      uStack_91c = (undefined4)((ulong)lVar15 >> 0x20);
                      bVar108 = 0;
                      uVar123 = 0;
                    } while (local_740 != 0);
                  }
                }
                auVar239 = ZEXT3264(auVar219);
                bVar118 = (bool)(bVar118 | bVar108);
                uVar123 = uVar123 & 0xffffffffffffff00;
                goto LAB_00e8ea18;
              }
            }
            auVar239 = ZEXT3264(auVar219);
          }
LAB_00e8ea18:
          auVar314 = ZEXT3264(auVar294);
          auVar298 = ZEXT3264(auVar291);
          lVar124 = lVar124 + 8;
        } while ((int)lVar124 < (int)uVar10);
      }
      if (bVar118) {
        return bVar118;
      }
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar131._4_4_ = uVar7;
      auVar131._0_4_ = uVar7;
      auVar131._8_4_ = uVar7;
      auVar131._12_4_ = uVar7;
      auVar17 = vcmpps_avx(local_3f0,auVar131,2);
      uVar119 = vmovmskps_avx(auVar17);
      uVar119 = (uint)uVar126 & uVar119;
    } while (uVar119 != 0);
  }
  return bVar118;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }